

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

lzham_decompress_status_t
lzham::lzham_lib_decompress
          (lzham_decompress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  uint *puVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  undefined1 *__dest;
  long lVar4;
  long lVar5;
  bool bVar6;
  char cVar7;
  lzham_decompress_status_t lVar8;
  undefined4 uVar9;
  uint uVar10;
  uint *puVar11;
  uint *puVar12;
  long *plVar13;
  ulong uVar14;
  ulong uVar15;
  uint64 uVar16;
  ulong *puVar17;
  ushort *puVar18;
  byte bVar19;
  int iVar20;
  long lVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  decoder_tables *pdVar24;
  byte *pbVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  void *pvVar30;
  ulong uVar31;
  uint *puVar32;
  byte *__src;
  undefined4 uVar33;
  lzham_decompressor *pState;
  byte *pbVar34;
  quasi_adaptive_huffman_data_model *pqVar35;
  quasi_adaptive_huffman_data_model *pqVar36;
  byte *pbVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  int iVar41;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  uint uVar51;
  size_t sVar52;
  undefined8 uStack_90;
  int iStack_88;
  uint uStack_84;
  uint *puStack_80;
  undefined8 uStack_78;
  quasi_adaptive_huffman_data_model *pqStack_70;
  ulong uStack_68;
  undefined8 uStack_60;
  ulong uStack_40;
  
  if (((((p == (lzham_decompress_state_ptr)0x0) || (pOut_buf_size == (size_t *)0x0)) ||
       (pIn_buf_size == (size_t *)0x0)) || (*(int *)((long)p + 0x13c) == 0)) ||
     (((pIn_buf == (lzham_uint8 *)0x0 && (*pIn_buf_size != 0)) ||
      ((pOut_buf == (lzham_uint8 *)0x0 && (*pOut_buf_size != 0)))))) {
    return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  *(lzham_uint8 **)((long)p + 0x100) = pIn_buf;
  *(size_t **)((long)p + 0x108) = pIn_buf_size;
  *(lzham_uint8 **)((long)p + 0x110) = pOut_buf;
  *(size_t **)((long)p + 0x118) = pOut_buf_size;
  *(bool *)((long)p + 0x120) = no_more_input_bytes_flag != 0;
  if ((*(byte *)((long)p + 0x144) & 1) == 0) {
    lVar21 = 1L << (*(byte *)((long)p + 0x13c) & 0x3f);
    iVar20 = *(int *)((long)p + 8);
    switch(iVar20) {
    case 0x457:
      pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
      lVar21 = **(long **)((long)p + 0x108);
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
      *(long *)((long)p + 0x38) = lVar21;
      *(byte **)((long)p + 0x30) = (byte *)(lVar21 + (long)pqVar35);
      *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
      pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
      *(void **)((long)p + 0x6b0) = pvVar30;
      uVar31 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
      *(ulong *)((long)p + 0x6b8) = uVar31;
LAB_00111411:
      if (uVar31 != 0) {
        uVar26 = **(ulong **)((long)p + 0x118);
        if (uVar31 < **(ulong **)((long)p + 0x118)) {
          uVar26 = uVar31;
        }
        *(ulong *)((long)p + 0x6c0) = uVar26;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          memcpy(*(void **)((long)p + 0x110),pvVar30,uVar26);
        }
        else {
          for (uVar31 = 0; sVar52 = uVar26 - uVar31, uVar31 <= uVar26 && sVar52 != 0;
              uVar31 = uVar31 + sVar52) {
            if (0x1fff < sVar52) {
              sVar52 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x110) + uVar31),
                   (void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52);
            uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52,
                             *(uint *)((long)p + 0xf8));
            *(uint *)((long)p + 0xf8) = uVar38;
            uVar26 = *(ulong *)((long)p + 0x6c0);
          }
        }
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        lVar21 = *(long *)((long)p + 0x6c0);
        **(long **)((long)p + 0x118) = lVar21;
        *(undefined4 *)((long)p + 8) = 0x457;
LAB_00111a0e:
        return (uint)(lVar21 == 0);
      }
      uStack_60._4_4_ = *(int *)((long)p + 0x690);
      iVar41 = *(int *)((long)p + 0x694);
      iStack_88 = *(int *)((long)p + 0x698);
      iVar48 = *(int *)((long)p + 0x69c);
      uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
      uVar9 = *(undefined4 *)((long)p + 0x678);
      uVar50 = *(uint *)((long)p + 0xb8);
      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
      uVar31 = *(ulong *)((long)p + 0x58);
      uVar10 = *(uint *)((long)p + 0x60);
      iVar20 = *(int *)((long)p + 0x160);
LAB_001114df:
      if (iVar20 == 3) {
        if ((uVar10 & 7) != 0) {
          for (; (int)uVar10 < 0; uVar10 = uVar10 + 8) {
            if (pqVar35 == (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
              uVar14 = 0;
              if (*(char *)((long)p + 0x40) == '\0') {
                *(uint *)((long)p + 0xb8) = uVar50;
                *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                *(ulong *)((long)p + 0x58) = uVar31;
                *(uint *)((long)p + 0x60) = uVar10;
                *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                *(int *)((long)p + 0x690) = uStack_60._4_4_;
                *(int *)((long)p + 0x694) = iVar41;
                *(int *)((long)p + 0x698) = iStack_88;
                *(int *)((long)p + 0x69c) = iVar48;
                *(int *)((long)p + 0x6a0) = (int)uVar26;
                *(undefined4 *)((long)p + 0x678) = uVar9;
                plVar13 = *(long **)((long)p + 0x108);
                puVar11 = *(uint **)((long)p + 0x20);
                goto LAB_0010f7ca;
              }
            }
            else {
LAB_0010d5c4:
              uVar14 = (ulong)(byte)*(uint *)pqVar35;
              pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1);
            }
LAB_0010d5ca:
            uVar31 = uVar31 | uVar14 << (0x38U - (char)uVar10 & 0x3f);
          }
          uVar31 = uVar31 << ((byte)uVar10 & 7);
          uVar10 = uVar10 & 0x7ffffff8;
        }
        for (; (int)uVar10 < 0x10; uVar10 = uVar10 + 8) {
          if (pqVar35 == (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
            uVar14 = 0;
            if (*(char *)((long)p + 0x40) == '\0') {
              *(uint *)((long)p + 0xb8) = uVar50;
              *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
              *(ulong *)((long)p + 0x58) = uVar31;
              *(uint *)((long)p + 0x60) = uVar10;
              *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
              *(int *)((long)p + 0x690) = uStack_60._4_4_;
              *(int *)((long)p + 0x694) = iVar41;
              *(int *)((long)p + 0x698) = iStack_88;
              *(int *)((long)p + 0x69c) = iVar48;
              *(int *)((long)p + 0x6a0) = (int)uVar26;
              *(undefined4 *)((long)p + 0x678) = uVar9;
              plVar13 = *(long **)((long)p + 0x108);
              puVar11 = *(uint **)((long)p + 0x20);
              goto LAB_0010f7a5;
            }
          }
          else {
LAB_0010d50b:
            uVar14 = (ulong)(byte)*(uint *)pqVar35;
            pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1);
          }
LAB_0010d511:
          uVar31 = uVar31 | uVar14 << (0x38U - (char)uVar10 & 0x3f);
        }
        *(uint *)((long)p + 0x6cc) = (uint)(ushort)(uVar31 >> 0x30);
        uVar14 = uVar31 << 0x10;
        for (iVar20 = uVar10 - 0x10; iVar20 < 0x10; iVar20 = iVar20 + 8) {
          if (pqVar35 == (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
            uVar31 = 0;
            if (*(char *)((long)p + 0x40) == '\0') {
              *(uint *)((long)p + 0xb8) = uVar50;
              *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
              *(ulong *)((long)p + 0x58) = uVar14;
              *(int *)((long)p + 0x60) = iVar20;
              *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
              *(int *)((long)p + 0x690) = uStack_60._4_4_;
              *(int *)((long)p + 0x694) = iVar41;
              *(int *)((long)p + 0x698) = iStack_88;
              *(int *)((long)p + 0x69c) = iVar48;
              *(int *)((long)p + 0x6a0) = (int)uVar26;
              *(undefined4 *)((long)p + 0x678) = uVar9;
              plVar13 = *(long **)((long)p + 0x108);
              puVar11 = *(uint **)((long)p + 0x20);
              goto LAB_0010f780;
            }
          }
          else {
LAB_0010d452:
            uVar31 = (ulong)(byte)*(uint *)pqVar35;
            pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1);
          }
LAB_0010d458:
          uVar14 = uVar14 | uVar31 << (0x38U - (char)iVar20 & 0x3f);
        }
        uVar31 = uVar14 << 0x10;
        uVar10 = iVar20 - 0x10;
        uVar46 = *(int *)((long)p + 0x6cc) << 0x10 | (uint)(ushort)(uVar14 >> 0x30);
        *(uint *)((long)p + 0x6cc) = uVar46;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          *(uint *)((long)p + 0xf8) = uVar46;
        }
        else if (uVar46 != *(uint *)((long)p + 0xf8)) {
          *(undefined4 *)((long)p + 0x160) = 8;
        }
      }
      *(uint *)((long)p + 0xb8) = uVar50;
      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
      *(ulong *)((long)p + 0x58) = uVar31;
      *(uint *)((long)p + 0x60) = uVar10;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
      uVar16 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x18));
      **(uint64 **)((long)p + 0x108) = uVar16;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 0x67c) = uVar9;
      *(undefined4 *)((long)p + 8) = 0x47c;
      return *(lzham_decompress_status_t *)((long)p + 0x160);
    case 0x458:
    case 0x459:
    case 0x45a:
    case 0x45b:
    case 0x45c:
    case 0x45e:
switchD_0010d329_caseD_458:
      return *(lzham_decompress_status_t *)((long)p + 0x160);
    case 0x45d:
      pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
      plVar13 = *(long **)((long)p + 0x108);
      lVar21 = *plVar13;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
      *(long *)((long)p + 0x38) = lVar21;
      *(byte **)((long)p + 0x30) = (byte *)((long)pqVar35 + lVar21);
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar11 = (uint *)pqVar35;
      if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_60._4_4_ = *(int *)((long)p + 0x690);
        iVar41 = *(int *)((long)p + 0x694);
        iStack_88 = *(int *)((long)p + 0x698);
        iVar48 = *(int *)((long)p + 0x69c);
        uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar9 = *(undefined4 *)((long)p + 0x678);
        uVar50 = *(uint *)((long)p + 0xb8);
        uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
        uVar31 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        if (0 < lVar21) goto LAB_0010d5c4;
        uVar14 = 0;
        goto LAB_0010d5ca;
      }
LAB_0010f7ca:
      *plVar13 = (long)pqVar35 - (long)puVar11;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x45d;
      break;
    case 0x45f:
      pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
      plVar13 = *(long **)((long)p + 0x108);
      lVar21 = *plVar13;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
      *(long *)((long)p + 0x38) = lVar21;
      *(byte **)((long)p + 0x30) = (byte *)((long)pqVar35 + lVar21);
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar11 = (uint *)pqVar35;
      if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_60._4_4_ = *(int *)((long)p + 0x690);
        iVar41 = *(int *)((long)p + 0x694);
        iStack_88 = *(int *)((long)p + 0x698);
        iVar48 = *(int *)((long)p + 0x69c);
        uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar9 = *(undefined4 *)((long)p + 0x678);
        uVar50 = *(uint *)((long)p + 0xb8);
        uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
        uVar31 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        if (0 < lVar21) goto LAB_0010d50b;
        uVar14 = 0;
        goto LAB_0010d511;
      }
LAB_0010f7a5:
      *plVar13 = (long)pqVar35 - (long)puVar11;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x45f;
      break;
    case 0x460:
      pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
      plVar13 = *(long **)((long)p + 0x108);
      lVar21 = *plVar13;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
      *(long *)((long)p + 0x38) = lVar21;
      *(byte **)((long)p + 0x30) = (byte *)((long)pqVar35 + lVar21);
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar11 = (uint *)pqVar35;
      if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_60._4_4_ = *(int *)((long)p + 0x690);
        iVar41 = *(int *)((long)p + 0x694);
        iStack_88 = *(int *)((long)p + 0x698);
        iVar48 = *(int *)((long)p + 0x69c);
        uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar9 = *(undefined4 *)((long)p + 0x678);
        uVar50 = *(uint *)((long)p + 0xb8);
        uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
        uVar14 = *(ulong *)((long)p + 0x58);
        iVar20 = *(int *)((long)p + 0x60);
        if (0 < lVar21) goto LAB_0010d452;
        uVar31 = 0;
        goto LAB_0010d458;
      }
LAB_0010f780:
      *plVar13 = (long)pqVar35 - (long)puVar11;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x460;
      break;
    default:
      if (iVar20 == 0x482) {
LAB_0010d38b:
        **(undefined8 **)((long)p + 0x108) = 0;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x482;
        return *(lzham_decompress_status_t *)((long)p + 0x160);
      }
      uVar46 = (uint)lVar21;
      uVar42 = uVar46 - 1;
      pbVar34 = *(byte **)((long)p + 0xf0);
      if (iVar20 == 0x188) {
        pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar4 = *plVar13;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
        *(long *)((long)p + 0x38) = lVar4;
        *(byte **)((long)p + 0x30) = (byte *)((long)pqStack_70 + lVar4);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = (uint *)pqStack_70;
        if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar20 = *(int *)((long)p + 0x690);
          iVar27 = *(int *)((long)p + 0x694);
          iVar49 = *(int *)((long)p + 0x698);
          iVar43 = *(int *)((long)p + 0x69c);
          uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
          uStack_84 = *(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
          uVar31 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar4) goto LAB_0010f45b;
          uVar14 = 0;
          goto LAB_0010f46a;
        }
LAB_0010fbc4:
        *plVar13 = (long)pqStack_70 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x188;
      }
      else if (iVar20 == 0x189) {
        pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar4 = *plVar13;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
        *(long *)((long)p + 0x38) = lVar4;
        *(byte **)((long)p + 0x30) = (byte *)((long)pqStack_70 + lVar4);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = (uint *)pqStack_70;
        if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar20 = *(int *)((long)p + 0x690);
          iVar27 = *(int *)((long)p + 0x694);
          iVar49 = *(int *)((long)p + 0x698);
          iVar43 = *(int *)((long)p + 0x69c);
          uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
          uStack_84 = *(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          iVar48 = *(int *)((long)p + 0x60);
          if (0 < lVar4) goto LAB_0010f5fc;
          uVar31 = 0;
          goto LAB_0010f607;
        }
LAB_0010fc0e:
        *plVar13 = (long)pqStack_70 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x189;
      }
      else if (iVar20 == 0x19a) {
        pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar4 = *plVar13;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
        *(long *)((long)p + 0x38) = lVar4;
        *(byte **)((long)p + 0x30) = (byte *)((long)pqStack_70 + lVar4);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = (uint *)pqStack_70;
        if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar20 = *(int *)((long)p + 0x690);
          iVar27 = *(int *)((long)p + 0x694);
          iStack_88 = *(int *)((long)p + 0x698);
          iVar43 = *(int *)((long)p + 0x69c);
          uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
          uStack_84 = *(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar4) goto LAB_0010d695;
          uVar31 = 0;
          goto LAB_0010d69b;
        }
LAB_0010f7ef:
        *plVar13 = (long)pqStack_70 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x19a;
      }
      else if (iVar20 == 0x1d2) {
        pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar4 = *plVar13;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
        *(long *)((long)p + 0x38) = lVar4;
        *(byte **)((long)p + 0x30) = (byte *)((long)pqStack_70 + lVar4);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = (uint *)pqStack_70;
        if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uStack_60._4_4_ = *(int *)((long)p + 0x690);
          iVar41 = *(int *)((long)p + 0x694);
          iStack_88 = *(int *)((long)p + 0x698);
          iVar48 = *(int *)((long)p + 0x69c);
          uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar14 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
          uVar31 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar4) goto LAB_0010dda7;
          uVar15 = 0;
          goto LAB_0010ddb2;
        }
LAB_0010f8fa:
        *plVar13 = (long)pqStack_70 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1d2;
      }
      else if (iVar20 == 0x1d8) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar4 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar4;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        pqStack_70 = (quasi_adaptive_huffman_data_model *)puVar11;
        if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uStack_60._4_4_ = *(int *)((long)p + 0x690);
          iVar41 = *(int *)((long)p + 0x694);
          iStack_88 = *(int *)((long)p + 0x698);
          iVar48 = *(int *)((long)p + 0x69c);
          uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar14 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
          uVar31 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar4) goto LAB_0010dc2d;
          uVar15 = 0;
          goto LAB_0010dc33;
        }
LAB_0010f8cd:
        *plVar13 = (long)pqStack_70 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1d8;
      }
      else if (iVar20 == 0x1e0) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar4 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar4;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        pqStack_70 = (quasi_adaptive_huffman_data_model *)puVar11;
        if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uStack_60._4_4_ = *(int *)((long)p + 0x690);
          iVar41 = *(int *)((long)p + 0x694);
          iStack_88 = *(int *)((long)p + 0x698);
          iVar48 = *(int *)((long)p + 0x69c);
          uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar14 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
          uVar15 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar4) goto LAB_0010d80d;
          uVar31 = 0;
          goto LAB_0010d813;
        }
LAB_0010f839:
        *plVar13 = (long)pqStack_70 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1e0;
      }
      else if (iVar20 == 0x1e2) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar4 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar4;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        pqStack_70 = (quasi_adaptive_huffman_data_model *)puVar11;
        if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uStack_60._4_4_ = *(int *)((long)p + 0x690);
          iVar41 = *(int *)((long)p + 0x694);
          iStack_88 = *(int *)((long)p + 0x698);
          iVar48 = *(int *)((long)p + 0x69c);
          uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar14 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
          uVar15 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar4) goto LAB_0010f548;
          uVar31 = 0;
          goto LAB_0010f54e;
        }
LAB_0010fbe9:
        *plVar13 = (long)pqStack_70 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1e2;
      }
      else {
        if (iVar20 == 0x1e8) {
LAB_00110b3c:
          *(undefined4 *)((long)p + 8) = 0x1e8;
          return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
        }
        if (iVar20 == 0x1eb) {
          pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
          plVar13 = *(long **)((long)p + 0x108);
          lVar4 = *plVar13;
          *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
          *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
          *(long *)((long)p + 0x38) = lVar4;
          *(byte **)((long)p + 0x30) = (byte *)((long)pqStack_70 + lVar4);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar11 = (uint *)pqStack_70;
          if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uStack_60._4_4_ = *(int *)((long)p + 0x690);
            iVar41 = *(int *)((long)p + 0x694);
            iStack_88 = *(int *)((long)p + 0x698);
            iVar48 = *(int *)((long)p + 0x69c);
            uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar14 = (ulong)*(uint *)((long)p + 0x678);
            uVar50 = *(uint *)((long)p + 0xb8);
            uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
            uVar44 = *(ulong *)((long)p + 0x58);
            iVar20 = *(int *)((long)p + 0x60);
            if (0 < lVar4) goto LAB_0010da00;
            uVar31 = 0;
            goto LAB_0010da06;
          }
LAB_0010f883:
          *plVar13 = (long)pqStack_70 - (long)puVar11;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x1eb;
        }
        else {
          if (iVar20 == 0x1f1) {
LAB_00110ad1:
            *(undefined4 *)((long)p + 8) = 0x1f1;
            return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
          }
          if (iVar20 == 0x1fc) {
            pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
            lVar4 = **(long **)((long)p + 0x108);
            *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
            *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
            *(long *)((long)p + 0x38) = lVar4;
            *(byte **)((long)p + 0x30) = (byte *)(lVar4 + (long)pqStack_70);
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
            *(void **)((long)p + 0x6b0) = pvVar30;
            uVar31 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
            *(ulong *)((long)p + 0x6b8) = uVar31;
            goto LAB_00110a58;
          }
          if (iVar20 == 0x213) {
            uStack_60._4_4_ = *(int *)((long)p + 0x690);
            iVar41 = *(int *)((long)p + 0x694);
            iStack_88 = *(int *)((long)p + 0x698);
            iVar48 = *(int *)((long)p + 0x69c);
            uVar50 = *(uint *)((long)p + 0x6a0);
            uVar10 = *(uint *)((long)p + 0x678);
            pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
            lVar4 = **(long **)((long)p + 0x108);
            *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
            *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
            *(long *)((long)p + 0x38) = lVar4;
            *(byte **)((long)p + 0x30) = (byte *)(lVar4 + (long)pqStack_70);
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            goto LAB_00110a8d;
          }
          if (iVar20 == 0x228) {
            pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
            plVar13 = *(long **)((long)p + 0x108);
            lVar4 = *plVar13;
            *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
            *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
            *(long *)((long)p + 0x38) = lVar4;
            *(byte **)((long)p + 0x30) = (byte *)((long)pqStack_70 + lVar4);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar11 = (uint *)pqStack_70;
            if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar9 = *(undefined4 *)((long)p + 0x6f0);
              uStack_60._4_4_ = *(int *)((long)p + 0x690);
              iVar41 = *(int *)((long)p + 0x694);
              iStack_88 = *(int *)((long)p + 0x698);
              iVar48 = *(int *)((long)p + 0x69c);
              uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar14 = (ulong)*(uint *)((long)p + 0x678);
              uVar50 = *(uint *)((long)p + 0xb8);
              uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
              uVar31 = *(ulong *)((long)p + 0x58);
              uVar10 = *(uint *)((long)p + 0x60);
              if (0 < lVar4) goto LAB_0010df36;
              uVar15 = 0;
              goto LAB_0010df3c;
            }
LAB_0010f91f:
            *plVar13 = (long)pqStack_70 - (long)puVar11;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x228;
          }
          else if (iVar20 == 0x22b) {
            puVar11 = *(uint **)((long)p + 0x100);
            plVar13 = *(long **)((long)p + 0x108);
            lVar4 = *plVar13;
            *(uint **)((long)p + 0x20) = puVar11;
            *(uint **)((long)p + 0x28) = puVar11;
            *(long *)((long)p + 0x38) = lVar4;
            *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            pqStack_70 = (quasi_adaptive_huffman_data_model *)puVar11;
            if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar15 = (ulong)*(uint *)((long)p + 0x6f0);
              uStack_60._4_4_ = *(int *)((long)p + 0x690);
              iVar41 = *(int *)((long)p + 0x694);
              iStack_88 = *(int *)((long)p + 0x698);
              iVar48 = *(int *)((long)p + 0x69c);
              uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar14 = (ulong)*(uint *)((long)p + 0x678);
              uVar50 = *(uint *)((long)p + 0xb8);
              uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
              uVar31 = *(ulong *)((long)p + 0x58);
              uVar10 = *(uint *)((long)p + 0x60);
              if (0 < lVar4) goto LAB_0010eeac;
              uVar44 = 0;
              goto LAB_0010eeb2;
            }
LAB_0010fb03:
            *plVar13 = (long)pqStack_70 - (long)puVar11;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x22b;
          }
          else {
            if (iVar20 == 0x235) {
LAB_0010ef66:
              *(undefined4 *)((long)p + 8) = 0x235;
              return LZHAM_DECOMP_STATUS_FAILED_BAD_RAW_BLOCK;
            }
            if (iVar20 != 0x23b) {
              if (iVar20 == 0x24a) {
                *(undefined4 *)((long)p + 8) = 0x24a;
              }
              else {
                if (iVar20 == 0x252) {
                  pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                  lVar4 = **(long **)((long)p + 0x108);
                  *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
                  *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                  *(long *)((long)p + 0x38) = lVar4;
                  *(byte **)((long)p + 0x30) = (byte *)(lVar4 + (long)pqStack_70);
                  *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                  pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
                  *(void **)((long)p + 0x6b0) = pvVar30;
                  uVar31 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
                  *(ulong *)((long)p + 0x6b8) = uVar31;
                  goto LAB_001118dd;
                }
                if (iVar20 == 0x26b) {
LAB_0011121e:
                  *(undefined4 *)((long)p + 8) = 0x26b;
                  return LZHAM_DECOMP_STATUS_FAILED_EXPECTED_MORE_RAW_BYTES;
                }
                if (iVar20 == 0x26f) {
                  uVar15 = (ulong)*(uint *)((long)p + 0x6f0);
                  uStack_60._4_4_ = *(int *)((long)p + 0x690);
                  iVar41 = *(int *)((long)p + 0x694);
                  iStack_88 = *(int *)((long)p + 0x698);
                  iVar48 = *(int *)((long)p + 0x69c);
                  uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
                  uVar10 = *(uint *)((long)p + 0x678);
                  lVar4 = *(long *)((long)p + 0x100);
                  puVar17 = *(ulong **)((long)p + 0x108);
                  uVar31 = *puVar17;
                  *(long *)((long)p + 0x20) = lVar4;
                  *(long *)((long)p + 0x28) = lVar4;
                  *(ulong *)((long)p + 0x38) = uVar31;
                  *(ulong *)((long)p + 0x30) = lVar4 + uVar31;
                  *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                  uVar31 = *puVar17;
                  uVar14 = 0;
                  goto LAB_00111083;
                }
                if (iVar20 != 0x283) {
                  if (iVar20 == 0x294) {
                    pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    lVar4 = **(long **)((long)p + 0x108);
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)(lVar4 + (long)pqStack_70);
                    *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                    pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
                    *(void **)((long)p + 0x6b0) = pvVar30;
                    uVar31 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
                    *(ulong *)((long)p + 0x6b8) = uVar31;
                    goto LAB_001111a1;
                  }
                  if (iVar20 == 0x2a3) {
                    pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)pqStack_70 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar11 = (uint *)pqStack_70;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uVar39 = *(uint *)((long)p + 0xbc);
                      uVar14 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010ecde;
                      uVar31 = 0;
                      goto LAB_0010ece4;
                    }
LAB_0010fab9:
                    *plVar13 = (long)pqStack_70 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x2a3;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x2ae) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar20 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010f305;
                      uVar31 = 0;
                      goto LAB_0010f30b;
                    }
LAB_0010fb97:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x2ae;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x2cd) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)pqVar35 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar11 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010f21b;
                      uVar31 = 0;
                      goto LAB_0010f221;
                    }
LAB_0010fb72:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x2cd;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x2e4) {
                    *(undefined4 *)((long)p + 8) = 0x2e4;
                    return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
                  }
                  if (iVar20 == 0x2ea) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    puVar11 = (uint *)((long)pqVar35 + lVar4);
                    *(uint **)((long)p + 0x30) = puVar11;
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar12 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uVar39 = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      pqVar36 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
                      pdVar24 = pqVar36->m_pDecode_tables;
                      goto LAB_001120c5;
                    }
LAB_001121d5:
                    *plVar13 = (long)pqVar35 - (long)puVar12;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x2ea;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x304) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    puVar11 = (uint *)((long)pqVar35 + lVar4);
                    *(uint **)((long)p + 0x30) = puVar11;
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar12 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d0);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uVar39 = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      pqVar36 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
                      pdVar24 = pqVar36->m_pDecode_tables;
                      goto LAB_00112262;
                    }
LAB_00112383:
                    *plVar13 = (long)pqVar35 - (long)puVar12;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x304;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x318) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    lVar4 = **(long **)((long)p + 0x108);
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)(lVar4 + (long)pqVar35);
                    *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                    pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
                    *(void **)((long)p + 0x6b0) = pvVar30;
                    uVar31 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
                    *(ulong *)((long)p + 0x6b8) = uVar31;
                    goto LAB_0010e206;
                  }
                  if (iVar20 == 0x329) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)pqVar35 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar11 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar51 = *(uint *)((long)p + 0xb8);
                      uVar39 = *(uint *)((long)p + 0xbc);
                      uVar14 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010f12f;
                      uVar31 = 0;
                      goto LAB_0010f135;
                    }
LAB_0010fb4d:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x329;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x32c) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)pqVar35 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar11 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar40 = *(uint *)((long)p + 0xb8);
                      uVar39 = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010edbc;
                      uVar31 = 0;
                      goto LAB_0010edc2;
                    }
LAB_0010fade:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x32c;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x32f) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)pqVar35 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar11 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar51 = *(uint *)((long)p + 0xb8);
                      uVar39 = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010e7b3;
                      uVar31 = 0;
                      goto LAB_0010e7b9;
                    }
LAB_0010f9f8:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x32f;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x336) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    puVar11 = (uint *)((long)pqVar35 + lVar4);
                    *(uint **)((long)p + 0x30) = puVar11;
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar12 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar51 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
                      pdVar24 = pqStack_70->m_pDecode_tables;
                      goto LAB_001124d4;
                    }
LAB_001125d1:
                    *plVar13 = (long)pqVar35 - (long)puVar12;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x336;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x33f) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar39 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar28 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_00112730;
                      uVar26 = 0;
                      goto LAB_00112743;
                    }
LAB_0010fb28:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x33f;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x344) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar39 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      iVar20 = *(int *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010ea60;
                      uVar31 = 0;
                      goto LAB_0010ea6e;
                    }
LAB_0010fa4a:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x344;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x34d) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    puVar11 = (uint *)((long)pqVar35 + lVar4);
                    *(uint **)((long)p + 0x30) = puVar11;
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar12 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar40 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      pqVar36 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
                      pdVar24 = pqVar36->m_pDecode_tables;
                      goto LAB_00112cbc;
                    }
LAB_00112d53:
                    *plVar13 = (long)pqVar35 - (long)puVar12;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x34d;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x356) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar39 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar40 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar50 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_00112b06;
                      uVar26 = 0;
                      goto LAB_00112b19;
                    }
LAB_0010f85e:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x356;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x35b) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar39 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar40 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      iVar20 = *(int *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010e301;
                      uVar31 = 0;
                      goto LAB_0010e310;
                    }
LAB_0010f979:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x35b;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x35f) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      iVar41 = *(int *)((long)p + 0x690);
                      uStack_60._4_4_ = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar40 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010daca;
                      uVar31 = 0;
                      goto LAB_0010dad0;
                    }
LAB_0010f8a8:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x35f;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x368) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      iVar41 = *(int *)((long)p + 0x690);
                      iVar20 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar40 = *(uint *)((long)p + 0xb8);
                      uVar39 = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010e8a7;
                      uVar31 = 0;
                      goto LAB_0010e8b1;
                    }
LAB_0010fa1d:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x368;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 899) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    puVar11 = (uint *)((long)pqVar35 + lVar4);
                    *(uint **)((long)p + 0x30) = puVar11;
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar12 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar51 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      pqVar36 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
                      pdVar24 = pqVar36->m_pDecode_tables;
                      goto LAB_00112d90;
                    }
LAB_00112ea0:
                    *plVar13 = (long)pqVar35 - (long)puVar12;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 899;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x3a5) {
                    puVar12 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar12;
                    *(uint **)((long)p + 0x28) = puVar12;
                    *(long *)((long)p + 0x38) = lVar4;
                    puVar11 = (uint *)((long)puVar12 + lVar4);
                    *(uint **)((long)p + 0x30) = puVar11;
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar12;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uStack_78._0_4_ = *(int *)((long)p + 0x6d4);
                      uVar39 = *(uint *)((long)p + 0x6d8);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      pqVar36 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
                      pdVar24 = pqVar36->m_pDecode_tables;
                      goto LAB_0011301f;
                    }
LAB_00113135:
                    *plVar13 = (long)pqVar35 - (long)puVar12;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x3a5;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x3ae) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar51 = *(uint *)((long)p + 0x6d4);
                      uVar39 = *(uint *)((long)p + 0x6d8);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar28 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_001133cc;
                      uVar26 = 0;
                      goto LAB_001133e0;
                    }
LAB_0010fa6f:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x3ae;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x3b3) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar51 = *(uint *)((long)p + 0x6d4);
                      uVar39 = *(uint *)((long)p + 0x6d8);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar26 = *(ulong *)((long)p + 0x58);
                      iVar20 = *(int *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010e0ca;
                      uVar31 = 0;
                      goto LAB_0010e0de;
                    }
LAB_0010f94c:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x3b3;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x3c4) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)pqVar35 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    puVar11 = (uint *)pqVar35;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uVar39 = *(uint *)((long)p + 0x6d8);
                      uVar51 = *(uint *)((long)p + 0x6e0);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uVar40 = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar47 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010ebf9;
                      uVar26 = 0;
                      goto LAB_0010ebff;
                    }
LAB_0010fa94:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x3c4;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x3cb) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uVar39 = *(uint *)((long)p + 0x6d8);
                      uVar51 = *(uint *)((long)p + 0x6e0);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010e4b7;
                      uVar26 = 0;
                      goto LAB_0010e4ca;
                    }
LAB_0010f9c3:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x3cb;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x3d4) {
                    puVar12 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar12;
                    *(uint **)((long)p + 0x28) = puVar12;
                    *(long *)((long)p + 0x38) = lVar4;
                    puVar11 = (uint *)((long)puVar12 + lVar4);
                    *(uint **)((long)p + 0x30) = puVar11;
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar12;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uVar28 = *(uint *)((long)p + 0x6d4);
                      uVar39 = *(uint *)((long)p + 0x6d8);
                      iVar43 = *(int *)((long)p + 0x6dc);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                      uStack_84 = *(uint *)((long)p + 0x678);
                      uStack_78 = *(ulong *)((long)p + 0xb8);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar40 = *(uint *)((long)p + 0x60);
                      pqVar36 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
                      pdVar24 = pqVar36->m_pDecode_tables;
                      goto LAB_001137b0;
                    }
LAB_00113866:
                    *plVar13 = (long)pqVar35 - (long)puVar12;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x3d4;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 == 0x3f4) {
                    *(undefined4 *)((long)p + 8) = 0x3f4;
                    return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
                  }
                  if (iVar20 == 0x40e) {
                    pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
                    lVar4 = **(long **)((long)p + 0x108);
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqVar35;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)(lVar4 + (long)pqVar35);
                    *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                    pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
                    *(void **)((long)p + 0x6b0) = pvVar30;
                    uVar31 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
                    *(ulong *)((long)p + 0x6b8) = uVar31;
                    goto LAB_0010de29;
                  }
                  if (iVar20 == 0x442) {
                    puVar11 = *(uint **)((long)p + 0x100);
                    plVar13 = *(long **)((long)p + 0x108);
                    lVar4 = *plVar13;
                    *(uint **)((long)p + 0x20) = puVar11;
                    *(uint **)((long)p + 0x28) = puVar11;
                    *(long *)((long)p + 0x38) = lVar4;
                    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar4);
                    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                    if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
                      uVar14 = (ulong)*(uint *)((long)p + 0x678);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      if (0 < lVar4) goto LAB_0010e3c6;
                      uVar15 = 0;
                      goto LAB_0010e3cc;
                    }
LAB_0010f99e:
                    *plVar13 = (long)pqVar35 - (long)puVar11;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    *(undefined4 *)((long)p + 8) = 0x442;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  if (iVar20 != 0x47c) {
                    if (iVar20 == 0) {
                      uStack_84 = 0;
                      if ((ulong)*(uint *)((long)p + 0x148) != 0) {
                        memcpy(pbVar34,*(void **)((long)p + 0x150),(ulong)*(uint *)((long)p + 0x148)
                              );
                        uVar10 = *(uint *)((long)p + 0x148);
                        uStack_84 = 0;
                        if (uVar10 < uVar46) {
                          *(uint *)((long)p + 0x6c8) = uVar10;
                          uStack_84 = uVar10;
                        }
                      }
                      uVar26 = 0;
                      bVar6 = symbol_codec::start_decoding
                                        ((symbol_codec *)((long)p + 0x18),
                                         *(uint8 **)((long)p + 0x100),**(size_t **)((long)p + 0x108)
                                         ,*(bool *)((long)p + 0x120),(need_bytes_func_ptr)0x0,
                                         (void *)0x0);
                      if (bVar6) {
                        uVar50 = *(uint *)((long)p + 0xb8);
                        uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                        pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x28);
                        uVar31 = *(ulong *)((long)p + 0x58);
                        uVar10 = *(uint *)((long)p + 0x60);
                        iVar43 = 0;
                        iVar49 = 0;
                        iVar27 = 0;
                        iVar20 = 0;
                        iVar48 = 0;
                        iStack_88 = 0;
                        iVar41 = 0;
                        uStack_60._4_4_ = 0;
                        if ((*(byte *)((long)p + 0x144) & 4) != 0) {
                          for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                            if (pqStack_70 ==
                                (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                              uVar14 = 0;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar50;
                                *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                *(ulong *)((long)p + 0x58) = uVar31;
                                *(uint *)((long)p + 0x60) = uVar10;
                                *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70
                                ;
                                *(int *)((long)p + 0x690) = iVar20;
                                *(int *)((long)p + 0x694) = iVar27;
                                *(int *)((long)p + 0x698) = iVar49;
                                *(int *)((long)p + 0x69c) = iVar43;
                                *(int *)((long)p + 0x6a0) = (int)uVar26;
                                *(uint *)((long)p + 0x678) = uStack_84;
                                plVar13 = *(long **)((long)p + 0x108);
                                puVar11 = *(uint **)((long)p + 0x20);
                                goto LAB_0010fbc4;
                              }
                            }
                            else {
LAB_0010f45b:
                              uVar14 = (ulong)(byte)*(uint *)pqStack_70;
                              pqStack_70 = (quasi_adaptive_huffman_data_model *)
                                           ((long)pqStack_70 + 1);
                            }
LAB_0010f46a:
                            uVar31 = uVar31 | uVar14 << (0x38U - (char)uVar10 & 0x3f);
                          }
                          *(uint *)((long)p + 0x710) = (uint)(byte)(uVar31 >> 0x38);
                          uVar14 = uVar31 << 8;
                          for (iVar48 = uVar10 - 8; iVar48 < 8; iVar48 = iVar48 + 8) {
                            if (pqStack_70 ==
                                (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                              uVar31 = 0;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar50;
                                *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                *(ulong *)((long)p + 0x58) = uVar14;
                                *(int *)((long)p + 0x60) = iVar48;
                                *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70
                                ;
                                *(int *)((long)p + 0x690) = iVar20;
                                *(int *)((long)p + 0x694) = iVar27;
                                *(int *)((long)p + 0x698) = iVar49;
                                *(int *)((long)p + 0x69c) = iVar43;
                                *(int *)((long)p + 0x6a0) = (int)uVar26;
                                *(uint *)((long)p + 0x678) = uStack_84;
                                plVar13 = *(long **)((long)p + 0x108);
                                puVar11 = *(uint **)((long)p + 0x20);
                                goto LAB_0010fc0e;
                              }
                            }
                            else {
LAB_0010f5fc:
                              uVar31 = (ulong)(byte)*(uint *)pqStack_70;
                              pqStack_70 = (quasi_adaptive_huffman_data_model *)
                                           ((long)pqStack_70 + 1);
                            }
LAB_0010f607:
                            uVar14 = uVar14 | uVar31 << (0x38U - (char)iVar48 & 0x3f);
                          }
                          uVar10 = (uint)(byte)(uVar14 >> 0x38);
                          *(uint *)((long)p + 0x714) = uVar10;
                          if ((*(uint *)((long)p + 0x710) & 0xf) != 0xe) {
                            return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
                          }
                          if ((*(uint *)((long)p + 0x710) << 8 | uVar10) % 0x1f != 0) {
                            return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
                          }
                          uVar31 = uVar14 << 8;
                          uVar10 = iVar48 - 8;
                          iVar41 = iVar27;
                          iVar48 = iVar43;
                          uStack_60._4_4_ = iVar20;
                          iStack_88 = iVar49;
                          if ((uVar14 >> 0x38 & 0x20) != 0) {
                            if (*(long *)((long)p + 0x150) == 0) {
                              return LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES;
                            }
                            *(undefined8 *)((long)p + 0x718) = 0;
                            uVar39 = 0;
                            while (uVar14 = uVar31, uVar39 < 4) {
                              for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                                if (pqStack_70 ==
                                    (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30))
                                {
                                  uVar31 = 0;
                                  if (*(char *)((long)p + 0x40) == '\0') {
                                    *(uint *)((long)p + 0xb8) = uVar50;
                                    *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                    *(ulong *)((long)p + 0x58) = uVar14;
                                    *(uint *)((long)p + 0x60) = uVar10;
                                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                         pqStack_70;
                                    *(int *)((long)p + 0x690) = iVar20;
                                    *(int *)((long)p + 0x694) = iVar27;
                                    *(int *)((long)p + 0x698) = iStack_88;
                                    *(int *)((long)p + 0x69c) = iVar43;
                                    *(int *)((long)p + 0x6a0) = (int)uVar26;
                                    *(uint *)((long)p + 0x678) = uStack_84;
                                    plVar13 = *(long **)((long)p + 0x108);
                                    puVar11 = *(uint **)((long)p + 0x20);
                                    goto LAB_0010f7ef;
                                  }
                                }
                                else {
LAB_0010d695:
                                  uVar31 = (ulong)(byte)*(uint *)pqStack_70;
                                  pqStack_70 = (quasi_adaptive_huffman_data_model *)
                                               ((long)pqStack_70 + 1);
                                }
LAB_0010d69b:
                                uVar14 = uVar14 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                              }
                              uVar31 = uVar14 << 8;
                              uVar10 = uVar10 - 8;
                              *(uint *)((long)p + 0x718) =
                                   *(int *)((long)p + 0x718) << 8 | (uint)(byte)(uVar14 >> 0x38);
                              uVar39 = *(int *)((long)p + 0x71c) + 1;
                              *(uint *)((long)p + 0x71c) = uVar39;
                            }
                            uVar38 = adler32(*(void **)((long)p + 0x150),
                                             (ulong)*(uint *)((long)p + 0x148),1);
                            iVar41 = iVar27;
                            iVar48 = iVar43;
                            uStack_60._4_4_ = iVar20;
                            if (uVar38 != *(uint *)((long)p + 0x718)) {
                              return LZHAM_DECOMP_STATUS_FAILED_BAD_SEED_BYTES;
                            }
                          }
                        }
                        uVar38 = *(uint *)((long)p + 0x158);
                        uVar45 = *(uint *)((long)p + 0x15c);
                        if (uVar45 == 0 && uVar38 == 0) {
                          uVar39 = *(uint *)((long)p + 0x140);
                          uVar28 = 0x14;
                          if (uVar39 < 0x14) {
                            uVar28 = uVar39;
                          }
                          uVar14 = 7;
                          if (uVar39 != 0) {
                            uVar14 = (ulong)(uVar28 - 1);
                          }
                          uVar38 = (uint)*(ushort *)(g_table_update_settings + uVar14 * 4);
                          uVar45 = (uint)*(ushort *)(g_table_update_settings + uVar14 * 4 + 2);
                        }
                        bVar6 = quasi_adaptive_huffman_data_model::init2
                                          ((quasi_adaptive_huffman_data_model *)((long)p + 0x168),*p
                                           ,false,0x100,uVar38,uVar45,(uint16 *)0x0);
                        if (((bVar6) &&
                            (bVar6 = quasi_adaptive_huffman_data_model::assign
                                               ((quasi_adaptive_huffman_data_model *)
                                                ((long)p + 0x1f8),
                                                (quasi_adaptive_huffman_data_model *)
                                                ((long)p + 0x168)), bVar6)) &&
                           (bVar6 = quasi_adaptive_huffman_data_model::init2
                                              ((quasi_adaptive_huffman_data_model *)
                                               ((long)p + 0x288),*p,false,
                                               *(int *)((long)p + 0x14) * 8 - 6,uVar38,uVar45,
                                               (uint16 *)0x0), bVar6)) {
                          bVar6 = quasi_adaptive_huffman_data_model::init2
                                            ((quasi_adaptive_huffman_data_model *)((long)p + 0x318),
                                             *p,false,0x101,uVar38,uVar45,(uint16 *)0x0);
                          if ((bVar6) &&
                             (bVar6 = quasi_adaptive_huffman_data_model::assign
                                                ((quasi_adaptive_huffman_data_model *)
                                                 ((long)p + 0x3a8),
                                                 (quasi_adaptive_huffman_data_model *)
                                                 ((long)p + 0x318)), bVar6)) {
                            bVar6 = quasi_adaptive_huffman_data_model::init2
                                              ((quasi_adaptive_huffman_data_model *)
                                               ((long)p + 0x438),*p,false,0xfa,uVar38,uVar45,
                                               (uint16 *)0x0);
                            if ((bVar6) &&
                               (bVar6 = quasi_adaptive_huffman_data_model::assign
                                                  ((quasi_adaptive_huffman_data_model *)
                                                   ((long)p + 0x4c8),
                                                   (quasi_adaptive_huffman_data_model *)
                                                   ((long)p + 0x438)), bVar6)) {
                              bVar6 = quasi_adaptive_huffman_data_model::init2
                                                ((quasi_adaptive_huffman_data_model *)
                                                 ((long)p + 0x558),*p,false,0x10,uVar38,uVar45,
                                                 (uint16 *)0x0);
                              uVar14 = (ulong)uStack_84;
                              if (bVar6) goto LAB_0011085f;
                              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
                            }
                          }
                        }
                      }
                      return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
                    }
                    goto switchD_0010d329_caseD_458;
                  }
                  goto LAB_0010d38b;
                }
                *(undefined4 *)((long)p + 8) = 0x283;
              }
              return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
            }
            pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x100);
            plVar13 = *(long **)((long)p + 0x108);
            lVar4 = *plVar13;
            *(quasi_adaptive_huffman_data_model **)((long)p + 0x20) = pqStack_70;
            *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
            *(long *)((long)p + 0x38) = lVar4;
            *(byte **)((long)p + 0x30) = (byte *)((long)pqStack_70 + lVar4);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar11 = (uint *)pqStack_70;
            if ((lVar4 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar15 = (ulong)*(uint *)((long)p + 0x6f0);
              uStack_60._4_4_ = *(int *)((long)p + 0x690);
              iVar41 = *(int *)((long)p + 0x694);
              iStack_88 = *(int *)((long)p + 0x698);
              iVar48 = *(int *)((long)p + 0x69c);
              uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar14 = (ulong)*(uint *)((long)p + 0x678);
              uVar50 = *(uint *)((long)p + 0xb8);
              uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
              uVar44 = *(ulong *)((long)p + 0x58);
              uVar39 = *(uint *)((long)p + 0x60);
              if (0 < lVar4) goto LAB_0010d755;
              uVar31 = 0;
LAB_0010d75b:
              do {
                cVar7 = (char)uVar39;
                uVar39 = uVar39 + 8;
                uVar44 = uVar44 | uVar31 << (0x38U - cVar7 & 0x3f);
LAB_0010ef11:
                if (-1 < (int)uVar39) {
                  bVar19 = (byte)uVar39;
                  uVar39 = uVar39 & 0x7ffffff8;
                  uVar44 = uVar44 << (bVar19 & 7);
LAB_00111810:
                  iVar20 = (int)uVar15;
                  if (7 < (int)uVar39) {
                    uVar31 = uVar44 << 8;
                    uVar39 = uVar39 - 8;
                    uVar10 = (int)uVar14 + 1;
                    uVar29 = (ulong)uVar10;
                    pbVar34[uVar14] = (byte)(uVar44 >> 0x38);
                    if (uVar42 < uVar10) {
                      *(uint *)((long)p + 0xb8) = uVar50;
                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                      *(ulong *)((long)p + 0x58) = uVar31;
                      *(uint *)((long)p + 0x60) = uVar39;
                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                      *(int *)((long)p + 0x6f0) = iVar20;
                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                      *(int *)((long)p + 0x694) = iVar41;
                      *(int *)((long)p + 0x698) = iStack_88;
                      *(int *)((long)p + 0x69c) = iVar48;
                      *(int *)((long)p + 0x6a0) = (int)uVar26;
                      *(uint *)((long)p + 0x678) = uVar10;
                      pvVar30 = (void *)((ulong)*(uint *)((long)p + 0x6c8) +
                                         *(long *)((long)p + 0xf0) +
                                        (ulong)*(uint *)((long)p + 0x67c));
                      *(void **)((long)p + 0x6b0) = pvVar30;
                      uVar31 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) +
                                                *(uint *)((long)p + 0x6c8)));
                      *(ulong *)((long)p + 0x6b8) = uVar31;
                      *(undefined4 *)((long)p + 0x6c8) = 0;
                      *(undefined4 *)((long)p + 0x67c) = 0;
LAB_001118dd:
                      if (uVar31 != 0) {
                        uVar26 = **(ulong **)((long)p + 0x118);
                        if (uVar31 < **(ulong **)((long)p + 0x118)) {
                          uVar26 = uVar31;
                        }
                        *(ulong *)((long)p + 0x6c0) = uVar26;
                        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                          memcpy(*(void **)((long)p + 0x110),pvVar30,uVar26);
                        }
                        else {
                          for (uVar31 = 0; sVar52 = uVar26 - uVar31, uVar31 <= uVar26 && sVar52 != 0
                              ; uVar31 = uVar31 + sVar52) {
                            if (0x1fff < sVar52) {
                              sVar52 = 0x2000;
                            }
                            memcpy((void *)(*(long *)((long)p + 0x110) + uVar31),
                                   (void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52);
                            uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52,
                                             *(uint *)((long)p + 0xf8));
                            *(uint *)((long)p + 0xf8) = uVar38;
                            uVar26 = *(ulong *)((long)p + 0x6c0);
                          }
                        }
                        **(long **)((long)p + 0x108) =
                             *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                        lVar21 = *(long *)((long)p + 0x6c0);
                        **(long **)((long)p + 0x118) = lVar21;
                        *(undefined4 *)((long)p + 8) = 0x252;
                        goto LAB_00111a0e;
                      }
                      iVar20 = *(int *)((long)p + 0x6f0);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
                      uVar50 = *(uint *)((long)p + 0xb8);
                      uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                      uVar31 = *(ulong *)((long)p + 0x58);
                      uVar39 = *(uint *)((long)p + 0x60);
                      uVar29 = 0;
                    }
                    uVar15 = (ulong)(iVar20 - 1U);
                    uVar14 = uVar29;
                    uVar44 = uVar31;
                    if (iVar20 - 1U != 0) goto LAB_00111810;
                    uVar15 = 0;
                  }
                  *(uint *)((long)p + 0xb8) = uVar50;
                  *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                  *(ulong *)((long)p + 0x58) = uVar44;
                  *(uint *)((long)p + 0x60) = uVar39;
                  *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                  while (uVar10 = (uint)uVar14, (int)uVar15 != 0) {
                    uVar14 = (long)pqStack_70 - *(long *)((long)p + 0x20);
                    puVar17 = *(ulong **)((long)p + 0x108);
                    uVar31 = *puVar17 - uVar14;
LAB_00111083:
                    uVar50 = (uint)uVar15;
                    if (uVar31 == 0) {
                      *puVar17 = uVar14;
                      **(undefined8 **)((long)p + 0x118) = 0;
                      if (*(char *)((long)p + 0x120) != '\x01') {
                        *(uint *)((long)p + 0x6f0) = uVar50;
                        *(int *)((long)p + 0x690) = uStack_60._4_4_;
                        *(int *)((long)p + 0x694) = iVar41;
                        *(int *)((long)p + 0x698) = iStack_88;
                        *(int *)((long)p + 0x69c) = iVar48;
                        *(int *)((long)p + 0x6a0) = (int)uVar26;
                        *(uint *)((long)p + 0x678) = uVar10;
                        *(undefined4 *)((long)p + 8) = 0x26f;
                        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                      }
                      goto LAB_0011121e;
                    }
                    uVar39 = uVar50;
                    if (uVar31 < uVar15) {
                      uVar39 = (uint)uVar31;
                    }
                    uVar28 = uVar46 - uVar10;
                    if (uVar39 <= uVar46 - uVar10) {
                      uVar28 = uVar39;
                    }
                    memcpy(pbVar34 + uVar10,(void *)(*(long *)((long)p + 0x100) + uVar14),
                           (ulong)uVar28);
                    uVar15 = (ulong)(uVar50 - uVar28);
                    lVar4 = *(long *)((long)p + 0x100);
                    lVar5 = **(long **)((long)p + 0x108);
                    pqStack_70 = (quasi_adaptive_huffman_data_model *)
                                 (uVar14 + lVar4 + (ulong)uVar28);
                    *(long *)((long)p + 0x20) = lVar4;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                    *(long *)((long)p + 0x38) = lVar5;
                    *(long *)((long)p + 0x30) = lVar4 + lVar5;
                    *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                    uVar10 = uVar10 + uVar28;
                    uVar14 = (ulong)uVar10;
                    if (uVar42 < uVar10) {
                      *(uint *)((long)p + 0x6f0) = uVar50 - uVar28;
                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                      *(int *)((long)p + 0x694) = iVar41;
                      *(int *)((long)p + 0x698) = iStack_88;
                      *(int *)((long)p + 0x69c) = iVar48;
                      *(int *)((long)p + 0x6a0) = (int)uVar26;
                      *(uint *)((long)p + 0x678) = uVar10;
                      pvVar30 = (void *)((ulong)*(uint *)((long)p + 0x6c8) +
                                         *(long *)((long)p + 0xf0) +
                                        (ulong)*(uint *)((long)p + 0x67c));
                      *(void **)((long)p + 0x6b0) = pvVar30;
                      uVar31 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) +
                                                *(uint *)((long)p + 0x6c8)));
                      *(ulong *)((long)p + 0x6b8) = uVar31;
                      *(undefined4 *)((long)p + 0x6c8) = 0;
                      *(undefined4 *)((long)p + 0x67c) = 0;
LAB_001111a1:
                      if (uVar31 != 0) {
                        uVar26 = **(ulong **)((long)p + 0x118);
                        if (uVar31 < **(ulong **)((long)p + 0x118)) {
                          uVar26 = uVar31;
                        }
                        *(ulong *)((long)p + 0x6c0) = uVar26;
                        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                          memcpy(*(void **)((long)p + 0x110),pvVar30,uVar26);
                        }
                        else {
                          for (uVar31 = 0; sVar52 = uVar26 - uVar31, uVar31 <= uVar26 && sVar52 != 0
                              ; uVar31 = uVar31 + sVar52) {
                            if (0x1fff < sVar52) {
                              sVar52 = 0x2000;
                            }
                            memcpy((void *)(*(long *)((long)p + 0x110) + uVar31),
                                   (void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52);
                            uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52,
                                             *(uint *)((long)p + 0xf8));
                            *(uint *)((long)p + 0xf8) = uVar38;
                            uVar26 = *(ulong *)((long)p + 0x6c0);
                          }
                        }
                        **(long **)((long)p + 0x108) =
                             *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                        lVar21 = *(long *)((long)p + 0x6c0);
                        **(long **)((long)p + 0x118) = lVar21;
                        *(undefined4 *)((long)p + 8) = 0x294;
                        goto LAB_00111a0e;
                      }
                      uVar15 = (ulong)*(uint *)((long)p + 0x6f0);
                      uStack_60._4_4_ = *(int *)((long)p + 0x690);
                      iVar41 = *(int *)((long)p + 0x694);
                      iStack_88 = *(int *)((long)p + 0x698);
                      iVar48 = *(int *)((long)p + 0x69c);
                      uVar26 = (ulong)*(uint *)((long)p + 0x6a0);
                      uVar14 = 0;
                    }
                  }
                  do {
                    uVar50 = *(uint *)((long)p + 0xb8);
                    uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                    uVar31 = *(ulong *)((long)p + 0x58);
                    uVar10 = *(uint *)((long)p + 0x60);
                    pqVar35 = pqStack_70;
LAB_0011135f:
                    do {
                      *(int *)((long)p + 0x68c) = *(int *)((long)p + 0x68c) + 1;
                      iVar20 = *(int *)((long)p + 0x160);
                      pqStack_70 = pqVar35;
                      if (iVar20 != 0) {
                        uVar46 = (uint)uVar14;
                        if (uVar46 == 0) {
                          uVar9 = 0;
                          goto LAB_001114df;
                        }
                        *(uint *)((long)p + 0xb8) = uVar50;
                        *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                        *(ulong *)((long)p + 0x58) = uVar31;
                        *(uint *)((long)p + 0x60) = uVar10;
                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                        *(int *)((long)p + 0x690) = uStack_60._4_4_;
                        *(int *)((long)p + 0x694) = iVar41;
                        *(int *)((long)p + 0x698) = iStack_88;
                        *(int *)((long)p + 0x69c) = iVar48;
                        *(int *)((long)p + 0x6a0) = (int)uVar26;
                        *(uint *)((long)p + 0x678) = uVar46;
                        pvVar30 = (void *)((ulong)*(uint *)((long)p + 0x6c8) +
                                           *(long *)((long)p + 0xf0) +
                                          (ulong)*(uint *)((long)p + 0x67c));
                        *(void **)((long)p + 0x6b0) = pvVar30;
                        uVar31 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) +
                                                  *(uint *)((long)p + 0x6c8)));
                        *(ulong *)((long)p + 0x6b8) = uVar31;
                        *(undefined4 *)((long)p + 0x6c8) = 0;
                        *(uint *)((long)p + 0x67c) = uVar42 & uVar46;
                        goto LAB_00111411;
                      }
LAB_0011085f:
                      for (; uStack_84 = (uint)uVar14, (int)uVar10 < 2; uVar10 = uVar10 + 8) {
                        if (pqStack_70 ==
                            (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                          uVar15 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar50;
                            *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar31;
                            *(uint *)((long)p + 0x60) = uVar10;
                            *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                            *(int *)((long)p + 0x690) = uStack_60._4_4_;
                            *(int *)((long)p + 0x694) = iVar41;
                            *(int *)((long)p + 0x698) = iStack_88;
                            *(int *)((long)p + 0x69c) = iVar48;
                            *(int *)((long)p + 0x6a0) = (int)uVar26;
                            *(uint *)((long)p + 0x678) = uStack_84;
                            plVar13 = *(long **)((long)p + 0x108);
                            puVar11 = *(uint **)((long)p + 0x20);
                            goto LAB_0010f8fa;
                          }
                        }
                        else {
LAB_0010dda7:
                          uVar15 = (ulong)(byte)*(uint *)pqStack_70;
                          pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)pqStack_70 + 1);
                        }
LAB_0010ddb2:
                        uVar31 = uVar31 | uVar15 << (0x38U - (char)uVar10 & 0x3f);
                      }
                      uVar15 = uVar31 >> 0x3e;
                      *(uint *)((long)p + 0x6a8) = (uint)(uVar31 >> 0x3e);
                      uVar31 = uVar31 << 2;
                      uVar10 = uVar10 - 2;
                      uVar9 = 0;
                      uVar39 = 0;
                      switch(uVar15) {
                      case 1:
                        uVar50 = 0;
                        for (; uVar14 = uVar31, uVar39 < 4; uVar39 = uVar39 + 1) {
                          for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                            if (pqStack_70 ==
                                (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                              uVar31 = 0;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar50;
                                *(uint *)((long)p + 0xbc) = uVar39;
                                *(ulong *)((long)p + 0x58) = uVar14;
                                *(uint *)((long)p + 0x60) = uVar10;
                                *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70
                                ;
                                *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                *(int *)((long)p + 0x694) = iVar41;
                                *(int *)((long)p + 0x698) = iStack_88;
                                *(int *)((long)p + 0x69c) = iVar48;
                                *(int *)((long)p + 0x6a0) = (int)uVar26;
                                *(uint *)((long)p + 0x678) = uStack_84;
                                plVar13 = *(long **)((long)p + 0x108);
                                puVar11 = *(uint **)((long)p + 0x20);
                                goto LAB_0010fab9;
                              }
                            }
                            else {
LAB_0010ecde:
                              uVar31 = (ulong)(byte)*(uint *)pqStack_70;
                              pqStack_70 = (quasi_adaptive_huffman_data_model *)
                                           ((long)pqStack_70 + 1);
                            }
LAB_0010ece4:
                            cVar7 = (char)uVar10;
                            uVar14 = uVar14 | uVar31 << (0x38U - cVar7 & 0x3f);
                          }
                          uVar31 = uVar14 << 8;
                          uVar10 = uVar10 - 8;
                          uVar50 = uVar50 << 8 | (uint)(byte)(uVar14 >> 0x38);
                        }
                        *(uint *)((long)p + 0x6a4) = uStack_84;
                        uStack_60._4_4_ = 1;
                        uStack_68 = 0;
                        uStack_78._4_4_ = 0xffffffff;
                        iVar20 = 1;
                        iVar48 = 1;
                        pqVar35 = pqStack_70;
                        uVar26 = uVar31;
                        iStack_88 = uStack_60._4_4_;
                        for (; (int)uVar10 < 2; uVar10 = uVar10 + 8) {
                          if (pqVar35 ==
                              (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                            uVar31 = 0;
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar50;
                              *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar26;
                              *(uint *)((long)p + 0x60) = uVar10;
                              *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                              *(int *)((long)p + 0x690) = uStack_60._4_4_;
                              *(int *)((long)p + 0x694) = iVar20;
                              *(int *)((long)p + 0x698) = iStack_88;
                              *(int *)((long)p + 0x69c) = iVar48;
                              *(int *)((long)p + 0x6a0) = (int)uStack_68;
                              *(uint *)((long)p + 0x678) = uStack_84;
                              puVar11 = *(uint **)((long)p + 0x20);
                              plVar13 = *(long **)((long)p + 0x108);
                              goto LAB_0010fb97;
                            }
                          }
                          else {
LAB_0010f305:
                            uVar31 = (ulong)(byte)*(uint *)pqVar35;
                            pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1);
                          }
LAB_0010f30b:
                          cVar7 = (char)uVar10;
                          uVar26 = uVar26 | uVar31 << (0x38U - cVar7 & 0x3f);
                        }
                        uVar31 = uVar26 << 2;
                        uVar10 = uVar10 - 2;
                        if (uVar26 >> 0x3e == 2) {
                          lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                        }
                        else if ((uint)(uVar26 >> 0x3e) == 1) {
                          lzham_decompressor::reset_huffman_table_update_rates
                                    ((lzham_decompressor *)p);
                        }
                        do {
                          while( true ) {
                            while( true ) {
                              puVar18 = (ushort *)((long)p + uStack_68 * 2 + 0x5e8);
                              iVar41 = iVar20;
                              for (; uStack_78._4_4_ < 0x1000000;
                                  uStack_78._4_4_ = uStack_78._4_4_ << 8) {
                                *(ushort **)((long)p + 0xd0) = puVar18;
                                uVar26 = uVar31;
                                for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                                  if (pqVar35 ==
                                      (quasi_adaptive_huffman_data_model *)
                                      *(uint **)((long)p + 0x30)) {
                                    uVar31 = 0;
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(uint *)((long)p + 0xb8) = uVar50;
                                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                      *(ulong *)((long)p + 0x58) = uVar26;
                                      *(uint *)((long)p + 0x60) = uVar10;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x694) = iVar41;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      plVar13 = *(long **)((long)p + 0x108);
                                      puVar11 = *(uint **)((long)p + 0x20);
                                      goto LAB_0010fb72;
                                    }
                                  }
                                  else {
LAB_0010f21b:
                                    uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 1);
                                  }
LAB_0010f221:
                                  uVar26 = uVar26 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                                }
                                uVar31 = uVar26 << 8;
                                uVar10 = uVar10 - 8;
                                puVar18 = *(ushort **)((long)p + 0xd0);
                                uVar50 = uVar50 << 8 | (uint)(byte)(uVar26 >> 0x38);
                              }
                              uVar3 = *puVar18;
                              uVar39 = (uStack_78._4_4_ >> 0xb) * (uint)uVar3;
                              uVar51 = uVar50 - uVar39;
                              if (uVar39 <= uVar50) break;
                              *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                              iVar20 = iVar41;
                              uStack_78._4_4_ = uVar39;
                              if ((uint)uStack_68 < 7) {
                                pqVar36 = (quasi_adaptive_huffman_data_model *)((long)p + 0x168);
                                pdVar24 = *(decoder_tables **)((long)p + 0x1d0);
                                if ((int)uVar10 < 0x18) {
                                  puVar11 = *(uint **)((long)p + 0x30);
                                  if ((uint *)((long)pqVar35 + 4) < puVar11) {
                                    uVar39 = *(uint *)pqVar35;
                                    uVar10 = uVar10 + 0x20;
                                    uVar31 = uVar31 | (ulong)(uVar39 >> 0x18 |
                                                              (uVar39 & 0xff0000) >> 8 |
                                                              (uVar39 & 0xff00) << 8 |
                                                             uVar39 << 0x18) <<
                                                      (-(char)uVar10 & 0x3fU);
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 4);
                                  }
                                  else {
                                    for (; iVar20 = iVar41, uStack_78._4_4_ = uVar39,
                                        (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                                      if (*(char *)((long)p + 0x40) == '\0') {
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 200) =
                                             pqVar36;
                                        *(uint *)((long)p + 0xb8) = uVar50;
                                        *(uint *)((long)p + 0xbc) = uVar39;
                                        *(ulong *)((long)p + 0x58) = uVar31;
                                        *(uint *)((long)p + 0x60) = uVar10;
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                             pqVar35;
                                        *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                        *(int *)((long)p + 0x694) = iVar41;
                                        *(int *)((long)p + 0x698) = iStack_88;
                                        *(int *)((long)p + 0x69c) = iVar48;
                                        *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                        *(uint *)((long)p + 0x678) = uStack_84;
                                        plVar13 = *(long **)((long)p + 0x108);
                                        puVar12 = *(uint **)((long)p + 0x20);
                                        goto LAB_001121d5;
                                      }
LAB_001120c5:
                                      uVar26 = 0;
                                      if (pqVar35 < puVar11) {
                                        uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                        pqVar35 = (quasi_adaptive_huffman_data_model *)
                                                  ((long)pqVar35 + 1);
                                      }
                                      uVar31 = uVar31 | uVar26 << (0x38U - (char)uVar10 & 0x3f);
                                    }
                                  }
                                }
                                uVar39 = (uint)(ushort)(uVar31 >> 0x30);
                                if (uVar39 < pdVar24->m_table_max_code) {
                                  uVar26 = (ulong)(pdVar24->m_lookup
                                                   [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)
                                                   ] & 0xffff);
                                  uVar39 = pdVar24->m_lookup
                                           [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                                           0x10;
                                }
                                else {
                                  iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                                  do {
                                    iVar27 = iVar43;
                                    iVar43 = iVar27 + 1;
                                  } while (pdVar24->m_max_codes[iVar27 + 0x40U] <= uVar39);
                                  uVar28 = (int)(uVar31 >> (-(char)(iVar27 + 1) & 0x3fU)) +
                                           pdVar24->m_val_ptrs[iVar27 + 0x40U];
                                  uVar39 = 0;
                                  if (uVar28 < pqVar36->m_total_syms) {
                                    uVar39 = uVar28;
                                  }
                                  uVar26 = (ulong)pdVar24->m_sorted_symbol_order[(int)uVar39];
                                  uVar39 = iVar27 + 0x41;
                                }
                                uVar31 = uVar31 << ((byte)uVar39 & 0x3f);
                                puVar2 = (pqVar36->m_sym_freq).m_p + uVar26;
                                *puVar2 = *puVar2 + 1;
                                uVar10 = uVar10 - uVar39;
                                puVar1 = &pqVar36->m_symbols_until_update;
                                *puVar1 = *puVar1 - 1;
                                if (*puVar1 == 0) {
                                  quasi_adaptive_huffman_data_model::update_tables(pqVar36,-1,false)
                                  ;
                                }
                              }
                              else {
                                uVar28 = (uint)pbVar34[uStack_84 - uStack_60._4_4_ & uVar42];
                                pqVar36 = (quasi_adaptive_huffman_data_model *)((long)p + 0x1f8);
                                pdVar24 = *(decoder_tables **)((long)p + 0x260);
                                if ((int)uVar10 < 0x18) {
                                  puVar11 = *(uint **)((long)p + 0x30);
                                  if ((uint *)((long)pqVar35 + 4) < puVar11) {
                                    uVar39 = *(uint *)pqVar35;
                                    uVar10 = uVar10 + 0x20;
                                    uVar31 = uVar31 | (ulong)(uVar39 >> 0x18 |
                                                              (uVar39 & 0xff0000) >> 8 |
                                                              (uVar39 & 0xff00) << 8 |
                                                             uVar39 << 0x18) <<
                                                      (-(char)uVar10 & 0x3fU);
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 4);
                                  }
                                  else {
                                    for (; iVar20 = iVar41, uStack_78._4_4_ = uVar39,
                                        (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                                      if (*(char *)((long)p + 0x40) == '\0') {
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 200) =
                                             pqVar36;
                                        *(uint *)((long)p + 0xb8) = uVar50;
                                        *(uint *)((long)p + 0xbc) = uVar39;
                                        *(ulong *)((long)p + 0x58) = uVar31;
                                        *(uint *)((long)p + 0x60) = uVar10;
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                             pqVar35;
                                        *(uint *)((long)p + 0x6d0) = uVar28;
                                        *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                        *(int *)((long)p + 0x694) = iVar41;
                                        *(int *)((long)p + 0x698) = iStack_88;
                                        *(int *)((long)p + 0x69c) = iVar48;
                                        *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                        *(uint *)((long)p + 0x678) = uStack_84;
                                        plVar13 = *(long **)((long)p + 0x108);
                                        puVar12 = *(uint **)((long)p + 0x20);
                                        goto LAB_00112383;
                                      }
LAB_00112262:
                                      uVar26 = 0;
                                      if (pqVar35 < puVar11) {
                                        uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                        pqVar35 = (quasi_adaptive_huffman_data_model *)
                                                  ((long)pqVar35 + 1);
                                      }
                                      uVar31 = uVar31 | uVar26 << (0x38U - (char)uVar10 & 0x3f);
                                    }
                                  }
                                }
                                uVar39 = (uint)(ushort)(uVar31 >> 0x30);
                                if (uVar39 < pdVar24->m_table_max_code) {
                                  uVar51 = pdVar24->m_lookup
                                           [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                                           0xffff;
                                  uVar39 = pdVar24->m_lookup
                                           [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                                           0x10;
                                }
                                else {
                                  iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                                  do {
                                    iVar27 = iVar43;
                                    iVar43 = iVar27 + 1;
                                  } while (pdVar24->m_max_codes[iVar27 + 0x40U] <= uVar39);
                                  uVar51 = (int)(uVar31 >> (-(char)(iVar27 + 1) & 0x3fU)) +
                                           pdVar24->m_val_ptrs[iVar27 + 0x40U];
                                  uVar39 = 0;
                                  if (uVar51 < pqVar36->m_total_syms) {
                                    uVar39 = uVar51;
                                  }
                                  uVar51 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar39];
                                  uVar39 = iVar27 + 0x41;
                                }
                                uVar31 = uVar31 << ((byte)uVar39 & 0x3f);
                                puVar2 = (pqVar36->m_sym_freq).m_p + uVar51;
                                *puVar2 = *puVar2 + 1;
                                uVar10 = uVar10 - uVar39;
                                puVar1 = &pqVar36->m_symbols_until_update;
                                *puVar1 = *puVar1 - 1;
                                if (*puVar1 == 0) {
                                  quasi_adaptive_huffman_data_model::update_tables(pqVar36,-1,false)
                                  ;
                                }
                                uVar26 = (ulong)(uVar51 ^ uVar28);
                              }
                              pbVar34[uStack_84] = (byte)uVar26;
                              bVar19 = (&s_literal_next_state)[uStack_68];
                              uStack_68 = (ulong)bVar19;
                              uStack_84 = uStack_84 + 1;
                              if (uVar42 < uStack_84) {
                                *(uint *)((long)p + 0xb8) = uVar50;
                                *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                *(ulong *)((long)p + 0x58) = uVar31;
                                *(uint *)((long)p + 0x60) = uVar10;
                                *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                                *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                *(int *)((long)p + 0x694) = iVar20;
                                *(int *)((long)p + 0x698) = iStack_88;
                                *(int *)((long)p + 0x69c) = iVar48;
                                *(uint *)((long)p + 0x6a0) = (uint)bVar19;
                                *(uint *)((long)p + 0x678) = uStack_84;
                                pvVar30 = (void *)((ulong)*(uint *)((long)p + 0x6c8) +
                                                   *(long *)((long)p + 0xf0) +
                                                  (ulong)*(uint *)((long)p + 0x67c));
                                *(void **)((long)p + 0x6b0) = pvVar30;
                                uVar31 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) +
                                                          *(uint *)((long)p + 0x6c8)));
                                *(ulong *)((long)p + 0x6b8) = uVar31;
                                *(undefined4 *)((long)p + 0x6c8) = 0;
                                *(undefined4 *)((long)p + 0x67c) = 0;
LAB_0010e206:
                                if (uVar31 != 0) {
                                  uVar26 = **(ulong **)((long)p + 0x118);
                                  if (uVar31 < **(ulong **)((long)p + 0x118)) {
                                    uVar26 = uVar31;
                                  }
                                  *(ulong *)((long)p + 0x6c0) = uVar26;
                                  if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                                    memcpy(*(void **)((long)p + 0x110),pvVar30,uVar26);
                                  }
                                  else {
                                    for (uVar31 = 0; sVar52 = uVar26 - uVar31,
                                        uVar31 <= uVar26 && sVar52 != 0; uVar31 = uVar31 + sVar52) {
                                      if (0x1fff < sVar52) {
                                        sVar52 = 0x2000;
                                      }
                                      memcpy((void *)(*(long *)((long)p + 0x110) + uVar31),
                                             (void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52);
                                      uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar31)
                                                       ,sVar52,*(uint *)((long)p + 0xf8));
                                      *(uint *)((long)p + 0xf8) = uVar38;
                                      uVar26 = *(ulong *)((long)p + 0x6c0);
                                    }
                                  }
                                  **(long **)((long)p + 0x108) =
                                       *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                                  lVar21 = *(long *)((long)p + 0x6c0);
                                  **(long **)((long)p + 0x118) = lVar21;
                                  *(undefined4 *)((long)p + 8) = 0x318;
                                  goto LAB_00111a0e;
                                }
                                uStack_60._4_4_ = *(int *)((long)p + 0x690);
                                iVar20 = *(int *)((long)p + 0x694);
                                iStack_88 = *(int *)((long)p + 0x698);
                                iVar48 = *(int *)((long)p + 0x69c);
                                uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                                uVar50 = *(uint *)((long)p + 0xb8);
                                uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                                uVar31 = *(ulong *)((long)p + 0x58);
                                uVar10 = *(uint *)((long)p + 0x60);
                                uStack_84 = 0;
                              }
                            }
                            *puVar18 = uVar3 - (uVar3 >> 5);
                            puVar18 = (ushort *)((long)p + uStack_68 * 2 + 0x600);
                            uVar28 = 1;
                            uVar26 = uStack_68;
                            for (uVar39 = uStack_78._4_4_ - uVar39; uVar39 < 0x1000000;
                                uVar39 = uVar39 << 8) {
                              *(ushort **)((long)p + 0xd0) = puVar18;
                              uVar14 = uVar31;
                              for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                                if (pqVar35 ==
                                    (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30))
                                {
                                  uVar31 = 0;
                                  if (*(char *)((long)p + 0x40) == '\0') {
                                    *(uint *)((long)p + 0xb8) = uVar51;
                                    *(uint *)((long)p + 0xbc) = uVar39;
                                    *(ulong *)((long)p + 0x58) = uVar14;
                                    *(uint *)((long)p + 0x60) = uVar10;
                                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                         pqVar35;
                                    *(uint *)((long)p + 0x6d4) = uVar28;
                                    *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                    *(int *)((long)p + 0x694) = iVar41;
                                    *(int *)((long)p + 0x698) = iStack_88;
                                    *(int *)((long)p + 0x69c) = iVar48;
                                    *(int *)((long)p + 0x6a0) = (int)uVar26;
                                    *(uint *)((long)p + 0x678) = uStack_84;
                                    plVar13 = *(long **)((long)p + 0x108);
                                    puVar11 = *(uint **)((long)p + 0x20);
                                    goto LAB_0010fb4d;
                                  }
                                }
                                else {
LAB_0010f12f:
                                  uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                  pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1)
                                  ;
                                }
LAB_0010f135:
                                uVar14 = uVar14 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                              }
                              uVar31 = uVar14 << 8;
                              uVar10 = uVar10 - 8;
                              puVar18 = *(ushort **)((long)p + 0xd0);
                              uVar51 = uVar51 << 8 | (uint)(byte)(uVar14 >> 0x38);
                            }
                            uVar3 = *puVar18;
                            uStack_78._4_4_ = (uVar39 >> 0xb) * (uint)uVar3;
                            uVar40 = uVar51 - uStack_78._4_4_;
                            if (uVar51 < uStack_78._4_4_) break;
                            *puVar18 = uVar3 - (uVar3 >> 5);
                            puVar18 = (ushort *)((long)p + uVar26 * 2 + 0x618);
                            uStack_68 = uVar26;
                            for (uVar39 = uVar39 - uStack_78._4_4_; uVar39 < 0x1000000;
                                uVar39 = uVar39 << 8) {
                              *(ushort **)((long)p + 0xd0) = puVar18;
                              uVar26 = uVar31;
                              for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                                if (pqVar35 ==
                                    (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30))
                                {
                                  uVar31 = 0;
                                  if (*(char *)((long)p + 0x40) == '\0') {
                                    *(uint *)((long)p + 0xb8) = uVar40;
                                    *(uint *)((long)p + 0xbc) = uVar39;
                                    *(ulong *)((long)p + 0x58) = uVar26;
                                    *(uint *)((long)p + 0x60) = uVar10;
                                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                         pqVar35;
                                    *(uint *)((long)p + 0x6d4) = uVar28;
                                    *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                    *(int *)((long)p + 0x694) = iVar41;
                                    *(int *)((long)p + 0x698) = iStack_88;
                                    *(int *)((long)p + 0x69c) = iVar48;
                                    *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                    *(uint *)((long)p + 0x678) = uStack_84;
                                    plVar13 = *(long **)((long)p + 0x108);
                                    puVar11 = *(uint **)((long)p + 0x20);
                                    goto LAB_0010fade;
                                  }
                                }
                                else {
LAB_0010edbc:
                                  uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                  pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1)
                                  ;
                                }
LAB_0010edc2:
                                uVar26 = uVar26 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                              }
                              uVar31 = uVar26 << 8;
                              uVar10 = uVar10 - 8;
                              puVar18 = *(ushort **)((long)p + 0xd0);
                              uVar40 = uVar40 << 8 | (uint)(byte)(uVar26 >> 0x38);
                            }
                            uVar3 = *puVar18;
                            uStack_78._4_4_ = (uVar39 >> 0xb) * (uint)uVar3;
                            uVar51 = uVar40 - uStack_78._4_4_;
                            if (uVar40 < uStack_78._4_4_) {
                              *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                              pqVar36 = (quasi_adaptive_huffman_data_model *)
                                        ((long)p + (ulong)(6 < (uint)uStack_68) * 0x90 + 0x318);
                              pdVar24 = *(decoder_tables **)
                                         ((long)p + (ulong)(6 < (uint)uStack_68) * 0x90 + 0x380);
                              if ((int)uVar10 < 0x18) {
                                puVar11 = *(uint **)((long)p + 0x30);
                                if ((uint *)((long)pqVar35 + 4) < puVar11) {
                                  uVar50 = *(uint *)pqVar35;
                                  uVar10 = uVar10 + 0x20;
                                  uVar31 = uVar31 | (ulong)(uVar50 >> 0x18 |
                                                            (uVar50 & 0xff0000) >> 8 |
                                                            (uVar50 & 0xff00) << 8 | uVar50 << 0x18)
                                                    << (-(char)uVar10 & 0x3fU);
                                  pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 4)
                                  ;
                                }
                                else {
                                  for (; (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 200) =
                                           pqVar36;
                                      *(uint *)((long)p + 0xb8) = uVar40;
                                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                      *(ulong *)((long)p + 0x58) = uVar31;
                                      *(uint *)((long)p + 0x60) = uVar10;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(uint *)((long)p + 0x6d4) = uVar28;
                                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x694) = iVar41;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      plVar13 = *(long **)((long)p + 0x108);
                                      puVar12 = *(uint **)((long)p + 0x20);
                                      goto LAB_00112d53;
                                    }
LAB_00112cbc:
                                    uVar26 = 0;
                                    if (pqVar35 < puVar11) {
                                      uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                      pqVar35 = (quasi_adaptive_huffman_data_model *)
                                                ((long)pqVar35 + 1);
                                    }
                                    uVar31 = uVar31 | uVar26 << (0x38U - (char)uVar10 & 0x3f);
                                  }
                                }
                              }
                              uVar50 = (uint)(ushort)(uVar31 >> 0x30);
                              if (uVar50 < pdVar24->m_table_max_code) {
                                uVar28 = pdVar24->m_lookup
                                         [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff
                                ;
                                uVar50 = pdVar24->m_lookup
                                         [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                              }
                              else {
                                iVar20 = pdVar24->m_decode_start_code_size - 0x41;
                                do {
                                  iVar43 = iVar20;
                                  iVar20 = iVar43 + 1;
                                } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar50);
                                uVar39 = (int)(uVar31 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                         pdVar24->m_val_ptrs[iVar43 + 0x40U];
                                uVar50 = 0;
                                if (uVar39 < pqVar36->m_total_syms) {
                                  uVar50 = uVar39;
                                }
                                uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar50];
                                uVar50 = iVar43 + 0x41;
                              }
                              uVar31 = uVar31 << ((byte)uVar50 & 0x3f);
                              puVar2 = (pqVar36->m_sym_freq).m_p + uVar28;
                              *puVar2 = *puVar2 + 1;
                              uVar10 = uVar10 - uVar50;
                              puVar1 = &pqVar36->m_symbols_until_update;
                              *puVar1 = *puVar1 - 1;
                              if (*puVar1 == 0) {
                                quasi_adaptive_huffman_data_model::update_tables(pqVar36,-1,false);
                              }
                              uVar28 = uVar28 + 2;
                              uVar39 = 0;
                              if (uVar28 == 0x102) {
                                do {
                                  while (uVar50 = uVar10, (int)uVar50 < 1) {
                                    if (pqVar35 ==
                                        (quasi_adaptive_huffman_data_model *)
                                        *(uint **)((long)p + 0x30)) {
                                      if (*(char *)((long)p + 0x40) == '\0') {
                                        *(uint *)((long)p + 0xb8) = uVar40;
                                        *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                        *(ulong *)((long)p + 0x58) = uVar31;
                                        *(uint *)((long)p + 0x60) = uVar50;
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                             pqVar35;
                                        *(uint *)((long)p + 0x6d4) = uVar39;
                                        *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                        *(int *)((long)p + 0x694) = iVar41;
                                        *(int *)((long)p + 0x698) = iStack_88;
                                        *(int *)((long)p + 0x69c) = iVar48;
                                        *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                        *(uint *)((long)p + 0x678) = uStack_84;
                                        puVar11 = *(uint **)((long)p + 0x20);
                                        plVar13 = *(long **)((long)p + 0x108);
                                        goto LAB_0010f85e;
                                      }
                                      uVar26 = 0;
                                      puVar11 = (uint *)pqVar35;
                                    }
                                    else {
LAB_00112b06:
                                      uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                      puVar11 = (uint *)((long)pqVar35 + 1);
                                    }
LAB_00112b19:
                                    uVar31 = uVar26 << (0x38U - (char)uVar50 & 0x3f) | uVar31;
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                                    uVar10 = uVar50 + 8;
                                  }
                                  uVar26 = uVar31 * 2;
                                  if (-1 < (long)uVar31) break;
                                  uVar39 = uVar39 + 1;
                                  uVar31 = uVar26;
                                  uVar10 = uVar50 - 1;
                                } while (uVar39 < 3);
                                iVar20 = uVar50 - 1;
                                while( true ) {
                                  bVar19 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar39);
                                  uVar10 = iVar20 - (uint)bVar19;
                                  if ((int)(uint)bVar19 <= iVar20) break;
                                  if (pqVar35 ==
                                      (quasi_adaptive_huffman_data_model *)
                                      *(uint **)((long)p + 0x30)) {
                                    uVar31 = 0;
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(uint *)((long)p + 0xb8) = uVar40;
                                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                      *(ulong *)((long)p + 0x58) = uVar26;
                                      *(int *)((long)p + 0x60) = iVar20;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(uint *)((long)p + 0x6d4) = uVar39;
                                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x694) = iVar41;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      puVar11 = *(uint **)((long)p + 0x20);
                                      plVar13 = *(long **)((long)p + 0x108);
                                      goto LAB_0010f979;
                                    }
                                  }
                                  else {
LAB_0010e301:
                                    uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 1);
                                  }
LAB_0010e310:
                                  cVar7 = (char)iVar20;
                                  iVar20 = iVar20 + 8;
                                  uVar26 = uVar26 | uVar31 << (0x38U - cVar7 & 0x3f);
                                }
                                uVar31 = uVar26 << (bVar19 & 0x3f);
                                uVar28 = (int)(uVar26 >> (-bVar19 & 0x3f)) +
                                         *(int *)(s_huge_match_base_len + (ulong)uVar39 * 4);
                              }
                              puVar18 = (ushort *)((long)p + uStack_68 * 2 + 0x648);
                              iVar20 = uStack_60._4_4_;
                              uStack_60._4_4_ = iVar41;
                              for (; iVar41 = iVar20, uStack_78._4_4_ < 0x1000000;
                                  uStack_78._4_4_ = uStack_78._4_4_ << 8) {
                                *(ushort **)((long)p + 0xd0) = puVar18;
                                uVar26 = uVar31;
                                for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                                  if (pqVar35 ==
                                      (quasi_adaptive_huffman_data_model *)
                                      *(uint **)((long)p + 0x30)) {
                                    uVar31 = 0;
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(uint *)((long)p + 0xb8) = uVar40;
                                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                      *(ulong *)((long)p + 0x58) = uVar26;
                                      *(uint *)((long)p + 0x60) = uVar10;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(uint *)((long)p + 0x6d4) = uVar28;
                                      *(int *)((long)p + 0x690) = iVar41;
                                      *(int *)((long)p + 0x694) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      puVar11 = *(uint **)((long)p + 0x20);
                                      plVar13 = *(long **)((long)p + 0x108);
                                      goto LAB_0010f8a8;
                                    }
                                  }
                                  else {
LAB_0010daca:
                                    uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 1);
                                  }
LAB_0010dad0:
                                  uVar26 = uVar26 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                                }
                                uVar31 = uVar26 << 8;
                                uVar10 = uVar10 - 8;
                                puVar18 = *(ushort **)((long)p + 0xd0);
                                uVar40 = uVar40 << 8 | (uint)(byte)(uVar26 >> 0x38);
                                iVar20 = iVar41;
                              }
                              uVar3 = *puVar18;
                              uVar39 = (uStack_78._4_4_ >> 0xb) * (uint)uVar3;
                              if (uVar40 < uVar39) {
                                *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                                puVar18 = (ushort *)((long)p + uStack_68 * 2 + 0x660);
                                iVar20 = uStack_60._4_4_;
                                for (; uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
                                  *(ushort **)((long)p + 0xd0) = puVar18;
                                  uVar26 = uVar31;
                                  for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                                    if (pqVar35 ==
                                        (quasi_adaptive_huffman_data_model *)
                                        *(uint **)((long)p + 0x30)) {
                                      uVar31 = 0;
                                      if (*(char *)((long)p + 0x40) == '\0') {
                                        *(uint *)((long)p + 0xb8) = uVar40;
                                        *(uint *)((long)p + 0xbc) = uVar39;
                                        *(ulong *)((long)p + 0x58) = uVar26;
                                        *(uint *)((long)p + 0x60) = uVar10;
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                             pqVar35;
                                        *(uint *)((long)p + 0x6d4) = uVar28;
                                        *(int *)((long)p + 0x690) = iVar41;
                                        *(int *)((long)p + 0x694) = iVar20;
                                        *(int *)((long)p + 0x698) = iStack_88;
                                        *(int *)((long)p + 0x69c) = iVar48;
                                        *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                        *(uint *)((long)p + 0x678) = uStack_84;
                                        puVar11 = *(uint **)((long)p + 0x20);
                                        plVar13 = *(long **)((long)p + 0x108);
                                        goto LAB_0010fa1d;
                                      }
                                    }
                                    else {
LAB_0010e8a7:
                                      uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                      pqVar35 = (quasi_adaptive_huffman_data_model *)
                                                ((long)pqVar35 + 1);
                                    }
LAB_0010e8b1:
                                    uVar26 = uVar26 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                                  }
                                  uVar31 = uVar26 << 8;
                                  uVar10 = uVar10 - 8;
                                  puVar18 = *(ushort **)((long)p + 0xd0);
                                  uVar40 = uVar40 << 8 | (uint)(byte)(uVar26 >> 0x38);
                                }
                                uVar3 = *puVar18;
                                uStack_78._4_4_ = (uVar39 >> 0xb) * (uint)uVar3;
                                uVar50 = uVar40 - uStack_78._4_4_;
                                if (uVar40 < uStack_78._4_4_) {
                                  *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                                  uVar50 = uVar40;
                                  uStack_60._4_4_ = iVar48;
                                  iVar48 = iStack_88;
                                  iStack_88 = iVar20;
                                }
                                else {
                                  *puVar18 = uVar3 - (uVar3 >> 5);
                                  uStack_78._4_4_ = uVar39 - uStack_78._4_4_;
                                  uStack_60._4_4_ = iStack_88;
                                  iStack_88 = iVar20;
                                }
                              }
                              else {
                                *puVar18 = uVar3 - (uVar3 >> 5);
                                uStack_78._4_4_ = uStack_78._4_4_ - uVar39;
                                uVar50 = uVar40 - uVar39;
                              }
LAB_00112ad8:
                              uVar39 = (uint)(6 < (uint)uStack_68) * 3 + 8;
                            }
                            else {
                              *puVar18 = uVar3 - (uVar3 >> 5);
                              puVar18 = (ushort *)((long)p + uStack_68 * 2 + 0x630);
                              for (uVar39 = uVar39 - uStack_78._4_4_; uVar39 < 0x1000000;
                                  uVar39 = uVar39 << 8) {
                                *(ushort **)((long)p + 0xd0) = puVar18;
                                uVar26 = uVar31;
                                for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                                  if (pqVar35 ==
                                      (quasi_adaptive_huffman_data_model *)
                                      *(uint **)((long)p + 0x30)) {
                                    uVar31 = 0;
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(uint *)((long)p + 0xb8) = uVar51;
                                      *(uint *)((long)p + 0xbc) = uVar39;
                                      *(ulong *)((long)p + 0x58) = uVar26;
                                      *(uint *)((long)p + 0x60) = uVar10;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(uint *)((long)p + 0x6d4) = uVar28;
                                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x694) = iVar41;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      plVar13 = *(long **)((long)p + 0x108);
                                      puVar11 = *(uint **)((long)p + 0x20);
                                      goto LAB_0010f9f8;
                                    }
                                  }
                                  else {
LAB_0010e7b3:
                                    uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 1);
                                  }
LAB_0010e7b9:
                                  uVar26 = uVar26 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                                }
                                uVar31 = uVar26 << 8;
                                uVar10 = uVar10 - 8;
                                puVar18 = *(ushort **)((long)p + 0xd0);
                                uVar51 = uVar51 << 8 | (uint)(byte)(uVar26 >> 0x38);
                              }
                              uVar3 = *puVar18;
                              uStack_78._4_4_ = (uVar39 >> 0xb) * (uint)uVar3;
                              uVar50 = uVar51 - uStack_78._4_4_;
                              uVar40 = (uint)uStack_68;
                              if (uVar51 < uStack_78._4_4_) {
                                *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                                pqStack_70 = (quasi_adaptive_huffman_data_model *)
                                             ((long)p + (ulong)(6 < uVar40) * 0x90 + 0x318);
                                pdVar24 = *(decoder_tables **)
                                           ((long)p + (ulong)(6 < uVar40) * 0x90 + 0x380);
                                if ((int)uVar10 < 0x18) {
                                  puVar11 = *(uint **)((long)p + 0x30);
                                  if ((uint *)((long)pqVar35 + 4) < puVar11) {
                                    uVar50 = *(uint *)pqVar35;
                                    uVar10 = uVar10 + 0x20;
                                    uVar31 = uVar31 | (ulong)(uVar50 >> 0x18 |
                                                              (uVar50 & 0xff0000) >> 8 |
                                                              (uVar50 & 0xff00) << 8 |
                                                             uVar50 << 0x18) <<
                                                      (-(char)uVar10 & 0x3fU);
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 4);
                                  }
                                  else {
                                    for (; (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                                      if (*(char *)((long)p + 0x40) == '\0') {
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 200) =
                                             pqStack_70;
                                        *(uint *)((long)p + 0xb8) = uVar51;
                                        *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                        *(ulong *)((long)p + 0x58) = uVar31;
                                        *(uint *)((long)p + 0x60) = uVar10;
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                             pqVar35;
                                        *(uint *)((long)p + 0x6d4) = uVar28;
                                        *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                        *(int *)((long)p + 0x694) = iVar41;
                                        *(int *)((long)p + 0x698) = iStack_88;
                                        *(int *)((long)p + 0x69c) = iVar48;
                                        *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                        *(uint *)((long)p + 0x678) = uStack_84;
                                        plVar13 = *(long **)((long)p + 0x108);
                                        puVar12 = *(uint **)((long)p + 0x20);
                                        goto LAB_001125d1;
                                      }
LAB_001124d4:
                                      uVar26 = 0;
                                      if (pqVar35 < puVar11) {
                                        uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                        pqVar35 = (quasi_adaptive_huffman_data_model *)
                                                  ((long)pqVar35 + 1);
                                      }
                                      uVar31 = uVar31 | uVar26 << (0x38U - (char)uVar10 & 0x3f);
                                    }
                                  }
                                }
                                uVar50 = (uint)(ushort)(uVar31 >> 0x30);
                                if (uVar50 < pdVar24->m_table_max_code) {
                                  uVar28 = pdVar24->m_lookup
                                           [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                                           0xffff;
                                  uVar50 = pdVar24->m_lookup
                                           [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                                           0x10;
                                }
                                else {
                                  iVar20 = pdVar24->m_decode_start_code_size - 0x41;
                                  do {
                                    iVar43 = iVar20;
                                    iVar20 = iVar43 + 1;
                                  } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar50);
                                  uVar39 = (int)(uVar31 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                           pdVar24->m_val_ptrs[iVar43 + 0x40U];
                                  uVar50 = 0;
                                  if (uVar39 < pqStack_70->m_total_syms) {
                                    uVar50 = uVar39;
                                  }
                                  uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar50];
                                  uVar50 = iVar43 + 0x41;
                                }
                                uVar31 = uVar31 << ((byte)uVar50 & 0x3f);
                                puVar2 = (pqStack_70->m_sym_freq).m_p + uVar28;
                                *puVar2 = *puVar2 + 1;
                                uVar10 = uVar10 - uVar50;
                                puVar1 = &pqStack_70->m_symbols_until_update;
                                *puVar1 = *puVar1 - 1;
                                if (*puVar1 == 0) {
                                  quasi_adaptive_huffman_data_model::update_tables
                                            (pqStack_70,-1,false);
                                }
                                uVar28 = uVar28 + 2;
                                uVar39 = 0;
                                uVar50 = uVar51;
                                if (uVar28 == 0x102) {
                                  do {
                                    while (uVar28 = uVar10, (int)uVar28 < 1) {
                                      if (pqVar35 ==
                                          (quasi_adaptive_huffman_data_model *)
                                          *(uint **)((long)p + 0x30)) {
                                        if (*(char *)((long)p + 0x40) == '\0') {
                                          *(uint *)((long)p + 0xb8) = uVar50;
                                          *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                          *(ulong *)((long)p + 0x58) = uVar31;
                                          *(uint *)((long)p + 0x60) = uVar28;
                                          *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                               pqVar35;
                                          *(uint *)((long)p + 0x6d4) = uVar39;
                                          *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                          *(int *)((long)p + 0x694) = iVar41;
                                          *(int *)((long)p + 0x698) = iStack_88;
                                          *(int *)((long)p + 0x69c) = iVar48;
                                          *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                          *(uint *)((long)p + 0x678) = uStack_84;
                                          puVar11 = *(uint **)((long)p + 0x20);
                                          plVar13 = *(long **)((long)p + 0x108);
                                          goto LAB_0010fb28;
                                        }
                                        uVar26 = 0;
                                        puVar11 = (uint *)pqVar35;
                                      }
                                      else {
LAB_00112730:
                                        uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                        puVar11 = (uint *)((long)pqVar35 + 1);
                                      }
LAB_00112743:
                                      uVar31 = uVar26 << (0x38U - (char)uVar28 & 0x3f) | uVar31;
                                      pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                                      uVar10 = uVar28 + 8;
                                    }
                                    uVar26 = uVar31 * 2;
                                    if (-1 < (long)uVar31) break;
                                    uVar39 = uVar39 + 1;
                                    uVar31 = uVar26;
                                    uVar10 = uVar28 - 1;
                                  } while (uVar39 < 3);
                                  iVar20 = uVar28 - 1;
                                  while( true ) {
                                    bVar19 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar39)
                                    ;
                                    uVar10 = iVar20 - (uint)bVar19;
                                    if ((int)(uint)bVar19 <= iVar20) break;
                                    if (pqVar35 ==
                                        (quasi_adaptive_huffman_data_model *)
                                        *(uint **)((long)p + 0x30)) {
                                      uVar31 = 0;
                                      if (*(char *)((long)p + 0x40) == '\0') {
                                        *(uint *)((long)p + 0xb8) = uVar50;
                                        *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                        *(ulong *)((long)p + 0x58) = uVar26;
                                        *(int *)((long)p + 0x60) = iVar20;
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                             pqVar35;
                                        *(uint *)((long)p + 0x6d4) = uVar39;
                                        *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                        *(int *)((long)p + 0x694) = iVar41;
                                        *(int *)((long)p + 0x698) = iStack_88;
                                        *(int *)((long)p + 0x69c) = iVar48;
                                        *(uint *)((long)p + 0x6a0) = (uint)uStack_68;
                                        *(uint *)((long)p + 0x678) = uStack_84;
                                        puVar11 = *(uint **)((long)p + 0x20);
                                        plVar13 = *(long **)((long)p + 0x108);
                                        goto LAB_0010fa4a;
                                      }
                                    }
                                    else {
LAB_0010ea60:
                                      uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                      pqVar35 = (quasi_adaptive_huffman_data_model *)
                                                ((long)pqVar35 + 1);
                                    }
LAB_0010ea6e:
                                    cVar7 = (char)iVar20;
                                    iVar20 = iVar20 + 8;
                                    uVar26 = uVar26 | uVar31 << (0x38U - cVar7 & 0x3f);
                                  }
                                  uVar31 = uVar26 << (bVar19 & 0x3f);
                                  uVar28 = (int)(uVar26 >> (-bVar19 & 0x3f)) +
                                           *(int *)(s_huge_match_base_len + (ulong)uVar39 * 4);
                                }
                                goto LAB_00112ad8;
                              }
                              *puVar18 = uVar3 - (uVar3 >> 5);
                              uStack_78._4_4_ = uVar39 - uStack_78._4_4_;
                              uVar39 = (uint)(6 < uVar40) * 2 + 9;
                            }
                            uStack_68 = (ulong)uVar39;
                            iVar20 = iVar41;
LAB_00113332:
                            uVar51 = uStack_84 - uStack_60._4_4_ & uVar42;
                            uVar26 = (ulong)uVar51;
                            uVar39 = uStack_84;
                            if (uStack_84 < uVar51) {
                              uVar39 = uVar51;
                            }
                            __src = pbVar34 + uVar26;
                            if (uVar42 < uVar39 + uVar28) {
                              do {
                                pbVar37 = __src + 1;
                                uVar14 = (ulong)uStack_84;
                                uStack_84 = uStack_84 + 1;
                                pbVar34[uVar14] = *__src;
                                __src = pbVar37;
                                if (pbVar37 == pbVar34 + lVar21) {
                                  __src = pbVar34;
                                }
                                if (uVar42 < uStack_84) {
                                  *(uint *)((long)p + 0xb8) = uVar50;
                                  *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                  *(ulong *)((long)p + 0x58) = uVar31;
                                  *(uint *)((long)p + 0x60) = uVar10;
                                  *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                                  *(uint *)((long)p + 0x6d4) = uVar28;
                                  *(int *)((long)p + 0x6e4) = (int)uVar26;
                                  *(byte **)((long)p + 0x6e8) = __src;
                                  *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                  *(int *)((long)p + 0x694) = iVar20;
                                  *(int *)((long)p + 0x698) = iStack_88;
                                  *(int *)((long)p + 0x69c) = iVar48;
                                  *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                  *(uint *)((long)p + 0x678) = uStack_84;
                                  pvVar30 = (void *)((ulong)*(uint *)((long)p + 0x6c8) +
                                                     *(long *)((long)p + 0xf0) +
                                                    (ulong)*(uint *)((long)p + 0x67c));
                                  uVar31 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) +
                                                            *(uint *)((long)p + 0x6c8)));
                                  *(void **)((long)p + 0x6b0) = pvVar30;
                                  *(ulong *)((long)p + 0x6b8) = uVar31;
                                  *(undefined4 *)((long)p + 0x6c8) = 0;
                                  *(undefined4 *)((long)p + 0x67c) = 0;
LAB_0010de29:
                                  if (uVar31 != 0) {
                                    uVar26 = **(ulong **)((long)p + 0x118);
                                    if (uVar31 < **(ulong **)((long)p + 0x118)) {
                                      uVar26 = uVar31;
                                    }
                                    *(ulong *)((long)p + 0x6c0) = uVar26;
                                    if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                                      memcpy(*(void **)((long)p + 0x110),pvVar30,uVar26);
                                    }
                                    else {
                                      for (uVar31 = 0; sVar52 = uVar26 - uVar31,
                                          uVar31 <= uVar26 && sVar52 != 0; uVar31 = uVar31 + sVar52)
                                      {
                                        if (0x1fff < sVar52) {
                                          sVar52 = 0x2000;
                                        }
                                        memcpy((void *)(*(long *)((long)p + 0x110) + uVar31),
                                               (void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52)
                                        ;
                                        uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) +
                                                                 uVar31),sVar52,
                                                         *(uint *)((long)p + 0xf8));
                                        *(uint *)((long)p + 0xf8) = uVar38;
                                        uVar26 = *(ulong *)((long)p + 0x6c0);
                                      }
                                    }
                                    **(long **)((long)p + 0x108) =
                                         *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                                    lVar21 = *(long *)((long)p + 0x6c0);
                                    **(long **)((long)p + 0x118) = lVar21;
                                    *(undefined4 *)((long)p + 8) = 0x40e;
                                    goto LAB_00111a0e;
                                  }
                                  uVar28 = *(uint *)((long)p + 0x6d4);
                                  uVar26 = (ulong)*(uint *)((long)p + 0x6e4);
                                  __src = *(byte **)((long)p + 0x6e8);
                                  uStack_60._4_4_ = *(int *)((long)p + 0x690);
                                  iVar20 = *(int *)((long)p + 0x694);
                                  iStack_88 = *(int *)((long)p + 0x698);
                                  iVar48 = *(int *)((long)p + 0x69c);
                                  uStack_68 = (ulong)*(uint *)((long)p + 0x6a0);
                                  uVar50 = *(uint *)((long)p + 0xb8);
                                  uStack_78._4_4_ = *(uint *)((long)p + 0xbc);
                                  uVar31 = *(ulong *)((long)p + 0x58);
                                  uVar10 = *(uint *)((long)p + 0x60);
                                  uStack_84 = 0;
                                }
                                uVar28 = uVar28 - 1;
                              } while (uVar28 != 0);
                            }
                            else {
                              pbVar37 = pbVar34 + uStack_84;
                              if (uStack_60._4_4_ == 1) {
                                bVar19 = *__src;
                                uVar39 = uVar28;
                                if (uVar28 < 8) {
                                  for (; 0 < (int)uVar39; uVar39 = uVar39 - 1) {
                                    *pbVar37 = bVar19;
                                    pbVar37 = pbVar37 + 1;
                                  }
                                }
                                else {
                                  memset(pbVar37,(uint)bVar19,(ulong)uVar28);
                                }
                              }
                              else {
                                pbVar25 = pbVar34;
                                uVar39 = uVar28;
                                if ((uVar28 < 8) || (uStack_60._4_4_ < (int)uVar28)) {
                                  for (; 0 < (int)uVar39; uVar39 = uVar39 - 1) {
                                    pbVar25[uStack_84] = pbVar25[uVar26];
                                    pbVar25 = pbVar25 + 1;
                                  }
                                }
                                else {
                                  memcpy(pbVar37,__src,(ulong)uVar28);
                                }
                              }
                              uStack_84 = uStack_84 + uVar28;
                            }
                          }
                          *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                          pqVar36 = (quasi_adaptive_huffman_data_model *)((long)p + 0x288);
                          pdVar24 = *(decoder_tables **)((long)p + 0x2f0);
                          uVar50 = uVar51;
                          if ((int)uVar10 < 0x18) {
                            puVar11 = *(uint **)((long)p + 0x30);
                            if ((uint *)((long)pqVar35 + 4) < puVar11) {
                              uVar39 = *(uint *)pqVar35;
                              uVar10 = uVar10 + 0x20;
                              uVar31 = uVar31 | (ulong)(uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 |
                                                        (uVar39 & 0xff00) << 8 | uVar39 << 0x18) <<
                                                (-(char)uVar10 & 0x3fU);
                              pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 4);
                            }
                            else {
                              for (; uVar50 = uVar51, (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                                if (*(char *)((long)p + 0x40) == '\0') {
                                  *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar36;
                                  *(uint *)((long)p + 0xb8) = uVar51;
                                  *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                  *(ulong *)((long)p + 0x58) = uVar31;
                                  *(uint *)((long)p + 0x60) = uVar10;
                                  *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
                                  *(uint *)((long)p + 0x6d4) = uVar28;
                                  *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                  *(int *)((long)p + 0x694) = iVar41;
                                  *(int *)((long)p + 0x698) = iStack_88;
                                  *(int *)((long)p + 0x69c) = iVar48;
                                  *(int *)((long)p + 0x6a0) = (int)uVar26;
                                  *(uint *)((long)p + 0x678) = uStack_84;
                                  plVar13 = *(long **)((long)p + 0x108);
                                  puVar12 = *(uint **)((long)p + 0x20);
                                  goto LAB_00112ea0;
                                }
LAB_00112d90:
                                uVar14 = 0;
                                if (pqVar35 < puVar11) {
                                  uVar14 = (ulong)(byte)*(uint *)pqVar35;
                                  pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1)
                                  ;
                                }
                                uVar31 = uVar31 | uVar14 << (0x38U - (char)uVar10 & 0x3f);
                              }
                            }
                          }
                          uVar39 = (uint)(ushort)(uVar31 >> 0x30);
                          if (uVar39 < pdVar24->m_table_max_code) {
                            uVar51 = pdVar24->m_lookup
                                     [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
                            uVar39 = pdVar24->m_lookup
                                     [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                          }
                          else {
                            iVar20 = pdVar24->m_decode_start_code_size - 0x41;
                            do {
                              iVar43 = iVar20;
                              iVar20 = iVar43 + 1;
                            } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar39);
                            uVar28 = (int)(uVar31 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                     pdVar24->m_val_ptrs[iVar43 + 0x40U];
                            uVar39 = 0;
                            if (uVar28 < pqVar36->m_total_syms) {
                              uVar39 = uVar28;
                            }
                            uVar51 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar39];
                            uVar39 = iVar43 + 0x41;
                          }
                          uVar31 = uVar31 << ((byte)uVar39 & 0x3f);
                          puVar2 = (pqVar36->m_sym_freq).m_p + uVar51;
                          *puVar2 = *puVar2 + 1;
                          uVar10 = uVar10 - uVar39;
                          puVar1 = &pqVar36->m_symbols_until_update;
                          *puVar1 = *puVar1 - 1;
                          if (*puVar1 == 0) {
                            quasi_adaptive_huffman_data_model::update_tables(pqVar36,-1,false);
                          }
                          if (1 < uVar51) {
                            uVar28 = (uVar51 - 2 & 7) + 2;
                            uVar39 = (uVar51 - 2 >> 3) + 1;
                            uStack_68 = uVar26;
                            if (uVar28 == 9) {
                              bVar6 = 6 < (uint)uVar26;
                              pqVar36 = (quasi_adaptive_huffman_data_model *)
                                        ((long)p + (ulong)bVar6 * 0x90 + 0x438);
                              pdVar24 = *(decoder_tables **)((long)p + (ulong)bVar6 * 0x90 + 0x4a0);
                              if ((int)uVar10 < 0x18) {
                                puVar11 = *(uint **)((long)p + 0x30);
                                if ((uint *)((long)pqVar35 + 4) < puVar11) {
                                  uVar28 = *(uint *)pqVar35;
                                  uVar10 = uVar10 + 0x20;
                                  uVar31 = uVar31 | (ulong)(uVar28 >> 0x18 |
                                                            (uVar28 & 0xff0000) >> 8 |
                                                            (uVar28 & 0xff00) << 8 | uVar28 << 0x18)
                                                    << (-(char)uVar10 & 0x3fU);
                                  uStack_78._0_4_ = 9;
                                  pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 4)
                                  ;
                                }
                                else {
                                  uStack_78._0_4_ = 9;
                                  for (; uStack_68 = uVar26, (int)uVar10 < 0x18; uVar10 = uVar10 + 8
                                      ) {
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 200) =
                                           pqVar36;
                                      *(uint *)((long)p + 0xb8) = uVar50;
                                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                      *(ulong *)((long)p + 0x58) = uVar31;
                                      *(uint *)((long)p + 0x60) = uVar10;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(uint *)((long)p + 0x6d4) = (uint)uStack_78;
                                      *(uint *)((long)p + 0x6d8) = uVar39;
                                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x694) = iVar41;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(int *)((long)p + 0x6a0) = (int)uVar26;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      puVar12 = *(uint **)((long)p + 0x20);
                                      plVar13 = *(long **)((long)p + 0x108);
                                      goto LAB_00113135;
                                    }
LAB_0011301f:
                                    uVar14 = 0;
                                    if (pqVar35 < puVar11) {
                                      uVar14 = (ulong)(byte)*(uint *)pqVar35;
                                      pqVar35 = (quasi_adaptive_huffman_data_model *)
                                                ((long)pqVar35 + 1);
                                    }
                                    uVar31 = uVar31 | uVar14 << (0x38U - (char)uVar10 & 0x3f);
                                  }
                                }
                              }
                              else {
                                uStack_78._0_4_ = 9;
                              }
                              uVar28 = (uint)(ushort)(uVar31 >> 0x30);
                              if (uVar28 < pdVar24->m_table_max_code) {
                                uVar28 = pdVar24->m_lookup
                                         [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff
                                ;
                                uVar51 = pdVar24->m_lookup
                                         [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                              }
                              else {
                                iVar20 = pdVar24->m_decode_start_code_size - 0x41;
                                do {
                                  iVar43 = iVar20;
                                  iVar20 = iVar43 + 1;
                                } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar28);
                                uVar51 = (int)(uVar31 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                         pdVar24->m_val_ptrs[iVar43 + 0x40U];
                                uVar28 = 0;
                                if (uVar51 < pqVar36->m_total_syms) {
                                  uVar28 = uVar51;
                                }
                                uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar28];
                                uVar51 = iVar43 + 0x41;
                              }
                              uVar31 = uVar31 << ((byte)uVar51 & 0x3f);
                              puVar2 = (pqVar36->m_sym_freq).m_p + uVar28;
                              *puVar2 = *puVar2 + 1;
                              uVar10 = uVar10 - uVar51;
                              puVar1 = &pqVar36->m_symbols_until_update;
                              *puVar1 = *puVar1 - 1;
                              if (*puVar1 == 0) {
                                quasi_adaptive_huffman_data_model::update_tables(pqVar36,-1,false);
                              }
                              uVar28 = uVar28 + (uint)uStack_78;
                              uVar51 = 0;
                              if (uVar28 == 0x102) {
                                do {
                                  while (uVar28 = uVar10, (int)uVar28 < 1) {
                                    if (pqVar35 ==
                                        (quasi_adaptive_huffman_data_model *)
                                        *(uint **)((long)p + 0x30)) {
                                      if (*(char *)((long)p + 0x40) == '\0') {
                                        *(uint *)((long)p + 0xb8) = uVar50;
                                        *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                        *(ulong *)((long)p + 0x58) = uVar31;
                                        *(uint *)((long)p + 0x60) = uVar28;
                                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                             pqVar35;
                                        *(uint *)((long)p + 0x6d4) = uVar51;
                                        *(uint *)((long)p + 0x6d8) = uVar39;
                                        *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                        *(int *)((long)p + 0x694) = iVar41;
                                        *(int *)((long)p + 0x698) = iStack_88;
                                        *(int *)((long)p + 0x69c) = iVar48;
                                        *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                        *(uint *)((long)p + 0x678) = uStack_84;
                                        puVar11 = *(uint **)((long)p + 0x20);
                                        plVar13 = *(long **)((long)p + 0x108);
                                        goto LAB_0010fa6f;
                                      }
                                      uVar26 = 0;
                                      puVar11 = (uint *)pqVar35;
                                    }
                                    else {
LAB_001133cc:
                                      uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                      puVar11 = (uint *)((long)pqVar35 + 1);
                                    }
LAB_001133e0:
                                    uVar31 = uVar26 << (0x38U - (char)uVar28 & 0x3f) | uVar31;
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)puVar11;
                                    uVar10 = uVar28 + 8;
                                  }
                                  uVar26 = uVar31 * 2;
                                  if (-1 < (long)uVar31) break;
                                  uVar51 = uVar51 + 1;
                                  uVar31 = uVar26;
                                  uVar10 = uVar28 - 1;
                                } while (uVar51 < 3);
                                iVar20 = uVar28 - 1;
                                while( true ) {
                                  bVar19 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar51);
                                  uVar10 = iVar20 - (uint)bVar19;
                                  if ((int)(uint)bVar19 <= iVar20) break;
                                  if (pqVar35 ==
                                      (quasi_adaptive_huffman_data_model *)
                                      *(uint **)((long)p + 0x30)) {
                                    uVar31 = 0;
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(uint *)((long)p + 0xb8) = uVar50;
                                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                      *(ulong *)((long)p + 0x58) = uVar26;
                                      *(int *)((long)p + 0x60) = iVar20;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(uint *)((long)p + 0x6d4) = uVar51;
                                      *(uint *)((long)p + 0x6d8) = uVar39;
                                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x694) = iVar41;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      puVar11 = *(uint **)((long)p + 0x20);
                                      plVar13 = *(long **)((long)p + 0x108);
                                      goto LAB_0010f94c;
                                    }
                                  }
                                  else {
LAB_0010e0ca:
                                    uVar31 = (ulong)(byte)*(uint *)pqVar35;
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 1);
                                  }
LAB_0010e0de:
                                  cVar7 = (char)iVar20;
                                  iVar20 = iVar20 + 8;
                                  uVar26 = uVar26 | uVar31 << (0x38U - cVar7 & 0x3f);
                                }
                                uVar31 = uVar26 << (bVar19 & 0x3f);
                                uVar28 = (int)(uVar26 >> (-bVar19 & 0x3f)) +
                                         *(int *)(s_huge_match_base_len + (ulong)uVar51 * 4);
                              }
                            }
                            uVar51 = (uint)(byte)CLZDecompBase::m_lzx_position_extra_bits[uVar39];
                            uVar40 = uStack_78._4_4_;
                            uVar47 = uVar10;
                            if (uVar51 < 3) {
                              while( true ) {
                                uStack_78 = (ulong)uVar50;
                                uVar10 = uVar47 - uVar51;
                                if ((int)uVar51 <= (int)uVar47) break;
                                if (pqVar35 ==
                                    (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30))
                                {
                                  uVar26 = 0;
                                  if (*(char *)((long)p + 0x40) == '\0') {
                                    *(uint *)((long)p + 0xb8) = uVar50;
                                    *(uint *)((long)p + 0xbc) = uVar40;
                                    *(ulong *)((long)p + 0x58) = uVar31;
                                    *(uint *)((long)p + 0x60) = uVar47;
                                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                         pqVar35;
                                    *(uint *)((long)p + 0x6d4) = uVar28;
                                    *(uint *)((long)p + 0x6d8) = uVar39;
                                    *(uint *)((long)p + 0x6e0) = uVar51;
                                    *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                    *(int *)((long)p + 0x694) = iVar41;
                                    *(int *)((long)p + 0x698) = iStack_88;
                                    *(int *)((long)p + 0x69c) = iVar48;
                                    *(uint *)((long)p + 0x6a0) = (uint)uStack_68;
                                    *(uint *)((long)p + 0x678) = uStack_84;
                                    plVar13 = *(long **)((long)p + 0x108);
                                    puVar11 = *(uint **)((long)p + 0x20);
                                    goto LAB_0010fa94;
                                  }
                                }
                                else {
LAB_0010ebf9:
                                  uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                  pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1)
                                  ;
                                }
LAB_0010ebff:
                                uVar31 = uVar31 | uVar26 << (0x38U - (char)uVar47 & 0x3f);
                                uVar47 = uVar47 + 8;
                              }
                              iVar43 = (int)(uVar31 >> (-(byte)uVar51 & 0x3f));
                              if (uVar51 == 0) {
                                iVar43 = 0;
                              }
                              uVar31 = uVar31 << ((byte)uVar51 & 0x3f);
                            }
                            else {
                              iVar43 = 0;
                              uVar40 = uVar10;
                              if (4 < (byte)CLZDecompBase::m_lzx_position_extra_bits[uVar39]) {
                                while( true ) {
                                  iVar20 = uVar51 - 4;
                                  uVar40 = uVar10 - iVar20;
                                  if (iVar20 <= (int)uVar10) break;
                                  if (pqVar35 ==
                                      (quasi_adaptive_huffman_data_model *)
                                      *(uint **)((long)p + 0x30)) {
                                    uVar26 = 0;
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(uint *)((long)p + 0xb8) = uVar50;
                                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                      *(ulong *)((long)p + 0x58) = uVar31;
                                      *(uint *)((long)p + 0x60) = uVar10;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(uint *)((long)p + 0x6d4) = uVar28;
                                      *(uint *)((long)p + 0x6d8) = uVar39;
                                      *(uint *)((long)p + 0x6e0) = uVar51;
                                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x694) = iVar41;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(int *)((long)p + 0x6a0) = (int)uStack_68;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      puVar11 = *(uint **)((long)p + 0x20);
                                      plVar13 = *(long **)((long)p + 0x108);
                                      goto LAB_0010f9c3;
                                    }
                                  }
                                  else {
LAB_0010e4b7:
                                    uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                    pqVar35 = (quasi_adaptive_huffman_data_model *)
                                              ((long)pqVar35 + 1);
                                  }
LAB_0010e4ca:
                                  cVar7 = (char)uVar10;
                                  uVar10 = uVar10 + 8;
                                  uVar31 = uVar31 | uVar26 << (0x38U - cVar7 & 0x3f);
                                }
                                iVar43 = (int)(uVar31 >> (0x44U - (char)uVar51 & 0x3f)) << 4;
                                if (iVar20 == 0) {
                                  iVar43 = 0;
                                }
                                uVar31 = uVar31 << ((byte)iVar20 & 0x3f);
                              }
                              pqVar36 = (quasi_adaptive_huffman_data_model *)((long)p + 0x558);
                              pdVar24 = *(decoder_tables **)((long)p + 0x5c0);
                              uStack_78 = CONCAT44(uStack_78._4_4_,uVar50);
                              if ((int)uVar40 < 0x18) {
                                puVar11 = *(uint **)((long)p + 0x30);
                                if ((uint *)((long)pqVar35 + 4) < puVar11) {
                                  uVar10 = *(uint *)pqVar35;
                                  uVar40 = uVar40 + 0x20;
                                  uVar31 = uVar31 | (ulong)(uVar10 >> 0x18 |
                                                            (uVar10 & 0xff0000) >> 8 |
                                                            (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
                                                    << (-(char)uVar40 & 0x3fU);
                                  pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 4)
                                  ;
                                }
                                else {
                                  for (; (int)uVar40 < 0x18; uVar40 = uVar40 + 8) {
                                    if (*(char *)((long)p + 0x40) == '\0') {
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 200) =
                                           pqVar36;
                                      *(uint *)((long)p + 0xb8) = (uint)uStack_78;
                                      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                                      *(ulong *)((long)p + 0x58) = uVar31;
                                      *(uint *)((long)p + 0x60) = uVar40;
                                      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) =
                                           pqVar35;
                                      *(uint *)((long)p + 0x6d4) = uVar28;
                                      *(uint *)((long)p + 0x6d8) = uVar39;
                                      *(int *)((long)p + 0x6dc) = iVar43;
                                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                                      *(int *)((long)p + 0x694) = iVar41;
                                      *(int *)((long)p + 0x698) = iStack_88;
                                      *(int *)((long)p + 0x69c) = iVar48;
                                      *(uint *)((long)p + 0x6a0) = (uint)uStack_68;
                                      *(uint *)((long)p + 0x678) = uStack_84;
                                      puVar12 = *(uint **)((long)p + 0x20);
                                      plVar13 = *(long **)((long)p + 0x108);
                                      goto LAB_00113866;
                                    }
LAB_001137b0:
                                    uVar26 = 0;
                                    if (pqVar35 < puVar11) {
                                      uVar26 = (ulong)(byte)*(uint *)pqVar35;
                                      pqVar35 = (quasi_adaptive_huffman_data_model *)
                                                ((long)pqVar35 + 1);
                                    }
                                    uVar31 = uVar31 | uVar26 << (0x38U - (char)uVar40 & 0x3f);
                                  }
                                }
                              }
                              uVar10 = (uint)(ushort)(uVar31 >> 0x30);
                              if (uVar10 < pdVar24->m_table_max_code) {
                                uVar50 = pdVar24->m_lookup
                                         [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff
                                ;
                                uVar10 = pdVar24->m_lookup
                                         [uVar31 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                              }
                              else {
                                iVar20 = pdVar24->m_decode_start_code_size - 0x41;
                                do {
                                  iVar27 = iVar20;
                                  iVar20 = iVar27 + 1;
                                } while (pdVar24->m_max_codes[iVar27 + 0x40U] <= uVar10);
                                uVar50 = (int)(uVar31 >> (-(char)(iVar27 + 1) & 0x3fU)) +
                                         pdVar24->m_val_ptrs[iVar27 + 0x40U];
                                uVar10 = 0;
                                if (uVar50 < pqVar36->m_total_syms) {
                                  uVar10 = uVar50;
                                }
                                uVar50 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar10];
                                uVar10 = iVar27 + 0x41;
                              }
                              uVar31 = uVar31 << ((byte)uVar10 & 0x3f);
                              puVar2 = (pqVar36->m_sym_freq).m_p + uVar50;
                              *puVar2 = *puVar2 + 1;
                              uVar10 = uVar40 - uVar10;
                              puVar1 = &pqVar36->m_symbols_until_update;
                              *puVar1 = *puVar1 - 1;
                              if (*puVar1 == 0) {
                                quasi_adaptive_huffman_data_model::update_tables(pqVar36,-1,false);
                              }
                              iVar43 = uVar50 + iVar43;
                              uVar40 = uStack_78._4_4_;
                            }
                            uStack_84 = 0;
                            uStack_68 = (ulong)(6 < (uint)uStack_68) * 3 + 7;
                            iVar20 = uStack_60._4_4_;
                            uVar50 = (uint)uStack_78;
                            uStack_78._4_4_ = uVar40;
                            uStack_60._4_4_ =
                                 iVar43 + *(int *)(CLZDecompBase::m_lzx_position_base +
                                                  (ulong)uVar39 * 4);
                            iVar48 = iStack_88;
                            iStack_88 = iVar41;
                            goto LAB_00113332;
                          }
                          uStack_68 = 0;
                          iVar20 = 1;
                          if (uVar51 == 0) goto LAB_00112fa5;
                          iVar48 = 1;
                          iStack_88 = 1;
                          uStack_60._4_4_ = 1;
                        } while( true );
                      case 2:
                        goto switchD_001108f6_caseD_2;
                      case 3:
                        *(undefined4 *)((long)p + 0x160) = 3;
                        pqVar35 = pqStack_70;
                        goto LAB_0011135f;
                      }
                      for (; (int)uVar10 < 2; uVar10 = uVar10 + 8) {
                        if (pqStack_70 ==
                            (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                          uVar15 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar50;
                            *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar31;
                            *(uint *)((long)p + 0x60) = uVar10;
                            *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                            *(int *)((long)p + 0x690) = uStack_60._4_4_;
                            *(int *)((long)p + 0x694) = iVar41;
                            *(int *)((long)p + 0x698) = iStack_88;
                            *(int *)((long)p + 0x69c) = iVar48;
                            *(int *)((long)p + 0x6a0) = (int)uVar26;
                            *(int *)((long)p + 0x678) = (int)uVar14;
                            puVar11 = *(uint **)((long)p + 0x20);
                            plVar13 = *(long **)((long)p + 0x108);
                            goto LAB_0010f8cd;
                          }
                        }
                        else {
LAB_0010dc2d:
                          uVar15 = (ulong)(byte)*(uint *)pqStack_70;
                          pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)pqStack_70 + 1);
                        }
LAB_0010dc33:
                        uVar31 = uVar31 | uVar15 << (0x38U - (char)uVar10 & 0x3f);
                      }
                      uVar39 = (uint)(uVar31 >> 0x3e);
                      *(uint *)((long)p + 0x71c) = uVar39;
                      uVar15 = uVar31 << 2;
                      uVar10 = uVar10 - 2;
                      if (uVar31 >> 0x3e == 2) {
                        lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                      }
                      else if (uVar39 == 1) {
                        lzham_decompressor::reset_huffman_table_update_rates
                                  ((lzham_decompressor *)p);
                      }
                      if ((uVar10 & 7) != 0) {
                        for (; (int)uVar10 < 0; uVar10 = uVar10 + 8) {
                          if (pqStack_70 ==
                              (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                            uVar31 = 0;
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar50;
                              *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                              *(ulong *)((long)p + 0x58) = uVar15;
                              *(uint *)((long)p + 0x60) = uVar10;
                              *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                              *(int *)((long)p + 0x690) = uStack_60._4_4_;
                              *(int *)((long)p + 0x694) = iVar41;
                              *(int *)((long)p + 0x698) = iStack_88;
                              *(int *)((long)p + 0x69c) = iVar48;
                              *(int *)((long)p + 0x6a0) = (int)uVar26;
                              *(int *)((long)p + 0x678) = (int)uVar14;
                              puVar11 = *(uint **)((long)p + 0x20);
                              plVar13 = *(long **)((long)p + 0x108);
                              goto LAB_0010f839;
                            }
                          }
                          else {
LAB_0010d80d:
                            uVar31 = (ulong)(byte)*(uint *)pqStack_70;
                            pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)pqStack_70 + 1)
                            ;
                          }
LAB_0010d813:
                          uVar15 = uVar15 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                        }
                        uVar15 = uVar15 << ((byte)uVar10 & 7);
                        uVar10 = uVar10 & 0x7ffffff8;
                      }
                      for (; (int)uVar10 < 0x10; uVar10 = uVar10 + 8) {
                        if (pqStack_70 ==
                            (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                          uVar31 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar50;
                            *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar15;
                            *(uint *)((long)p + 0x60) = uVar10;
                            *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                            *(int *)((long)p + 0x690) = uStack_60._4_4_;
                            *(int *)((long)p + 0x694) = iVar41;
                            *(int *)((long)p + 0x698) = iStack_88;
                            *(int *)((long)p + 0x69c) = iVar48;
                            *(int *)((long)p + 0x6a0) = (int)uVar26;
                            *(int *)((long)p + 0x678) = (int)uVar14;
                            puVar11 = *(uint **)((long)p + 0x20);
                            plVar13 = *(long **)((long)p + 0x108);
                            goto LAB_0010fbe9;
                          }
                        }
                        else {
LAB_0010f548:
                          uVar31 = (ulong)(byte)*(uint *)pqStack_70;
                          pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)pqStack_70 + 1);
                        }
LAB_0010f54e:
                        uVar15 = uVar15 | uVar31 << (0x38U - (char)uVar10 & 0x3f);
                      }
                      uVar44 = uVar15 << 0x10;
                      iVar20 = uVar10 - 0x10;
                      if (uVar15 >> 0x30 != 0) {
                        *(uint *)((long)p + 0xb8) = uVar50;
                        *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                        *(ulong *)((long)p + 0x58) = uVar44;
                        *(int *)((long)p + 0x60) = iVar20;
                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                        **(long **)((long)p + 0x108) = (long)pqStack_70 - *(long *)((long)p + 0x20);
                        **(undefined8 **)((long)p + 0x118) = 0;
                        goto LAB_00110b3c;
                      }
                      while( true ) {
                        uVar39 = (uint)uVar14;
                        uVar9 = (undefined4)uVar26;
                        if (0xf < iVar20) break;
                        if (pqStack_70 ==
                            (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
                          uVar31 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar50;
                            *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                            *(ulong *)((long)p + 0x58) = uVar44;
                            *(int *)((long)p + 0x60) = iVar20;
                            *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                            *(int *)((long)p + 0x690) = uStack_60._4_4_;
                            *(int *)((long)p + 0x694) = iVar41;
                            *(int *)((long)p + 0x698) = iStack_88;
                            *(int *)((long)p + 0x69c) = iVar48;
                            *(undefined4 *)((long)p + 0x6a0) = uVar9;
                            *(uint *)((long)p + 0x678) = uVar39;
                            plVar13 = *(long **)((long)p + 0x108);
                            puVar11 = *(uint **)((long)p + 0x20);
                            goto LAB_0010f883;
                          }
                        }
                        else {
LAB_0010da00:
                          uVar31 = (ulong)(byte)*(uint *)pqStack_70;
                          pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)pqStack_70 + 1);
                        }
LAB_0010da06:
                        cVar7 = (char)iVar20;
                        iVar20 = iVar20 + 8;
                        uVar44 = uVar44 | uVar31 << (0x38U - cVar7 & 0x3f);
                      }
                      uVar31 = uVar44 << 0x10;
                      uVar10 = iVar20 - 0x10;
                      if ((short)(uVar44 >> 0x30) != -1) {
                        *(uint *)((long)p + 0xb8) = uVar50;
                        *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                        *(ulong *)((long)p + 0x58) = uVar31;
                        *(uint *)((long)p + 0x60) = uVar10;
                        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                        **(long **)((long)p + 0x108) = (long)pqStack_70 - *(long *)((long)p + 0x20);
                        **(undefined8 **)((long)p + 0x118) = 0;
                        goto LAB_00110ad1;
                      }
                      pqVar35 = pqStack_70;
                    } while ((*(uint *)((long)p + 0x71c) & 0xfffffffe) != 2);
                    *(uint *)((long)p + 0xb8) = uVar50;
                    *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                    *(ulong *)((long)p + 0x58) = uVar31;
                    *(uint *)((long)p + 0x60) = uVar10;
                    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                    if (uVar39 == 0) {
                      **(long **)((long)p + 0x108) = (long)pqStack_70 - *(long *)((long)p + 0x20);
                      **(ulong **)((long)p + 0x118) = (ulong)(uint)-*(int *)((long)p + 0x67c);
                      *(int *)((long)p + 0x690) = uStack_60._4_4_;
                      *(int *)((long)p + 0x694) = iVar41;
                      *(int *)((long)p + 0x698) = iStack_88;
                      *(int *)((long)p + 0x69c) = iVar48;
                      *(undefined4 *)((long)p + 0x6a0) = uVar9;
                      *(undefined8 *)((long)p + 0x678) = 0;
                      *(undefined4 *)((long)p + 8) = 0x213;
                      return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                    }
                    *(int *)((long)p + 0x690) = uStack_60._4_4_;
                    *(int *)((long)p + 0x694) = iVar41;
                    *(int *)((long)p + 0x698) = iStack_88;
                    *(int *)((long)p + 0x69c) = iVar48;
                    *(undefined4 *)((long)p + 0x6a0) = uVar9;
                    *(uint *)((long)p + 0x678) = uVar39;
                    pvVar30 = (void *)((ulong)*(uint *)((long)p + 0x6c8) + *(long *)((long)p + 0xf0)
                                      + (ulong)*(uint *)((long)p + 0x67c));
                    *(void **)((long)p + 0x6b0) = pvVar30;
                    uVar31 = (ulong)(uVar39 - (*(uint *)((long)p + 0x67c) +
                                              *(uint *)((long)p + 0x6c8)));
                    *(ulong *)((long)p + 0x6b8) = uVar31;
                    *(undefined4 *)((long)p + 0x6c8) = 0;
                    *(uint *)((long)p + 0x67c) = uVar39 & uVar42;
LAB_00110a58:
                    if (uVar31 != 0) {
                      uVar26 = **(ulong **)((long)p + 0x118);
                      if (uVar31 < **(ulong **)((long)p + 0x118)) {
                        uVar26 = uVar31;
                      }
                      *(ulong *)((long)p + 0x6c0) = uVar26;
                      if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                        memcpy(*(void **)((long)p + 0x110),pvVar30,uVar26);
                      }
                      else {
                        for (uVar31 = 0; sVar52 = uVar26 - uVar31, uVar31 <= uVar26 && sVar52 != 0;
                            uVar31 = uVar31 + sVar52) {
                          if (0x1fff < sVar52) {
                            sVar52 = 0x2000;
                          }
                          memcpy((void *)(*(long *)((long)p + 0x110) + uVar31),
                                 (void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52);
                          uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52,
                                           *(uint *)((long)p + 0xf8));
                          *(uint *)((long)p + 0xf8) = uVar38;
                          uVar26 = *(ulong *)((long)p + 0x6c0);
                        }
                      }
                      **(long **)((long)p + 0x108) =
                           *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                      lVar21 = *(long *)((long)p + 0x6c0);
                      **(long **)((long)p + 0x118) = lVar21;
                      *(undefined4 *)((long)p + 8) = 0x1fc;
                      goto LAB_00111a0e;
                    }
                    uVar10 = *(uint *)((long)p + 0x678);
                    uStack_60._4_4_ = *(int *)((long)p + 0x690);
                    iVar41 = *(int *)((long)p + 0x694);
                    iStack_88 = *(int *)((long)p + 0x698);
                    iVar48 = *(int *)((long)p + 0x69c);
                    uVar50 = *(uint *)((long)p + 0x6a0);
LAB_00110a8d:
                    uVar26 = (ulong)uVar50;
                    uVar14 = (ulong)uVar10;
                  } while( true );
                }
                if (pqStack_70 != (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
LAB_0010d755:
                  uVar31 = (ulong)(byte)*(uint *)pqStack_70;
                  pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)pqStack_70 + 1);
                  goto LAB_0010d75b;
                }
                uVar31 = 0;
                if (*(char *)((long)p + 0x40) == '\0') {
                  *(uint *)((long)p + 0xb8) = uVar50;
                  *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
                  *(ulong *)((long)p + 0x58) = uVar44;
                  *(uint *)((long)p + 0x60) = uVar39;
                  *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
                  *(int *)((long)p + 0x6f0) = (int)uVar15;
                  *(int *)((long)p + 0x690) = uStack_60._4_4_;
                  *(int *)((long)p + 0x694) = iVar41;
                  *(int *)((long)p + 0x698) = iStack_88;
                  *(int *)((long)p + 0x69c) = iVar48;
                  *(int *)((long)p + 0x6a0) = (int)uVar26;
                  *(int *)((long)p + 0x678) = (int)uVar14;
                  plVar13 = *(long **)((long)p + 0x108);
                  puVar11 = *(uint **)((long)p + 0x20);
                  break;
                }
              } while( true );
            }
            *plVar13 = (long)pqStack_70 - (long)puVar11;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x23b;
          }
        }
      }
    }
    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
  }
  if (*(lzham_uint8 **)((long)p + 0x128) == (lzham_uint8 *)0x0) {
    *(lzham_uint8 **)((long)p + 0x128) = pOut_buf;
    *(size_t *)((long)p + 0x130) = *pOut_buf_size;
    lVar8 = lzham_decompressor::decompress<true>((lzham_decompressor *)p);
    return lVar8;
  }
  if (*(lzham_uint8 **)((long)p + 0x128) != pOut_buf) {
    return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  if (*(size_t *)((long)p + 0x130) != *pOut_buf_size) {
    return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  puVar17 = *(ulong **)((long)p + 0x118);
  __dest = *(undefined1 **)((long)p + 0x110);
  iVar20 = *(int *)((long)p + 8);
  switch(iVar20) {
  case 0x457:
    puVar11 = *(uint **)((long)p + 0x100);
    lVar21 = **(long **)((long)p + 0x108);
    *(uint **)((long)p + 0x20) = puVar11;
    *(uint **)((long)p + 0x28) = puVar11;
    *(long *)((long)p + 0x38) = lVar21;
    *(byte **)((long)p + 0x30) = (byte *)(lVar21 + (long)puVar11);
    *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
    pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
    *(void **)((long)p + 0x6b0) = pvVar30;
    uVar31 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
    *(ulong *)((long)p + 0x6b8) = uVar31;
    if (uVar31 != 0) {
      uVar26 = *puVar17;
      if (uVar31 < *puVar17) {
        uVar26 = uVar31;
      }
      *(ulong *)((long)p + 0x6c0) = uVar26;
      if ((*(byte *)((long)p + 0x144) & 2) == 0) {
        memcpy(__dest,pvVar30,uVar26);
      }
      else {
        for (uVar31 = 0; sVar52 = uVar26 - uVar31, uVar31 <= uVar26 && sVar52 != 0;
            uVar31 = uVar31 + sVar52) {
          if (0x1fff < sVar52) {
            sVar52 = 0x2000;
          }
          memcpy((void *)(*(long *)((long)p + 0x110) + uVar31),
                 (void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52);
          uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar31),sVar52,
                           *(uint *)((long)p + 0xf8));
          *(uint *)((long)p + 0xf8) = uVar38;
          uVar26 = *(ulong *)((long)p + 0x6c0);
        }
      }
      **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
      lVar21 = *(long *)((long)p + 0x6c0);
      **(long **)((long)p + 0x118) = lVar21;
      *(undefined4 *)((long)p + 8) = 0x457;
      goto LAB_001097da;
    }
    iVar27 = *(int *)((long)p + 0x690);
    iVar49 = *(int *)((long)p + 0x694);
    uStack_90 = *(undefined8 *)((long)p + 0x698);
    uVar50 = *(uint *)((long)p + 0x6a0);
    uVar26 = (ulong)*(uint *)((long)p + 0x678);
    uVar46 = *(uint *)((long)p + 0xb8);
    uVar42 = *(uint *)((long)p + 0xbc);
    uStack_40 = *(ulong *)((long)p + 0x58);
    uStack_68._0_4_ = *(uint *)((long)p + 0x60);
    iVar20 = *(int *)((long)p + 0x160);
LAB_0010a81c:
    iVar43 = (int)uVar26;
    if (iVar20 == 3) {
      if (((uint)uStack_68 & 7) != 0) {
        for (; (int)(uint)uStack_68 < 0; uStack_68._0_4_ = (uint)uStack_68 + 8) {
          if (puVar11 == *(uint **)((long)p + 0x30)) {
            uVar31 = 0;
            if (*(char *)((long)p + 0x40) == '\0') {
              *(uint *)((long)p + 0xb8) = uVar46;
              *(uint *)((long)p + 0xbc) = uVar42;
              *(ulong *)((long)p + 0x58) = uStack_40;
              *(uint *)((long)p + 0x60) = (uint)uStack_68;
              *(uint **)((long)p + 0x28) = puVar11;
              *(int *)((long)p + 0x690) = iVar27;
              *(int *)((long)p + 0x694) = iVar49;
              *(int *)((long)p + 0x698) = (int)uStack_90;
              *(int *)((long)p + 0x69c) = uStack_90._4_4_;
              *(uint *)((long)p + 0x6a0) = uVar50;
              *(int *)((long)p + 0x678) = (int)uVar26;
              plVar13 = *(long **)((long)p + 0x108);
              puVar12 = *(uint **)((long)p + 0x20);
              goto LAB_0010929b;
            }
          }
          else {
LAB_0010703b:
            uVar31 = (ulong)(byte)*puVar11;
            puVar11 = (uint *)((long)puVar11 + 1);
          }
LAB_00107047:
          uStack_40 = uStack_40 | uVar31 << (0x38U - (char)(uint)uStack_68 & 0x3f);
        }
        uStack_40 = uStack_40 << ((byte)(uint)uStack_68 & 7);
        uStack_68._0_4_ = (uint)uStack_68 & 0x7ffffff8;
      }
      for (; (int)(uint)uStack_68 < 0x10; uStack_68._0_4_ = (uint)uStack_68 + 8) {
        if (puVar11 == *(uint **)((long)p + 0x30)) {
          uVar31 = 0;
          if (*(char *)((long)p + 0x40) == '\0') {
            *(uint *)((long)p + 0xb8) = uVar46;
            *(uint *)((long)p + 0xbc) = uVar42;
            *(ulong *)((long)p + 0x58) = uStack_40;
            *(uint *)((long)p + 0x60) = (uint)uStack_68;
            *(uint **)((long)p + 0x28) = puVar11;
            *(int *)((long)p + 0x690) = iVar27;
            *(int *)((long)p + 0x694) = iVar49;
            *(int *)((long)p + 0x698) = (int)uStack_90;
            *(int *)((long)p + 0x69c) = uStack_90._4_4_;
            *(uint *)((long)p + 0x6a0) = uVar50;
            *(int *)((long)p + 0x678) = (int)uVar26;
            plVar13 = *(long **)((long)p + 0x108);
            puVar12 = *(uint **)((long)p + 0x20);
            goto LAB_0010927a;
          }
        }
        else {
LAB_00106f76:
          uVar31 = (ulong)(byte)*puVar11;
          puVar11 = (uint *)((long)puVar11 + 1);
        }
LAB_00106f82:
        uStack_40 = uStack_40 | uVar31 << (0x38U - (char)(uint)uStack_68 & 0x3f);
      }
      *(uint *)((long)p + 0x6cc) = (uint)(ushort)(uStack_40 >> 0x30);
      uVar31 = uStack_40 << 0x10;
      for (iVar20 = (uint)uStack_68 - 0x10; iVar43 = (int)uVar26, iVar20 < 0x10; iVar20 = iVar20 + 8
          ) {
        if (puVar11 == *(uint **)((long)p + 0x30)) {
          uVar14 = 0;
          if (*(char *)((long)p + 0x40) == '\0') {
            *(uint *)((long)p + 0xb8) = uVar46;
            *(uint *)((long)p + 0xbc) = uVar42;
            *(ulong *)((long)p + 0x58) = uVar31;
            *(int *)((long)p + 0x60) = iVar20;
            *(uint **)((long)p + 0x28) = puVar11;
            *(int *)((long)p + 0x690) = iVar27;
            *(int *)((long)p + 0x694) = iVar49;
            *(int *)((long)p + 0x698) = (int)uStack_90;
            *(int *)((long)p + 0x69c) = uStack_90._4_4_;
            *(uint *)((long)p + 0x6a0) = uVar50;
            *(int *)((long)p + 0x678) = iVar43;
            plVar13 = *(long **)((long)p + 0x108);
            puVar12 = *(uint **)((long)p + 0x20);
            goto LAB_00109259;
          }
        }
        else {
LAB_00106eb1:
          uVar14 = (ulong)(byte)*puVar11;
          puVar11 = (uint *)((long)puVar11 + 1);
        }
LAB_00106ebd:
        uVar31 = uVar31 | uVar14 << (0x38U - (char)iVar20 & 0x3f);
      }
      uStack_40 = uVar31 << 0x10;
      uStack_68._0_4_ = iVar20 - 0x10;
      uVar10 = *(int *)((long)p + 0x6cc) << 0x10 | (uint)(ushort)(uVar31 >> 0x30);
      *(uint *)((long)p + 0x6cc) = uVar10;
      lVar21 = 0xf8;
      if ((*(byte *)((long)p + 0x144) & 2) != 0) {
        uVar38 = adler32(__dest,uVar26 & 0xffffffff,1);
        *(uint *)((long)p + 0xf8) = uVar38;
        if (*(uint *)((long)p + 0x6cc) == uVar38) goto LAB_0010aa60;
        uVar10 = 8;
        lVar21 = 0x160;
      }
      *(uint *)((long)p + lVar21) = uVar10;
    }
LAB_0010aa60:
    *(uint *)((long)p + 0xb8) = uVar46;
    *(uint *)((long)p + 0xbc) = uVar42;
    *(ulong *)((long)p + 0x58) = uStack_40;
    *(uint *)((long)p + 0x60) = (uint)uStack_68;
    *(uint **)((long)p + 0x28) = puVar11;
    uVar16 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x18));
    **(uint64 **)((long)p + 0x108) = uVar16;
    **(ulong **)((long)p + 0x118) = (ulong)(uint)(iVar43 - *(int *)((long)p + 0x67c));
    *(int *)((long)p + 0x67c) = iVar43;
    *(undefined4 *)((long)p + 8) = 0x47c;
    return *(lzham_decompress_status_t *)((long)p + 0x160);
  case 0x45d:
    puVar11 = *(uint **)((long)p + 0x100);
    plVar13 = *(long **)((long)p + 0x108);
    lVar21 = *plVar13;
    *(uint **)((long)p + 0x20) = puVar11;
    *(uint **)((long)p + 0x28) = puVar11;
    *(long *)((long)p + 0x38) = lVar21;
    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
    puVar12 = puVar11;
    if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
      iVar27 = *(int *)((long)p + 0x690);
      iVar49 = *(int *)((long)p + 0x694);
      uStack_90 = *(undefined8 *)((long)p + 0x698);
      uVar50 = *(uint *)((long)p + 0x6a0);
      uVar26 = (ulong)*(uint *)((long)p + 0x678);
      uVar46 = *(uint *)((long)p + 0xb8);
      uVar42 = *(uint *)((long)p + 0xbc);
      uStack_40 = *(ulong *)((long)p + 0x58);
      uStack_68._0_4_ = *(uint *)((long)p + 0x60);
      if (0 < lVar21) goto LAB_0010703b;
      uVar31 = 0;
      goto LAB_00107047;
    }
LAB_0010929b:
    *plVar13 = (long)puVar11 - (long)puVar12;
    **(undefined8 **)((long)p + 0x118) = 0;
    *(undefined4 *)((long)p + 8) = 0x45d;
    break;
  case 0x45f:
    puVar11 = *(uint **)((long)p + 0x100);
    plVar13 = *(long **)((long)p + 0x108);
    lVar21 = *plVar13;
    *(uint **)((long)p + 0x20) = puVar11;
    *(uint **)((long)p + 0x28) = puVar11;
    *(long *)((long)p + 0x38) = lVar21;
    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
    puVar12 = puVar11;
    if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
      iVar27 = *(int *)((long)p + 0x690);
      iVar49 = *(int *)((long)p + 0x694);
      uStack_90 = *(undefined8 *)((long)p + 0x698);
      uVar50 = *(uint *)((long)p + 0x6a0);
      uVar26 = (ulong)*(uint *)((long)p + 0x678);
      uVar46 = *(uint *)((long)p + 0xb8);
      uVar42 = *(uint *)((long)p + 0xbc);
      uStack_40 = *(ulong *)((long)p + 0x58);
      uStack_68._0_4_ = *(uint *)((long)p + 0x60);
      if (0 < lVar21) goto LAB_00106f76;
      uVar31 = 0;
      goto LAB_00106f82;
    }
LAB_0010927a:
    *plVar13 = (long)puVar11 - (long)puVar12;
    **(undefined8 **)((long)p + 0x118) = 0;
    *(undefined4 *)((long)p + 8) = 0x45f;
    break;
  case 0x460:
    puVar11 = *(uint **)((long)p + 0x100);
    plVar13 = *(long **)((long)p + 0x108);
    lVar21 = *plVar13;
    *(uint **)((long)p + 0x20) = puVar11;
    *(uint **)((long)p + 0x28) = puVar11;
    *(long *)((long)p + 0x38) = lVar21;
    *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
    *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
    puVar12 = puVar11;
    if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
      iVar27 = *(int *)((long)p + 0x690);
      iVar49 = *(int *)((long)p + 0x694);
      uStack_90 = *(undefined8 *)((long)p + 0x698);
      uVar50 = *(uint *)((long)p + 0x6a0);
      uVar26 = (ulong)*(uint *)((long)p + 0x678);
      uVar46 = *(uint *)((long)p + 0xb8);
      uVar42 = *(uint *)((long)p + 0xbc);
      uVar31 = *(ulong *)((long)p + 0x58);
      iVar20 = *(int *)((long)p + 0x60);
      if (0 < lVar21) goto LAB_00106eb1;
      uVar14 = 0;
      goto LAB_00106ebd;
    }
LAB_00109259:
    *plVar13 = (long)puVar11 - (long)puVar12;
    **(undefined8 **)((long)p + 0x118) = 0;
    *(undefined4 *)((long)p + 8) = 0x460;
    break;
  default:
    if (iVar20 != 0x482) {
      uVar31 = *puVar17;
      if (iVar20 == 0x188) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar12 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar43 = *(int *)((long)p + 0x690);
          iVar20 = *(int *)((long)p + 0x694);
          uVar9 = *(undefined4 *)((long)p + 0x698);
          uVar33 = *(undefined4 *)((long)p + 0x69c);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_0010901b;
          uVar14 = 0;
          goto LAB_0010902d;
        }
LAB_00109855:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x188;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x189) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar12 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar43 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uVar9 = *(undefined4 *)((long)p + 0x698);
          uVar33 = *(undefined4 *)((long)p + 0x69c);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          iVar27 = *(int *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_001091b7;
          uVar14 = 0;
          goto LAB_001091c4;
        }
LAB_00109897:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x189;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x19a) {
        puVar32 = *(uint **)((long)p + 0x100);
        lVar21 = **(long **)((long)p + 0x108);
        bVar19 = *(byte *)((long)p + 0x120);
        *(uint **)((long)p + 0x20) = puVar32;
        *(uint **)((long)p + 0x28) = puVar32;
        *(long *)((long)p + 0x38) = lVar21;
        puVar12 = (uint *)((long)puVar32 + lVar21);
        *(uint **)((long)p + 0x30) = puVar12;
        *(byte *)((long)p + 0x40) = bVar19;
        puVar11 = puVar32;
        if ((lVar21 != 0 | bVar19) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          uVar10 = *(uint *)((long)p + 0x718);
          uVar39 = *(uint *)((long)p + 0x71c);
          do {
            if (puVar12 <= puVar11) {
              uVar15 = 0;
              goto LAB_0010712c;
            }
            do {
              uVar15 = (ulong)(byte)*puVar11;
              puVar11 = (uint *)((long)puVar11 + 1);
LAB_0010712c:
              cVar7 = (char)(uint)uStack_68;
              uStack_68._0_4_ = (uint)uStack_68 + 8;
              uVar14 = uVar14 | uVar15 << (0x38U - cVar7 & 0x3f);
              while (7 < (int)(uint)uStack_68) {
                uStack_40 = uVar14 << 8;
                uStack_68._0_4_ = (uint)uStack_68 - 8;
                uVar10 = uVar10 << 8 | (uint)(byte)(uVar14 >> 0x38);
                *(uint *)((long)p + 0x718) = uVar10;
                uVar39 = uVar39 + 1;
                *(uint *)((long)p + 0x71c) = uVar39;
                uVar14 = uStack_40;
                if (3 < uVar39) {
                  uVar38 = adler32(*(void **)((long)p + 0x150),(ulong)*(uint *)((long)p + 0x148),1);
                  if (uVar38 != *(uint *)((long)p + 0x718)) {
                    return LZHAM_DECOMP_STATUS_FAILED_BAD_SEED_BYTES;
                  }
                  goto LAB_001098e0;
                }
              }
            } while (puVar11 != puVar12);
            puVar11 = puVar12;
          } while (bVar19 != 0);
          *(ulong *)((long)p + 0x58) = uVar14;
          *(uint *)((long)p + 0x60) = (uint)uStack_68;
          *(uint **)((long)p + 0x28) = puVar12;
        }
        **(long **)((long)p + 0x108) = (long)puVar11 - (long)puVar32;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x19a;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x1d2) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar12 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00107905;
          uVar14 = 0;
          goto LAB_0010790e;
        }
LAB_00109448:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1d2;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x1d8) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_0010778b;
          uVar14 = 0;
          goto LAB_00107794;
        }
LAB_0010941f:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1d8;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x1e0) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_0010733f;
          uVar15 = 0;
          goto LAB_00107348;
        }
LAB_0010933c:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1e0;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x1e2) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00109106;
          uVar15 = 0;
          goto LAB_0010910f;
        }
LAB_00109876:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1e2;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x1e8) {
LAB_0010aa3a:
        *(undefined4 *)((long)p + 8) = 0x1e8;
        return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
      }
      if (iVar20 == 0x1eb) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar15 = *(ulong *)((long)p + 0x58);
          iVar20 = *(int *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00107563;
          uVar14 = 0;
          goto LAB_00107569;
        }
LAB_001093dd:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x1eb;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x1f1) {
LAB_0010a96f:
        *(undefined4 *)((long)p + 8) = 0x1f1;
        return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
      }
      if (iVar20 == 0x1fc) {
        puVar11 = *(uint **)((long)p + 0x100);
        lVar21 = **(long **)((long)p + 0x108);
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)(lVar21 + (long)puVar11);
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
        *(void **)((long)p + 0x6b0) = pvVar30;
        uVar26 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
        *(ulong *)((long)p + 0x6b8) = uVar26;
        if (uVar26 == 0) {
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          goto LAB_0010b563;
        }
        uVar31 = *puVar17;
        if (uVar26 < *puVar17) {
          uVar31 = uVar26;
        }
        *(ulong *)((long)p + 0x6c0) = uVar31;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          memcpy(__dest,pvVar30,uVar31);
        }
        else {
          for (uVar26 = 0; sVar52 = uVar31 - uVar26, uVar26 <= uVar31 && sVar52 != 0;
              uVar26 = uVar26 + sVar52) {
            if (0x1fff < sVar52) {
              sVar52 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x110) + uVar26),
                   (void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52);
            uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52,
                             *(uint *)((long)p + 0xf8));
            *(uint *)((long)p + 0xf8) = uVar38;
            uVar31 = *(ulong *)((long)p + 0x6c0);
          }
        }
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        lVar21 = *(long *)((long)p + 0x6c0);
        **(long **)((long)p + 0x118) = lVar21;
        *(undefined4 *)((long)p + 8) = 0x1fc;
LAB_001097da:
        return (uint)(lVar21 == 0);
      }
      if (iVar20 == 0x213) {
        iVar27 = *(int *)((long)p + 0x690);
        iVar49 = *(int *)((long)p + 0x694);
        uStack_90 = *(undefined8 *)((long)p + 0x698);
        uVar50 = *(uint *)((long)p + 0x6a0);
        uVar26 = (ulong)*(uint *)((long)p + 0x678);
        puVar11 = *(uint **)((long)p + 0x100);
        lVar21 = **(long **)((long)p + 0x108);
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)(lVar21 + (long)puVar11);
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        goto LAB_0010b563;
      }
      if (iVar20 == 0x228) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar9 = *(undefined4 *)((long)p + 0x6f0);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00107abc;
          uVar14 = 0;
          goto LAB_00107ac2;
        }
LAB_001094c8:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x228;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x22b) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar14 = (ulong)*(uint *)((long)p + 0x6f0);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108a3a;
          uVar15 = 0;
          goto LAB_00108a43;
        }
LAB_00109741:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x22b;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x235) {
LAB_00108ae5:
        *(undefined4 *)((long)p + 8) = 0x235;
        return LZHAM_DECOMP_STATUS_FAILED_BAD_RAW_BLOCK;
      }
      if (iVar20 == 0x23b) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar39 = *(uint *)((long)p + 0x6f0);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar15 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00107286;
          uVar14 = 0;
          goto LAB_0010728c;
        }
LAB_0010931b:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x23b;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x24a) {
LAB_0010b613:
        *(undefined4 *)((long)p + 8) = 0x24a;
        return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
      }
      if (iVar20 == 0x252) {
        puVar11 = *(uint **)((long)p + 0x100);
        lVar21 = **(long **)((long)p + 0x108);
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)(lVar21 + (long)puVar11);
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
        *(void **)((long)p + 0x6b0) = pvVar30;
        uVar26 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
        *(ulong *)((long)p + 0x6b8) = uVar26;
        if (uVar26 == 0) {
          uVar39 = *(uint *)((long)p + 0x6f0);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          uVar26 = 0;
          goto LAB_0010b5a9;
        }
        uVar31 = *puVar17;
        if (uVar26 < *puVar17) {
          uVar31 = uVar26;
        }
        *(ulong *)((long)p + 0x6c0) = uVar31;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          memcpy(__dest,pvVar30,uVar31);
        }
        else {
          for (uVar26 = 0; sVar52 = uVar31 - uVar26, uVar26 <= uVar31 && sVar52 != 0;
              uVar26 = uVar26 + sVar52) {
            if (0x1fff < sVar52) {
              sVar52 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x110) + uVar26),
                   (void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52);
            uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52,
                             *(uint *)((long)p + 0xf8));
            *(uint *)((long)p + 0xf8) = uVar38;
            uVar31 = *(ulong *)((long)p + 0x6c0);
          }
        }
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        lVar21 = *(long *)((long)p + 0x6c0);
        **(long **)((long)p + 0x118) = lVar21;
        *(undefined4 *)((long)p + 8) = 0x252;
        goto LAB_001097da;
      }
      if (iVar20 == 0x26b) {
LAB_0010b0ae:
        *(undefined4 *)((long)p + 8) = 0x26b;
        return LZHAM_DECOMP_STATUS_FAILED_EXPECTED_MORE_RAW_BYTES;
      }
      if (iVar20 == 0x26f) {
        uVar39 = *(uint *)((long)p + 0x6f0);
        iVar27 = *(int *)((long)p + 0x690);
        iVar49 = *(int *)((long)p + 0x694);
        uStack_90 = *(undefined8 *)((long)p + 0x698);
        uVar50 = *(uint *)((long)p + 0x6a0);
        uVar15 = (ulong)*(uint *)((long)p + 0x678);
        lVar21 = *(long *)((long)p + 0x100);
        puVar17 = *(ulong **)((long)p + 0x108);
        uVar26 = *puVar17;
        *(long *)((long)p + 0x20) = lVar21;
        *(long *)((long)p + 0x28) = lVar21;
        *(ulong *)((long)p + 0x38) = uVar26;
        *(ulong *)((long)p + 0x30) = lVar21 + uVar26;
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        uVar14 = *puVar17;
        uVar44 = 0;
        goto LAB_0010b010;
      }
      if (iVar20 == 0x283) {
LAB_0010b0cb:
        *(undefined4 *)((long)p + 8) = 0x283;
        return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
      }
      if (iVar20 == 0x294) {
        puVar11 = *(uint **)((long)p + 0x100);
        lVar21 = **(long **)((long)p + 0x108);
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)(lVar21 + (long)puVar11);
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
        *(void **)((long)p + 0x6b0) = pvVar30;
        uVar26 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
        *(ulong *)((long)p + 0x6b8) = uVar26;
        if (uVar26 == 0) {
          uVar39 = *(uint *)((long)p + 0x6f0);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = 0;
          goto LAB_0010b543;
        }
        uVar31 = *puVar17;
        if (uVar26 < *puVar17) {
          uVar31 = uVar26;
        }
        *(ulong *)((long)p + 0x6c0) = uVar31;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          memcpy(__dest,pvVar30,uVar31);
        }
        else {
          for (uVar26 = 0; sVar52 = uVar31 - uVar26, uVar26 <= uVar31 && sVar52 != 0;
              uVar26 = uVar26 + sVar52) {
            if (0x1fff < sVar52) {
              sVar52 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x110) + uVar26),
                   (void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52);
            uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52,
                             *(uint *)((long)p + 0xf8));
            *(uint *)((long)p + 0xf8) = uVar38;
            uVar31 = *(ulong *)((long)p + 0x6c0);
          }
        }
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        lVar21 = *(long *)((long)p + 0x6c0);
        **(long **)((long)p + 0x118) = lVar21;
        *(undefined4 *)((long)p + 8) = 0x294;
        goto LAB_001097da;
      }
      if (iVar20 == 0x2a3) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar12 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar10 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_0010888c;
          uVar15 = 0;
          goto LAB_00108892;
        }
LAB_001096ff:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2a3;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x2ae) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_80 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar20 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108ec5;
          uVar15 = 0;
          goto LAB_00108ecb;
        }
LAB_0010982c:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2ae;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x2cd) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_80 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar39 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108dd0;
          uVar15 = 0;
          goto LAB_00108dd6;
        }
LAB_0010980b:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2cd;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x2e4) {
LAB_0010b45a:
        *(undefined4 *)((long)p + 8) = 0x2e4;
        return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
      }
      if (iVar20 == 0x2ea) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        uStack_60 = (uint *)((long)puStack_80 + lVar21);
        *(uint **)((long)p + 0x30) = uStack_60;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar20 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar35->m_pDecode_tables;
          goto LAB_0010b9e6;
        }
LAB_0010ba87:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2ea;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x304) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)puStack_80 + lVar21);
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x30) = pqStack_70;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar46 = *(uint *)((long)p + 0x6d0);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar35->m_pDecode_tables;
          goto LAB_0010baba;
        }
LAB_0010bbf5:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x304;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x318) {
        puStack_80 = *(uint **)((long)p + 0x100);
        lVar21 = **(long **)((long)p + 0x108);
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)(lVar21 + (long)puStack_80);
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
        *(void **)((long)p + 0x6b0) = pvVar30;
        uVar26 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
        *(ulong *)((long)p + 0x6b8) = uVar26;
        if (uVar26 == 0) {
          iVar20 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          uVar26 = 0;
          goto LAB_0010b122;
        }
        uVar31 = *puVar17;
        if (uVar26 < *puVar17) {
          uVar31 = uVar26;
        }
        *(ulong *)((long)p + 0x6c0) = uVar31;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          memcpy(__dest,pvVar30,uVar31);
        }
        else {
          for (uVar26 = 0; sVar52 = uVar31 - uVar26, uVar26 <= uVar31 && sVar52 != 0;
              uVar26 = uVar26 + sVar52) {
            if (0x1fff < sVar52) {
              sVar52 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x110) + uVar26),
                   (void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52);
            uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52,
                             *(uint *)((long)p + 0xf8));
            *(uint *)((long)p + 0xf8) = uVar38;
            uVar31 = *(ulong *)((long)p + 0x6c0);
          }
        }
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        lVar21 = *(long *)((long)p + 0x6c0);
        **(long **)((long)p + 0x118) = lVar21;
        *(undefined4 *)((long)p + 8) = 0x318;
        goto LAB_001097da;
      }
      if (iVar20 == 0x329) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puStack_80 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar39 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108ce1;
          uVar15 = 0;
          goto LAB_00108ce7;
        }
LAB_001097ea:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x329;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x32c) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puStack_80 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar39 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108948;
          uVar15 = 0;
          goto LAB_0010894e;
        }
LAB_00109720:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x32c;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x32f) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puStack_80 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar51 = *(uint *)((long)p + 0xb8);
          uVar39 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108359;
          uVar15 = 0;
          goto LAB_0010835f;
        }
LAB_00109652:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x32f;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x336) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        puVar11 = (uint *)((long)puStack_80 + lVar21);
        *(uint **)((long)p + 0x30) = puVar11;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar12 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar51 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar35->m_pDecode_tables;
          goto LAB_0010bcb6;
        }
LAB_0010bdd8:
        *plVar13 = (long)puStack_80 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x336;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x33f) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_80 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar50 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uVar39 = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_0010befd;
          uVar14 = 0;
          goto LAB_0010bf07;
        }
LAB_00109762:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x33f;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x344) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_80 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar50 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          iVar20 = *(int *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108612;
          uVar15 = 0;
          goto LAB_00108618;
        }
LAB_0010969c:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x344;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x34d) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        uStack_60 = (uint *)((long)puStack_80 + lVar21);
        *(uint **)((long)p + 0x30) = uStack_60;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar35->m_pDecode_tables;
          goto LAB_0010c487;
        }
LAB_0010c53c:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x34d;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x356) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_80 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar14 = (ulong)*(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_0010c2dd;
          uVar15 = 0;
          goto LAB_0010c2e7;
        }
LAB_001093bc:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x356;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x35b) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_80 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar14 = (ulong)*(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar15 = *(ulong *)((long)p + 0x58);
          iVar20 = *(int *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00107e80;
          uVar44 = 0;
          goto LAB_00107e8a;
        }
LAB_00109579:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x35b;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x35f) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar11 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_80 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00107624;
          uVar15 = 0;
          goto LAB_0010762d;
        }
LAB_001093fe:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x35f;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x368) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puStack_80 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          iVar20 = *(int *)((long)p + 0x698);
          iVar43 = *(int *)((long)p + 0x69c);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar50 = *(uint *)((long)p + 0xb8);
          uVar39 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108443;
          uVar15 = 0;
          goto LAB_0010844d;
        }
LAB_00109673:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x368;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 899) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        puVar12 = (uint *)((long)puStack_80 + lVar21);
        *(uint **)((long)p + 0x30) = puVar12;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar35->m_pDecode_tables;
          goto LAB_0010c75c;
        }
LAB_0010c80b:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 899;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x3a5) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        puVar12 = (uint *)((long)puVar11 + lVar21);
        *(uint **)((long)p + 0x30) = puVar12;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar32 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar20 = *(int *)((long)p + 0x6d4);
          uVar39 = *(uint *)((long)p + 0x6d8);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar35->m_pDecode_tables;
          goto LAB_0010c83c;
        }
LAB_0010c953:
        *plVar13 = (long)puVar11 - (long)puVar32;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3a5;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x3ae) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar10 = *(uint *)((long)p + 0x6d4);
          uVar39 = *(uint *)((long)p + 0x6d8);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uVar28 = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_0010cb68;
          uVar14 = 0;
          goto LAB_0010cb6f;
        }
LAB_001096bd:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3ae;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x3b3) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar10 = *(uint *)((long)p + 0x6d4);
          uVar39 = *(uint *)((long)p + 0x6d8);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uVar14 = *(ulong *)((long)p + 0x58);
          iVar20 = *(int *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00107c4d;
          uVar15 = 0;
          goto LAB_00107c57;
        }
LAB_001094f1:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3b3;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x3c4) {
        puStack_80 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puStack_80 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puStack_80;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          uVar39 = *(uint *)((long)p + 0x6d8);
          uVar10 = *(uint *)((long)p + 0x6e0);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uVar51 = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_001087a3;
          uVar14 = 0;
          goto LAB_001087a9;
        }
LAB_001096de:
        *plVar13 = (long)puStack_80 - (long)puVar11;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3c4;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x3cb) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          uVar39 = *(uint *)((long)p + 0x6d8);
          uVar10 = *(uint *)((long)p + 0x6e0);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00108030;
          uVar14 = 0;
          goto LAB_0010803e;
        }
LAB_001095bb:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3cb;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x3d4) {
        puVar11 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar11;
        *(uint **)((long)p + 0x28) = puVar11;
        *(long *)((long)p + 0x38) = lVar21;
        puStack_80 = (uint *)((long)puVar11 + lVar21);
        *(uint **)((long)p + 0x30) = puStack_80;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar12 = puVar11;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar28 = *(uint *)((long)p + 0x6d4);
          uVar39 = *(uint *)((long)p + 0x6d8);
          iVar20 = *(int *)((long)p + 0x6dc);
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uVar51 = *(uint *)((long)p + 0x60);
          pqVar35 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar35->m_pDecode_tables;
          goto LAB_0010ce7b;
        }
LAB_0010cf5d:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3d4;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 == 0x3f4) {
LAB_0010b893:
        *(undefined4 *)((long)p + 8) = 0x3f4;
        return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
      }
      if (iVar20 == 0x40e) {
        puStack_80 = *(uint **)((long)p + 0x100);
        lVar21 = **(long **)((long)p + 0x108);
        *(uint **)((long)p + 0x20) = puStack_80;
        *(uint **)((long)p + 0x28) = puStack_80;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)(lVar21 + (long)puStack_80);
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        pvVar30 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
        *(void **)((long)p + 0x6b0) = pvVar30;
        uVar26 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
        *(ulong *)((long)p + 0x6b8) = uVar26;
        if (uVar26 == 0) {
          iVar43 = *(int *)((long)p + 0x6d4);
          puVar23 = *(undefined1 **)((long)p + 0x6e8);
          iVar20 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar10 = *(uint *)((long)p + 0x6a0);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          uVar26 = 0;
          do {
            if (iVar43 + -1 == (int)uVar26) goto LAB_0010b122;
            puVar22 = puVar23 + 1;
            __dest[uVar26] = *puVar23;
            puVar23 = puVar22;
            if (puVar22 == __dest + uVar31) {
              puVar23 = __dest;
            }
            uVar26 = uVar26 + 1;
          } while( true );
        }
        uVar31 = *puVar17;
        if (uVar26 < *puVar17) {
          uVar31 = uVar26;
        }
        *(ulong *)((long)p + 0x6c0) = uVar31;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          memcpy(__dest,pvVar30,uVar31);
        }
        else {
          for (uVar26 = 0; sVar52 = uVar31 - uVar26, uVar26 <= uVar31 && sVar52 != 0;
              uVar26 = uVar26 + sVar52) {
            if (0x1fff < sVar52) {
              sVar52 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x110) + uVar26),
                   (void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52);
            uVar38 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar26),sVar52,
                             *(uint *)((long)p + 0xf8));
            *(uint *)((long)p + 0xf8) = uVar38;
            uVar31 = *(ulong *)((long)p + 0x6c0);
          }
        }
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        lVar21 = *(long *)((long)p + 0x6c0);
        **(long **)((long)p + 0x118) = lVar21;
        *(undefined4 *)((long)p + 8) = 0x40e;
        goto LAB_001097da;
      }
      if (iVar20 == 0x442) {
        puVar12 = *(uint **)((long)p + 0x100);
        plVar13 = *(long **)((long)p + 0x108);
        lVar21 = *plVar13;
        *(uint **)((long)p + 0x20) = puVar12;
        *(uint **)((long)p + 0x28) = puVar12;
        *(long *)((long)p + 0x38) = lVar21;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar12 + lVar21);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar11 = puVar12;
        if ((lVar21 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar27 = *(int *)((long)p + 0x690);
          iVar49 = *(int *)((long)p + 0x694);
          uStack_90 = *(undefined8 *)((long)p + 0x698);
          uVar50 = *(uint *)((long)p + 0x6a0);
          uVar26 = (ulong)*(uint *)((long)p + 0x678);
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          if (0 < lVar21) goto LAB_00107f40;
          uVar14 = 0;
          goto LAB_00107f49;
        }
LAB_0010959a:
        *plVar13 = (long)puVar11 - (long)puVar12;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x442;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar20 != 0x47c) {
        if (iVar20 == 0) {
          bVar6 = symbol_codec::start_decoding
                            ((symbol_codec *)((long)p + 0x18),*(uint8 **)((long)p + 0x100),
                             **(size_t **)((long)p + 0x108),*(bool *)((long)p + 0x120),
                             (need_bytes_func_ptr)0x0,(void *)0x0);
          if (!bVar6) {
            return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
          }
          uVar46 = *(uint *)((long)p + 0xb8);
          uVar42 = *(uint *)((long)p + 0xbc);
          puVar11 = *(uint **)((long)p + 0x28);
          uStack_40 = *(ulong *)((long)p + 0x58);
          uStack_68._0_4_ = *(uint *)((long)p + 0x60);
          uVar10 = 0;
          uVar33 = 0;
          uVar9 = 0;
          iVar20 = 0;
          iVar43 = 0;
          uVar50 = 0;
          uStack_90 = 0;
          iVar49 = 0;
          uVar26 = 0;
          iVar27 = 0;
          if ((*(byte *)((long)p + 0x144) & 4) != 0) {
            for (; (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8) {
              if (puVar11 == *(uint **)((long)p + 0x30)) {
                uVar14 = 0;
                if (*(char *)((long)p + 0x40) == '\0') {
                  *(uint *)((long)p + 0xb8) = uVar46;
                  *(uint *)((long)p + 0xbc) = uVar42;
                  *(ulong *)((long)p + 0x58) = uStack_40;
                  *(uint *)((long)p + 0x60) = (uint)uStack_68;
                  *(uint **)((long)p + 0x28) = puVar11;
                  *(int *)((long)p + 0x690) = iVar43;
                  *(int *)((long)p + 0x694) = iVar20;
                  *(undefined4 *)((long)p + 0x698) = uVar9;
                  *(undefined4 *)((long)p + 0x69c) = uVar33;
                  *(uint *)((long)p + 0x6a0) = uVar10;
                  *(int *)((long)p + 0x678) = (int)uVar26;
                  plVar13 = *(long **)((long)p + 0x108);
                  puVar12 = *(uint **)((long)p + 0x20);
                  goto LAB_00109855;
                }
              }
              else {
LAB_0010901b:
                uVar14 = (ulong)(byte)*puVar11;
                puVar11 = (uint *)((long)puVar11 + 1);
              }
LAB_0010902d:
              uStack_40 = uStack_40 | uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
            }
            *(uint *)((long)p + 0x710) = (uint)(byte)(uStack_40 >> 0x38);
            uStack_40 = uStack_40 << 8;
            iVar49 = iVar20;
            uVar50 = uVar10;
            for (iVar27 = (uint)uStack_68 - 8; iVar27 < 8; iVar27 = iVar27 + 8) {
              if (puVar11 == *(uint **)((long)p + 0x30)) {
                uVar14 = 0;
                if (*(char *)((long)p + 0x40) == '\0') {
                  *(uint *)((long)p + 0xb8) = uVar46;
                  *(uint *)((long)p + 0xbc) = uVar42;
                  *(ulong *)((long)p + 0x58) = uStack_40;
                  *(int *)((long)p + 0x60) = iVar27;
                  *(uint **)((long)p + 0x28) = puVar11;
                  *(int *)((long)p + 0x690) = iVar43;
                  *(int *)((long)p + 0x694) = iVar49;
                  *(undefined4 *)((long)p + 0x698) = uVar9;
                  *(undefined4 *)((long)p + 0x69c) = uVar33;
                  *(uint *)((long)p + 0x6a0) = uVar50;
                  *(int *)((long)p + 0x678) = (int)uVar26;
                  plVar13 = *(long **)((long)p + 0x108);
                  puVar12 = *(uint **)((long)p + 0x20);
                  goto LAB_00109897;
                }
              }
              else {
LAB_001091b7:
                uVar14 = (ulong)(byte)*puVar11;
                puVar11 = (uint *)((long)puVar11 + 1);
              }
LAB_001091c4:
              uStack_40 = uStack_40 | uVar14 << (0x38U - (char)iVar27 & 0x3f);
            }
            uVar10 = (uint)(byte)(uStack_40 >> 0x38);
            *(uint *)((long)p + 0x714) = uVar10;
            if ((*(uint *)((long)p + 0x710) & 0xf) != 0xe) {
              return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
            }
            if ((*(uint *)((long)p + 0x710) << 8 | uVar10) % 0x1f != 0) {
              return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
            }
            if ((uStack_40 >> 0x38 & 0x20) != 0) {
              return LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES;
            }
            uStack_68._0_4_ = iVar27 - 8;
            uStack_40 = uStack_40 << 8;
            uStack_90 = CONCAT44(uVar33,uVar9);
            iVar27 = iVar43;
          }
LAB_001098e0:
          uVar38 = *(uint *)((long)p + 0x158);
          uVar45 = *(uint *)((long)p + 0x15c);
          if (uVar45 == 0 && uVar38 == 0) {
            uVar10 = *(uint *)((long)p + 0x140);
            uVar39 = 0x14;
            if (uVar10 < 0x14) {
              uVar39 = uVar10;
            }
            uVar14 = 7;
            if (uVar10 != 0) {
              uVar14 = (ulong)(uVar39 - 1);
            }
            uVar38 = (uint)*(ushort *)(g_table_update_settings + uVar14 * 4);
            uVar45 = (uint)*(ushort *)(g_table_update_settings + uVar14 * 4 + 2);
          }
          bVar6 = quasi_adaptive_huffman_data_model::init2
                            ((quasi_adaptive_huffman_data_model *)((long)p + 0x168),*p,false,0x100,
                             uVar38,uVar45,(uint16 *)0x0);
          if (((bVar6) &&
              (bVar6 = quasi_adaptive_huffman_data_model::assign
                                 ((quasi_adaptive_huffman_data_model *)((long)p + 0x1f8),
                                  (quasi_adaptive_huffman_data_model *)((long)p + 0x168)), bVar6))
             && (bVar6 = quasi_adaptive_huffman_data_model::init2
                                   ((quasi_adaptive_huffman_data_model *)((long)p + 0x288),*p,false,
                                    *(int *)((long)p + 0x14) * 8 - 6,uVar38,uVar45,(uint16 *)0x0),
                bVar6)) {
            bVar6 = quasi_adaptive_huffman_data_model::init2
                              ((quasi_adaptive_huffman_data_model *)((long)p + 0x318),*p,false,0x101
                               ,uVar38,uVar45,(uint16 *)0x0);
            if ((bVar6) &&
               (bVar6 = quasi_adaptive_huffman_data_model::assign
                                  ((quasi_adaptive_huffman_data_model *)((long)p + 0x3a8),
                                   (quasi_adaptive_huffman_data_model *)((long)p + 0x318)), bVar6))
            {
              bVar6 = quasi_adaptive_huffman_data_model::init2
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x438),*p,false,
                                 0xfa,uVar38,uVar45,(uint16 *)0x0);
              if ((bVar6) &&
                 (bVar6 = quasi_adaptive_huffman_data_model::assign
                                    ((quasi_adaptive_huffman_data_model *)((long)p + 0x4c8),
                                     (quasi_adaptive_huffman_data_model *)((long)p + 0x438)), bVar6)
                 ) {
                bVar6 = quasi_adaptive_huffman_data_model::init2
                                  ((quasi_adaptive_huffman_data_model *)((long)p + 0x558),*p,false,
                                   0x10,uVar38,uVar45,(uint16 *)0x0);
                if (!bVar6) {
                  return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
                }
LAB_0010a6a0:
                for (; (int)(uint)uStack_68 < 2; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                  if (puVar11 == *(uint **)((long)p + 0x30)) {
                    uVar14 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = uVar46;
                      *(uint *)((long)p + 0xbc) = uVar42;
                      *(ulong *)((long)p + 0x58) = uStack_40;
                      *(uint *)((long)p + 0x60) = (uint)uStack_68;
                      *(uint **)((long)p + 0x28) = puVar11;
                      *(int *)((long)p + 0x690) = iVar27;
                      *(int *)((long)p + 0x694) = iVar49;
                      *(int *)((long)p + 0x698) = (int)uStack_90;
                      *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                      *(uint *)((long)p + 0x6a0) = uVar50;
                      *(int *)((long)p + 0x678) = (int)uVar26;
                      plVar13 = *(long **)((long)p + 0x108);
                      puVar12 = *(uint **)((long)p + 0x20);
                      goto LAB_00109448;
                    }
                  }
                  else {
LAB_00107905:
                    uVar14 = (ulong)(byte)*puVar11;
                    puVar11 = (uint *)((long)puVar11 + 1);
                  }
LAB_0010790e:
                  uStack_40 = uStack_40 | uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                }
                uVar14 = uStack_40 >> 0x3e;
                *(uint *)((long)p + 0x6a8) = (uint)(uStack_40 >> 0x3e);
                uStack_40 = uStack_40 << 2;
                uStack_68._0_4_ = (uint)uStack_68 - 2;
                uVar9 = 0;
                uVar10 = 0;
                switch(uVar14) {
                case 1:
                  uVar46 = 0;
                  for (; uVar14 = uStack_40, uVar10 < 4; uVar10 = uVar10 + 1) {
                    for (; (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                      if (puVar11 == *(uint **)((long)p + 0x30)) {
                        uVar15 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar46;
                          *(uint *)((long)p + 0xbc) = uVar10;
                          *(ulong *)((long)p + 0x58) = uVar14;
                          *(uint *)((long)p + 0x60) = (uint)uStack_68;
                          *(uint **)((long)p + 0x28) = puVar11;
                          *(int *)((long)p + 0x690) = iVar27;
                          *(int *)((long)p + 0x694) = iVar49;
                          *(int *)((long)p + 0x698) = (int)uStack_90;
                          *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                          *(uint *)((long)p + 0x6a0) = uVar50;
                          *(int *)((long)p + 0x678) = (int)uVar26;
                          plVar13 = *(long **)((long)p + 0x108);
                          puVar12 = *(uint **)((long)p + 0x20);
                          goto LAB_001096ff;
                        }
                      }
                      else {
LAB_0010888c:
                        uVar15 = (ulong)(byte)*puVar11;
                        puVar11 = (uint *)((long)puVar11 + 1);
                      }
LAB_00108892:
                      cVar7 = (char)(uint)uStack_68;
                      uVar14 = uVar14 | uVar15 << (0x38U - cVar7 & 0x3f);
                    }
                    uStack_40 = uVar14 << 8;
                    uStack_68._0_4_ = (uint)uStack_68 - 8;
                    uVar46 = uVar46 << 8 | (uint)(byte)(uVar14 >> 0x38);
                  }
                  *(int *)((long)p + 0x6a4) = (int)uVar26;
                  iVar20 = 1;
                  uVar10 = 0;
                  uVar42 = 0xffffffff;
                  iVar49 = 1;
                  uStack_90 = 0x100000001;
                  puStack_80 = puVar11;
                  for (; (int)(uint)uStack_68 < 2; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                    if (puStack_80 == *(uint **)((long)p + 0x30)) {
                      uVar15 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar46;
                        *(uint *)((long)p + 0xbc) = uVar42;
                        *(ulong *)((long)p + 0x58) = uVar14;
                        *(uint *)((long)p + 0x60) = (uint)uStack_68;
                        *(uint **)((long)p + 0x28) = puStack_80;
                        *(int *)((long)p + 0x690) = iVar20;
                        *(int *)((long)p + 0x694) = iVar49;
                        *(int *)((long)p + 0x698) = (int)uStack_90;
                        *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                        *(uint *)((long)p + 0x6a0) = uVar10;
                        *(int *)((long)p + 0x678) = (int)uVar26;
                        puVar11 = *(uint **)((long)p + 0x20);
                        plVar13 = *(long **)((long)p + 0x108);
                        goto LAB_0010982c;
                      }
                    }
                    else {
LAB_00108ec5:
                      uVar15 = (ulong)(byte)*puStack_80;
                      puStack_80 = (uint *)((long)puStack_80 + 1);
                    }
LAB_00108ecb:
                    cVar7 = (char)(uint)uStack_68;
                    uVar14 = uVar14 | uVar15 << (0x38U - cVar7 & 0x3f);
                  }
                  uStack_40 = uVar14 << 2;
                  uStack_68._0_4_ = (uint)uStack_68 - 2;
                  if (uVar14 >> 0x3e == 2) {
                    lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                  }
                  else if ((uint)(uVar14 >> 0x3e) == 1) {
                    lzham_decompressor::reset_huffman_table_update_rates((lzham_decompressor *)p);
                  }
LAB_0010b122:
                  do {
                    while( true ) {
                      while( true ) {
                        puVar18 = (ushort *)((long)p + (ulong)uVar10 * 2 + 0x5e8);
                        uVar50 = uVar46;
                        iVar27 = iVar20;
                        for (uVar39 = uVar42; uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
                          *(ushort **)((long)p + 0xd0) = puVar18;
                          uVar14 = uStack_40;
                          for (; (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                            puVar11 = puStack_80;
                            if (puStack_80 == *(uint **)((long)p + 0x30)) {
                              uVar15 = 0;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar50;
                                *(uint *)((long)p + 0xbc) = uVar39;
                                *(ulong *)((long)p + 0x58) = uVar14;
                                *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                *(uint **)((long)p + 0x28) = puStack_80;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar10;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                puVar11 = *(uint **)((long)p + 0x20);
                                plVar13 = *(long **)((long)p + 0x108);
                                goto LAB_0010980b;
                              }
                            }
                            else {
LAB_00108dd0:
                              uVar15 = (ulong)(byte)*puVar11;
                              puStack_80 = (uint *)((long)puVar11 + 1);
                            }
LAB_00108dd6:
                            uVar14 = uVar14 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                          }
                          uStack_40 = uVar14 << 8;
                          uStack_68._0_4_ = (uint)uStack_68 - 8;
                          puVar18 = *(ushort **)((long)p + 0xd0);
                          uVar50 = uVar50 << 8 | (uint)(byte)(uVar14 >> 0x38);
                        }
                        uVar3 = *puVar18;
                        uVar42 = (uVar39 >> 0xb) * (uint)uVar3;
                        uVar46 = uVar50 - uVar42;
                        if (uVar42 <= uVar50) break;
                        *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                        if (uVar31 <= (uVar26 & 0xffffffff)) {
                          *(uint *)((long)p + 0xb8) = uVar50;
                          *(uint *)((long)p + 0xbc) = uVar42;
                          *(ulong *)((long)p + 0x58) = uStack_40;
                          *(uint *)((long)p + 0x60) = (uint)uStack_68;
                          *(uint **)((long)p + 0x28) = puStack_80;
                          **(long **)((long)p + 0x108) =
                               (long)puStack_80 - *(long *)((long)p + 0x20);
                          **(undefined8 **)((long)p + 0x118) = 0;
                          goto LAB_0010b45a;
                        }
                        iVar20 = iVar27;
                        if (uVar10 < 7) {
                          pqVar35 = (quasi_adaptive_huffman_data_model *)((long)p + 0x168);
                          pdVar24 = *(decoder_tables **)((long)p + 0x1d0);
                          if ((int)(uint)uStack_68 < 0x18) {
                            uStack_60 = *(uint **)((long)p + 0x30);
                            if (puStack_80 + 1 < uStack_60) {
                              uVar46 = *puStack_80;
                              uStack_68._0_4_ = (uint)uStack_68 + 0x20;
                              uStack_40 = uStack_40 |
                                          (ulong)(uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 |
                                                  (uVar46 & 0xff00) << 8 | uVar46 << 0x18) <<
                                          (-(char)(uint)uStack_68 & 0x3fU);
                              puStack_80 = puStack_80 + 1;
                            }
                            else {
                              for (; (int)(uint)uStack_68 < 0x18;
                                  uStack_68._0_4_ = (uint)uStack_68 + 8) {
                                if (*(char *)((long)p + 0x40) == '\0') {
                                  *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar35;
                                  *(uint *)((long)p + 0xb8) = uVar50;
                                  *(uint *)((long)p + 0xbc) = uVar42;
                                  *(ulong *)((long)p + 0x58) = uStack_40;
                                  *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                  *(uint **)((long)p + 0x28) = puStack_80;
                                  *(int *)((long)p + 0x690) = iVar20;
                                  *(int *)((long)p + 0x694) = iVar49;
                                  *(int *)((long)p + 0x698) = (int)uStack_90;
                                  *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                  *(uint *)((long)p + 0x6a0) = uVar10;
                                  *(int *)((long)p + 0x678) = (int)uVar26;
                                  plVar13 = *(long **)((long)p + 0x108);
                                  puVar11 = *(uint **)((long)p + 0x20);
                                  goto LAB_0010ba87;
                                }
LAB_0010b9e6:
                                uVar14 = 0;
                                if (puStack_80 < uStack_60) {
                                  uVar14 = (ulong)(byte)*puStack_80;
                                  puStack_80 = (uint *)((long)puStack_80 + 1);
                                }
                                uStack_40 = uStack_40 |
                                            uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                              }
                            }
                          }
                          uVar46 = (uint)(ushort)(uStack_40 >> 0x30);
                          if (uVar46 < pdVar24->m_table_max_code) {
                            uVar28 = pdVar24->m_lookup
                                     [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
                            uVar46 = pdVar24->m_lookup
                                     [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                          }
                          else {
                            iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                            do {
                              iVar27 = iVar43;
                              iVar43 = iVar27 + 1;
                            } while (pdVar24->m_max_codes[iVar27 + 0x40U] <= uVar46);
                            uVar39 = (int)(uStack_40 >> (-(char)(iVar27 + 1) & 0x3fU)) +
                                     pdVar24->m_val_ptrs[iVar27 + 0x40U];
                            uVar46 = 0;
                            if (uVar39 < pqVar35->m_total_syms) {
                              uVar46 = uVar39;
                            }
                            uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar46];
                            uVar46 = iVar27 + 0x41;
                          }
                          uStack_40 = uStack_40 << ((byte)uVar46 & 0x3f);
                          puVar2 = (pqVar35->m_sym_freq).m_p + uVar28;
                          *puVar2 = *puVar2 + 1;
                          uStack_68._0_4_ = (uint)uStack_68 - uVar46;
                          puVar1 = &pqVar35->m_symbols_until_update;
                          *puVar1 = *puVar1 - 1;
                          uVar46 = uVar50;
                          if (*puVar1 == 0) {
                            quasi_adaptive_huffman_data_model::update_tables(pqVar35,-1,false);
                          }
                        }
                        else {
                          uVar46 = (uint)(byte)__dest[(uint)((int)uVar26 - iVar27)];
                          pqVar35 = (quasi_adaptive_huffman_data_model *)((long)p + 0x1f8);
                          pdVar24 = *(decoder_tables **)((long)p + 0x260);
                          if ((int)(uint)uStack_68 < 0x18) {
                            pqStack_70 = *(quasi_adaptive_huffman_data_model **)((long)p + 0x30);
                            if (puStack_80 + 1 < pqStack_70) {
                              uVar39 = *puStack_80;
                              uStack_68._0_4_ = (uint)uStack_68 + 0x20;
                              uStack_40 = uStack_40 |
                                          (ulong)(uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 |
                                                  (uVar39 & 0xff00) << 8 | uVar39 << 0x18) <<
                                          (-(char)(uint)uStack_68 & 0x3fU);
                              puStack_80 = puStack_80 + 1;
                            }
                            else {
                              for (; iVar20 = iVar27, (int)(uint)uStack_68 < 0x18;
                                  uStack_68._0_4_ = (uint)uStack_68 + 8) {
                                if (*(char *)((long)p + 0x40) == '\0') {
                                  *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar35;
                                  *(uint *)((long)p + 0xb8) = uVar50;
                                  *(uint *)((long)p + 0xbc) = uVar42;
                                  *(ulong *)((long)p + 0x58) = uStack_40;
                                  *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                  *(uint **)((long)p + 0x28) = puStack_80;
                                  *(uint *)((long)p + 0x6d0) = uVar46;
                                  *(int *)((long)p + 0x690) = iVar27;
                                  *(int *)((long)p + 0x694) = iVar49;
                                  *(int *)((long)p + 0x698) = (int)uStack_90;
                                  *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                  *(uint *)((long)p + 0x6a0) = uVar10;
                                  *(int *)((long)p + 0x678) = (int)uVar26;
                                  plVar13 = *(long **)((long)p + 0x108);
                                  puVar11 = *(uint **)((long)p + 0x20);
                                  goto LAB_0010bbf5;
                                }
LAB_0010baba:
                                uVar14 = 0;
                                if (puStack_80 < pqStack_70) {
                                  uVar14 = (ulong)(byte)*puStack_80;
                                  puStack_80 = (uint *)((long)puStack_80 + 1);
                                }
                                uStack_40 = uStack_40 |
                                            uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                              }
                            }
                          }
                          uVar39 = (uint)(ushort)(uStack_40 >> 0x30);
                          if (uVar39 < pdVar24->m_table_max_code) {
                            uVar28 = pdVar24->m_lookup
                                     [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
                            uVar39 = pdVar24->m_lookup
                                     [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                          }
                          else {
                            iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                            do {
                              iVar27 = iVar43;
                              iVar43 = iVar27 + 1;
                            } while (pdVar24->m_max_codes[iVar27 + 0x40U] <= uVar39);
                            uVar28 = (int)(uStack_40 >> (-(char)(iVar27 + 1) & 0x3fU)) +
                                     pdVar24->m_val_ptrs[iVar27 + 0x40U];
                            uVar39 = 0;
                            if (uVar28 < pqVar35->m_total_syms) {
                              uVar39 = uVar28;
                            }
                            uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar39];
                            uVar39 = iVar27 + 0x41;
                          }
                          uStack_40 = uStack_40 << ((byte)uVar39 & 0x3f);
                          puVar2 = (pqVar35->m_sym_freq).m_p + uVar28;
                          *puVar2 = *puVar2 + 1;
                          uStack_68._0_4_ = (uint)uStack_68 - uVar39;
                          puVar1 = &pqVar35->m_symbols_until_update;
                          *puVar1 = *puVar1 - 1;
                          if (*puVar1 == 0) {
                            quasi_adaptive_huffman_data_model::update_tables(pqVar35,-1,false);
                          }
                          uVar28 = uVar28 ^ uVar46;
                          uVar46 = uVar50;
                        }
                        __dest[uVar26 & 0xffffffff] = (char)uVar28;
                        uVar10 = (uint)(byte)(&s_literal_next_state)[uVar10];
                        uVar26 = (ulong)((int)uVar26 + 1);
                      }
                      *puVar18 = uVar3 - (uVar3 >> 5);
                      puVar18 = (ushort *)((long)p + (ulong)uVar10 * 2 + 0x600);
                      uVar28 = 1;
                      for (uVar39 = uVar39 - uVar42; uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
                        *(ushort **)((long)p + 0xd0) = puVar18;
                        uVar14 = uStack_40;
                        for (; (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                          if (puStack_80 == *(uint **)((long)p + 0x30)) {
                            uVar15 = 0;
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar46;
                              *(uint *)((long)p + 0xbc) = uVar39;
                              *(ulong *)((long)p + 0x58) = uVar14;
                              *(uint *)((long)p + 0x60) = (uint)uStack_68;
                              *(uint **)((long)p + 0x28) = puStack_80;
                              *(uint *)((long)p + 0x6d4) = uVar28;
                              *(int *)((long)p + 0x690) = iVar27;
                              *(int *)((long)p + 0x694) = iVar49;
                              *(int *)((long)p + 0x698) = (int)uStack_90;
                              *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                              *(uint *)((long)p + 0x6a0) = uVar10;
                              *(int *)((long)p + 0x678) = (int)uVar26;
                              plVar13 = *(long **)((long)p + 0x108);
                              puVar11 = *(uint **)((long)p + 0x20);
                              goto LAB_001097ea;
                            }
                          }
                          else {
LAB_00108ce1:
                            uVar15 = (ulong)(byte)*puStack_80;
                            puStack_80 = (uint *)((long)puStack_80 + 1);
                          }
LAB_00108ce7:
                          uVar14 = uVar14 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                        }
                        uStack_40 = uVar14 << 8;
                        uStack_68._0_4_ = (uint)uStack_68 - 8;
                        puVar18 = *(ushort **)((long)p + 0xd0);
                        uVar46 = uVar46 << 8 | (uint)(byte)(uVar14 >> 0x38);
                      }
                      uVar3 = *puVar18;
                      uVar42 = (uVar39 >> 0xb) * (uint)uVar3;
                      uVar50 = uVar46 - uVar42;
                      if (uVar46 < uVar42) break;
                      *puVar18 = uVar3 - (uVar3 >> 5);
                      puVar18 = (ushort *)((long)p + (ulong)uVar10 * 2 + 0x618);
                      for (uVar39 = uVar39 - uVar42; uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
                        *(ushort **)((long)p + 0xd0) = puVar18;
                        uVar14 = uStack_40;
                        for (; (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                          if (puStack_80 == *(uint **)((long)p + 0x30)) {
                            uVar15 = 0;
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar50;
                              *(uint *)((long)p + 0xbc) = uVar39;
                              *(ulong *)((long)p + 0x58) = uVar14;
                              *(uint *)((long)p + 0x60) = (uint)uStack_68;
                              *(uint **)((long)p + 0x28) = puStack_80;
                              *(uint *)((long)p + 0x6d4) = uVar28;
                              *(int *)((long)p + 0x690) = iVar27;
                              *(int *)((long)p + 0x694) = iVar49;
                              *(int *)((long)p + 0x698) = (int)uStack_90;
                              *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                              *(uint *)((long)p + 0x6a0) = uVar10;
                              *(int *)((long)p + 0x678) = (int)uVar26;
                              plVar13 = *(long **)((long)p + 0x108);
                              puVar11 = *(uint **)((long)p + 0x20);
                              goto LAB_00109720;
                            }
                          }
                          else {
LAB_00108948:
                            uVar15 = (ulong)(byte)*puStack_80;
                            puStack_80 = (uint *)((long)puStack_80 + 1);
                          }
LAB_0010894e:
                          uVar14 = uVar14 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                        }
                        uStack_40 = uVar14 << 8;
                        uStack_68._0_4_ = (uint)uStack_68 - 8;
                        puVar18 = *(ushort **)((long)p + 0xd0);
                        uVar50 = uVar50 << 8 | (uint)(byte)(uVar14 >> 0x38);
                      }
                      uVar3 = *puVar18;
                      uVar42 = (uVar39 >> 0xb) * (uint)uVar3;
                      uVar51 = uVar50 - uVar42;
                      if (uVar50 < uVar42) {
                        *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                        pqVar35 = (quasi_adaptive_huffman_data_model *)
                                  ((long)p + (ulong)(6 < uVar10) * 0x90 + 0x318);
                        pdVar24 = *(decoder_tables **)((long)p + (ulong)(6 < uVar10) * 0x90 + 0x380)
                        ;
                        if ((int)(uint)uStack_68 < 0x18) {
                          uStack_60 = *(uint **)((long)p + 0x30);
                          if (puStack_80 + 1 < uStack_60) {
                            uVar46 = *puStack_80;
                            uStack_68._0_4_ = (uint)uStack_68 + 0x20;
                            uStack_40 = uStack_40 |
                                        (ulong)(uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 |
                                                (uVar46 & 0xff00) << 8 | uVar46 << 0x18) <<
                                        (-(char)(uint)uStack_68 & 0x3fU);
                            puStack_80 = puStack_80 + 1;
                          }
                          else {
                            for (; (int)(uint)uStack_68 < 0x18;
                                uStack_68._0_4_ = (uint)uStack_68 + 8) {
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar35;
                                *(uint *)((long)p + 0xb8) = uVar50;
                                *(uint *)((long)p + 0xbc) = uVar42;
                                *(ulong *)((long)p + 0x58) = uStack_40;
                                *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                *(uint **)((long)p + 0x28) = puStack_80;
                                *(uint *)((long)p + 0x6d4) = uVar28;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar10;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                plVar13 = *(long **)((long)p + 0x108);
                                puVar11 = *(uint **)((long)p + 0x20);
                                goto LAB_0010c53c;
                              }
LAB_0010c487:
                              uVar14 = 0;
                              if (puStack_80 < uStack_60) {
                                uVar14 = (ulong)(byte)*puStack_80;
                                puStack_80 = (uint *)((long)puStack_80 + 1);
                              }
                              uStack_40 = uStack_40 |
                                          uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                            }
                          }
                        }
                        uVar46 = (uint)(ushort)(uStack_40 >> 0x30);
                        if (uVar46 < pdVar24->m_table_max_code) {
                          uVar28 = pdVar24->m_lookup
                                   [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
                          uVar46 = pdVar24->m_lookup
                                   [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                        }
                        else {
                          iVar20 = pdVar24->m_decode_start_code_size - 0x41;
                          do {
                            iVar43 = iVar20;
                            iVar20 = iVar43 + 1;
                          } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar46);
                          uVar39 = (int)(uStack_40 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                   pdVar24->m_val_ptrs[iVar43 + 0x40U];
                          uVar46 = 0;
                          if (uVar39 < pqVar35->m_total_syms) {
                            uVar46 = uVar39;
                          }
                          uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar46];
                          uVar46 = iVar43 + 0x41;
                        }
                        uStack_40 = uStack_40 << ((byte)uVar46 & 0x3f);
                        puVar2 = (pqVar35->m_sym_freq).m_p + uVar28;
                        *puVar2 = *puVar2 + 1;
                        uStack_68._0_4_ = (uint)uStack_68 - uVar46;
                        puVar1 = &pqVar35->m_symbols_until_update;
                        *puVar1 = *puVar1 - 1;
                        if (*puVar1 == 0) {
                          quasi_adaptive_huffman_data_model::update_tables(pqVar35,-1,false);
                        }
                        uVar28 = uVar28 + 2;
                        uVar14 = 0;
                        if (uVar28 == 0x102) {
                          do {
                            while (uVar46 = (uint)uStack_68, (int)uVar46 < 1) {
                              if (puStack_80 == *(uint **)((long)p + 0x30)) {
                                if (*(char *)((long)p + 0x40) == '\0') {
                                  *(uint *)((long)p + 0xb8) = uVar50;
                                  *(uint *)((long)p + 0xbc) = uVar42;
                                  *(ulong *)((long)p + 0x58) = uStack_40;
                                  *(uint *)((long)p + 0x60) = uVar46;
                                  *(uint **)((long)p + 0x28) = puStack_80;
                                  *(int *)((long)p + 0x6d4) = (int)uVar14;
                                  *(int *)((long)p + 0x690) = iVar27;
                                  *(int *)((long)p + 0x694) = iVar49;
                                  *(int *)((long)p + 0x698) = (int)uStack_90;
                                  *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                  *(uint *)((long)p + 0x6a0) = uVar10;
                                  *(int *)((long)p + 0x678) = (int)uVar26;
                                  puVar11 = *(uint **)((long)p + 0x20);
                                  plVar13 = *(long **)((long)p + 0x108);
                                  goto LAB_001093bc;
                                }
                                uVar15 = 0;
                                puVar11 = puStack_80;
                              }
                              else {
LAB_0010c2dd:
                                uVar15 = (ulong)(byte)*puStack_80;
                                puVar11 = (uint *)((long)puStack_80 + 1);
                              }
LAB_0010c2e7:
                              uStack_40 = uVar15 << (0x38U - (char)uVar46 & 0x3f) | uStack_40;
                              puStack_80 = puVar11;
                              uStack_68._0_4_ = uVar46 + 8;
                            }
                            uVar15 = uStack_40 * 2;
                            if (-1 < (long)uStack_40) break;
                            uVar39 = (int)uVar14 + 1;
                            uVar14 = (ulong)uVar39;
                            uStack_40 = uVar15;
                            uStack_68._0_4_ = uVar46 - 1;
                          } while (uVar39 < 3);
                          iVar20 = uVar46 - 1;
                          while( true ) {
                            bVar19 = *(byte *)((long)&s_huge_match_code_len + uVar14);
                            uStack_68._0_4_ = iVar20 - (uint)bVar19;
                            if ((int)(uint)bVar19 <= iVar20) break;
                            if (puStack_80 == *(uint **)((long)p + 0x30)) {
                              uVar44 = 0;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar50;
                                *(uint *)((long)p + 0xbc) = uVar42;
                                *(ulong *)((long)p + 0x58) = uVar15;
                                *(int *)((long)p + 0x60) = iVar20;
                                *(uint **)((long)p + 0x28) = puStack_80;
                                *(int *)((long)p + 0x6d4) = (int)uVar14;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar10;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                puVar11 = *(uint **)((long)p + 0x20);
                                plVar13 = *(long **)((long)p + 0x108);
                                goto LAB_00109579;
                              }
                            }
                            else {
LAB_00107e80:
                              uVar44 = (ulong)(byte)*puStack_80;
                              puStack_80 = (uint *)((long)puStack_80 + 1);
                            }
LAB_00107e8a:
                            cVar7 = (char)iVar20;
                            iVar20 = iVar20 + 8;
                            uVar15 = uVar15 | uVar44 << (0x38U - cVar7 & 0x3f);
                          }
                          uStack_40 = uVar15 << (bVar19 & 0x3f);
                          uVar28 = (int)(uVar15 >> (-bVar19 & 0x3f)) +
                                   *(int *)(s_huge_match_base_len + uVar14 * 4);
                        }
                        puVar18 = (ushort *)((long)p + (ulong)uVar10 * 2 + 0x648);
                        for (; uVar42 < 0x1000000; uVar42 = uVar42 << 8) {
                          *(ushort **)((long)p + 0xd0) = puVar18;
                          uVar14 = uStack_40;
                          for (; (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                            if (puStack_80 == *(uint **)((long)p + 0x30)) {
                              uVar15 = 0;
                              puVar11 = puStack_80;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar50;
                                *(uint *)((long)p + 0xbc) = uVar42;
                                *(ulong *)((long)p + 0x58) = uVar14;
                                *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                *(uint **)((long)p + 0x28) = puStack_80;
                                *(uint *)((long)p + 0x6d4) = uVar28;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar10;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                puVar11 = *(uint **)((long)p + 0x20);
                                plVar13 = *(long **)((long)p + 0x108);
                                goto LAB_001093fe;
                              }
                            }
                            else {
LAB_00107624:
                              uVar15 = (ulong)(byte)*puStack_80;
                              puVar11 = (uint *)((long)puStack_80 + 1);
                            }
LAB_0010762d:
                            uVar14 = uVar14 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                            puStack_80 = puVar11;
                          }
                          uStack_40 = uVar14 << 8;
                          uStack_68._0_4_ = (uint)uStack_68 - 8;
                          puVar18 = *(ushort **)((long)p + 0xd0);
                          uVar50 = uVar50 << 8 | (uint)(byte)(uVar14 >> 0x38);
                        }
                        uVar3 = *puVar18;
                        uVar39 = (uVar42 >> 0xb) * (uint)uVar3;
                        uVar46 = uVar50 - uVar39;
                        if (uVar50 < uVar39) {
                          *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                          puVar18 = (ushort *)((long)p + (ulong)uVar10 * 2 + 0x660);
                          iVar20 = (int)uStack_90;
                          iVar43 = uStack_90._4_4_;
                          for (; uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
                            *(ushort **)((long)p + 0xd0) = puVar18;
                            uVar14 = uStack_40;
                            for (; (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8)
                            {
                              if (puStack_80 == *(uint **)((long)p + 0x30)) {
                                uVar15 = 0;
                                if (*(char *)((long)p + 0x40) == '\0') {
                                  *(uint *)((long)p + 0xb8) = uVar50;
                                  *(uint *)((long)p + 0xbc) = uVar39;
                                  *(ulong *)((long)p + 0x58) = uVar14;
                                  *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                  *(uint **)((long)p + 0x28) = puStack_80;
                                  *(uint *)((long)p + 0x6d4) = uVar28;
                                  *(int *)((long)p + 0x690) = iVar27;
                                  *(int *)((long)p + 0x694) = iVar49;
                                  *(int *)((long)p + 0x698) = iVar20;
                                  *(int *)((long)p + 0x69c) = iVar43;
                                  *(uint *)((long)p + 0x6a0) = uVar10;
                                  *(int *)((long)p + 0x678) = (int)uVar26;
                                  plVar13 = *(long **)((long)p + 0x108);
                                  puVar11 = *(uint **)((long)p + 0x20);
                                  goto LAB_00109673;
                                }
                              }
                              else {
LAB_00108443:
                                uVar15 = (ulong)(byte)*puStack_80;
                                puStack_80 = (uint *)((long)puStack_80 + 1);
                              }
LAB_0010844d:
                              uVar14 = uVar14 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                            }
                            uStack_40 = uVar14 << 8;
                            uStack_68._0_4_ = (uint)uStack_68 - 8;
                            puVar18 = *(ushort **)((long)p + 0xd0);
                            uVar50 = uVar50 << 8 | (uint)(byte)(uVar14 >> 0x38);
                          }
                          uVar3 = *puVar18;
                          uVar42 = (uVar39 >> 0xb) * (uint)uVar3;
                          uVar46 = uVar50 - uVar42;
                          if (uVar50 < uVar42) {
                            *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                            uStack_90 = CONCAT44(iVar20,iVar49);
                            uVar46 = uVar50;
                            iVar49 = iVar43;
                          }
                          else {
                            *puVar18 = uVar3 - (uVar3 >> 5);
                            uVar42 = uVar39 - uVar42;
                            uStack_90 = CONCAT44(iVar43,iVar49);
                            iVar49 = iVar20;
                          }
                        }
                        else {
                          *puVar18 = uVar3 - (uVar3 >> 5);
                          uVar42 = uVar42 - uVar39;
                        }
                        uVar10 = (uint)(6 < uVar10) * 3 + 8;
                        iVar20 = iVar49;
                        iVar49 = iVar27;
                      }
                      else {
                        *puVar18 = uVar3 - (uVar3 >> 5);
                        puVar18 = (ushort *)((long)p + (ulong)uVar10 * 2 + 0x630);
                        for (uVar39 = uVar39 - uVar42; uVar39 < 0x1000000; uVar39 = uVar39 << 8) {
                          *(ushort **)((long)p + 0xd0) = puVar18;
                          uVar14 = uStack_40;
                          for (; (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                            if (puStack_80 == *(uint **)((long)p + 0x30)) {
                              uVar15 = 0;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar51;
                                *(uint *)((long)p + 0xbc) = uVar39;
                                *(ulong *)((long)p + 0x58) = uVar14;
                                *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                *(uint **)((long)p + 0x28) = puStack_80;
                                *(uint *)((long)p + 0x6d4) = uVar28;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar10;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                plVar13 = *(long **)((long)p + 0x108);
                                puVar11 = *(uint **)((long)p + 0x20);
                                goto LAB_00109652;
                              }
                            }
                            else {
LAB_00108359:
                              uVar15 = (ulong)(byte)*puStack_80;
                              puStack_80 = (uint *)((long)puStack_80 + 1);
                            }
LAB_0010835f:
                            uVar14 = uVar14 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                          }
                          uStack_40 = uVar14 << 8;
                          uStack_68._0_4_ = (uint)uStack_68 - 8;
                          puVar18 = *(ushort **)((long)p + 0xd0);
                          uVar51 = uVar51 << 8 | (uint)(byte)(uVar14 >> 0x38);
                        }
                        uVar3 = *puVar18;
                        uVar42 = (uVar39 >> 0xb) * (uint)uVar3;
                        uVar46 = uVar51 - uVar42;
                        if (uVar51 < uVar42) {
                          *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                          pqVar35 = (quasi_adaptive_huffman_data_model *)
                                    ((long)p + (ulong)(6 < uVar10) * 0x90 + 0x318);
                          pdVar24 = *(decoder_tables **)
                                     ((long)p + (ulong)(6 < uVar10) * 0x90 + 0x380);
                          uVar46 = uVar51;
                          if ((int)(uint)uStack_68 < 0x18) {
                            puVar11 = *(uint **)((long)p + 0x30);
                            if (puStack_80 + 1 < puVar11) {
                              uVar50 = *puStack_80;
                              uStack_68._0_4_ = (uint)uStack_68 + 0x20;
                              uStack_40 = uStack_40 |
                                          (ulong)(uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 |
                                                  (uVar50 & 0xff00) << 8 | uVar50 << 0x18) <<
                                          (-(char)(uint)uStack_68 & 0x3fU);
                              puStack_80 = puStack_80 + 1;
                            }
                            else {
                              for (; uVar46 = uVar51, (int)(uint)uStack_68 < 0x18;
                                  uStack_68._0_4_ = (uint)uStack_68 + 8) {
                                if (*(char *)((long)p + 0x40) == '\0') {
                                  *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar35;
                                  *(uint *)((long)p + 0xb8) = uVar51;
                                  *(uint *)((long)p + 0xbc) = uVar42;
                                  *(ulong *)((long)p + 0x58) = uStack_40;
                                  *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                  *(uint **)((long)p + 0x28) = puStack_80;
                                  *(uint *)((long)p + 0x6d4) = uVar28;
                                  *(int *)((long)p + 0x690) = iVar27;
                                  *(int *)((long)p + 0x694) = iVar49;
                                  *(int *)((long)p + 0x698) = (int)uStack_90;
                                  *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                  *(uint *)((long)p + 0x6a0) = uVar10;
                                  *(int *)((long)p + 0x678) = (int)uVar26;
                                  plVar13 = *(long **)((long)p + 0x108);
                                  puVar12 = *(uint **)((long)p + 0x20);
                                  goto LAB_0010bdd8;
                                }
LAB_0010bcb6:
                                uVar14 = 0;
                                if (puStack_80 < puVar11) {
                                  uVar14 = (ulong)(byte)*puStack_80;
                                  puStack_80 = (uint *)((long)puStack_80 + 1);
                                }
                                uStack_40 = uStack_40 |
                                            uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                              }
                            }
                          }
                          uVar50 = (uint)(ushort)(uStack_40 >> 0x30);
                          if (uVar50 < pdVar24->m_table_max_code) {
                            uVar28 = pdVar24->m_lookup
                                     [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
                            uVar50 = pdVar24->m_lookup
                                     [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                          }
                          else {
                            iVar20 = pdVar24->m_decode_start_code_size - 0x41;
                            do {
                              iVar43 = iVar20;
                              iVar20 = iVar43 + 1;
                            } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar50);
                            uVar39 = (int)(uStack_40 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                     pdVar24->m_val_ptrs[iVar43 + 0x40U];
                            uVar50 = 0;
                            if (uVar39 < pqVar35->m_total_syms) {
                              uVar50 = uVar39;
                            }
                            uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar50];
                            uVar50 = iVar43 + 0x41;
                          }
                          uStack_40 = uStack_40 << ((byte)uVar50 & 0x3f);
                          puVar2 = (pqVar35->m_sym_freq).m_p + uVar28;
                          *puVar2 = *puVar2 + 1;
                          uStack_68._0_4_ = (uint)uStack_68 - uVar50;
                          puVar1 = &pqVar35->m_symbols_until_update;
                          *puVar1 = *puVar1 - 1;
                          if (*puVar1 == 0) {
                            quasi_adaptive_huffman_data_model::update_tables(pqVar35,-1,false);
                          }
                          uVar28 = uVar28 + 2;
                          uVar50 = 0;
                          if (uVar28 == 0x102) {
                            do {
                              while (uVar39 = (uint)uStack_68, (int)uVar39 < 1) {
                                if (puStack_80 == *(uint **)((long)p + 0x30)) {
                                  if (*(char *)((long)p + 0x40) == '\0') {
                                    *(uint *)((long)p + 0xb8) = uVar46;
                                    *(uint *)((long)p + 0xbc) = uVar42;
                                    *(ulong *)((long)p + 0x58) = uStack_40;
                                    *(uint *)((long)p + 0x60) = uVar39;
                                    *(uint **)((long)p + 0x28) = puStack_80;
                                    *(uint *)((long)p + 0x6d4) = uVar50;
                                    *(int *)((long)p + 0x690) = iVar27;
                                    *(int *)((long)p + 0x694) = iVar49;
                                    *(int *)((long)p + 0x698) = (int)uStack_90;
                                    *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                    *(uint *)((long)p + 0x6a0) = uVar10;
                                    *(int *)((long)p + 0x678) = (int)uVar26;
                                    puVar11 = *(uint **)((long)p + 0x20);
                                    plVar13 = *(long **)((long)p + 0x108);
                                    goto LAB_00109762;
                                  }
                                  uVar14 = 0;
                                  puVar11 = puStack_80;
                                }
                                else {
LAB_0010befd:
                                  uVar14 = (ulong)(byte)*puStack_80;
                                  puVar11 = (uint *)((long)puStack_80 + 1);
                                }
LAB_0010bf07:
                                uStack_40 = uVar14 << (0x38U - (char)uVar39 & 0x3f) | uStack_40;
                                puStack_80 = puVar11;
                                uStack_68._0_4_ = uVar39 + 8;
                              }
                              uVar14 = uStack_40 * 2;
                              if (-1 < (long)uStack_40) break;
                              uVar50 = uVar50 + 1;
                              uStack_40 = uVar14;
                              uStack_68._0_4_ = uVar39 - 1;
                            } while (uVar50 < 3);
                            iVar20 = uVar39 - 1;
                            while( true ) {
                              bVar19 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar50);
                              uStack_68._0_4_ = iVar20 - (uint)bVar19;
                              if ((int)(uint)bVar19 <= iVar20) break;
                              if (puStack_80 == *(uint **)((long)p + 0x30)) {
                                uVar15 = 0;
                                if (*(char *)((long)p + 0x40) == '\0') {
                                  *(uint *)((long)p + 0xb8) = uVar46;
                                  *(uint *)((long)p + 0xbc) = uVar42;
                                  *(ulong *)((long)p + 0x58) = uVar14;
                                  *(int *)((long)p + 0x60) = iVar20;
                                  *(uint **)((long)p + 0x28) = puStack_80;
                                  *(uint *)((long)p + 0x6d4) = uVar50;
                                  *(int *)((long)p + 0x690) = iVar27;
                                  *(int *)((long)p + 0x694) = iVar49;
                                  *(int *)((long)p + 0x698) = (int)uStack_90;
                                  *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                  *(uint *)((long)p + 0x6a0) = uVar10;
                                  *(int *)((long)p + 0x678) = (int)uVar26;
                                  puVar11 = *(uint **)((long)p + 0x20);
                                  plVar13 = *(long **)((long)p + 0x108);
                                  goto LAB_0010969c;
                                }
                              }
                              else {
LAB_00108612:
                                uVar15 = (ulong)(byte)*puStack_80;
                                puStack_80 = (uint *)((long)puStack_80 + 1);
                              }
LAB_00108618:
                              cVar7 = (char)iVar20;
                              iVar20 = iVar20 + 8;
                              uVar14 = uVar14 | uVar15 << (0x38U - cVar7 & 0x3f);
                            }
                            uStack_40 = uVar14 << (bVar19 & 0x3f);
                            uVar28 = (int)(uVar14 >> (-bVar19 & 0x3f)) +
                                     *(int *)(s_huge_match_base_len + (ulong)uVar50 * 4);
                          }
                          uVar10 = (uint)(6 < uVar10) * 3 + 8;
                          iVar20 = iVar27;
                        }
                        else {
                          *puVar18 = uVar3 - (uVar3 >> 5);
                          uVar42 = uVar39 - uVar42;
                          uVar10 = (uint)(6 < uVar10) * 2 + 9;
                          iVar20 = iVar27;
                        }
                      }
LAB_0010b7fd:
                      iVar43 = (int)uVar26;
                      uVar14 = uVar26 & 0xffffffff;
                      if ((uVar14 < (ulong)(long)iVar20) ||
                         (uVar26 = (ulong)(iVar43 + uVar28), uVar31 < uVar26)) {
                        *(uint *)((long)p + 0xb8) = uVar46;
                        *(uint *)((long)p + 0xbc) = uVar42;
                        *(ulong *)((long)p + 0x58) = uStack_40;
                        *(uint *)((long)p + 0x60) = (uint)uStack_68;
                        *(uint **)((long)p + 0x28) = puStack_80;
                        **(long **)((long)p + 0x108) = (long)puStack_80 - *(long *)((long)p + 0x20);
                        **(undefined8 **)((long)p + 0x118) = 0;
                        goto LAB_0010b893;
                      }
                      uVar50 = iVar43 - iVar20;
                      pbVar34 = __dest + uVar14;
                      if (iVar20 == 1) {
                        bVar19 = __dest[uVar50];
                        if (uVar28 < 8) {
                          for (; 0 < (int)uVar28; uVar28 = uVar28 - 1) {
                            *pbVar34 = bVar19;
                            pbVar34 = pbVar34 + 1;
                          }
                        }
                        else {
                          memset(pbVar34,(uint)bVar19,(ulong)uVar28);
                        }
                        iVar20 = 1;
                      }
                      else {
                        puVar23 = __dest;
                        if ((uVar28 < 8) || (iVar20 < (int)uVar28)) {
                          for (; 0 < (int)uVar28; uVar28 = uVar28 - 1) {
                            puVar23[uVar14] = puVar23[uVar50];
                            puVar23 = puVar23 + 1;
                          }
                        }
                        else {
                          memcpy(pbVar34,__dest + uVar50,(ulong)uVar28);
                        }
                      }
                    }
                    *puVar18 = (short)(0x800 - uVar3 >> 5) + uVar3;
                    pqVar35 = (quasi_adaptive_huffman_data_model *)((long)p + 0x288);
                    pdVar24 = *(decoder_tables **)((long)p + 0x2f0);
                    puVar11 = puStack_80;
                    uVar50 = uVar10;
                    if ((int)(uint)uStack_68 < 0x18) {
                      puVar12 = *(uint **)((long)p + 0x30);
                      if (puStack_80 + 1 < puVar12) {
                        uVar10 = *puStack_80;
                        uStack_68._0_4_ = (uint)uStack_68 + 0x20;
                        uStack_40 = uStack_40 |
                                    (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 |
                                            (uVar10 & 0xff00) << 8 | uVar10 << 0x18) <<
                                    (-(char)(uint)uStack_68 & 0x3fU);
                        puVar11 = puStack_80 + 1;
                      }
                      else {
                        for (; puVar11 = puStack_80, uVar50 = uVar10, (int)(uint)uStack_68 < 0x18;
                            uStack_68._0_4_ = (uint)uStack_68 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar35;
                            *(uint *)((long)p + 0xb8) = uVar46;
                            *(uint *)((long)p + 0xbc) = uVar42;
                            *(ulong *)((long)p + 0x58) = uStack_40;
                            *(uint *)((long)p + 0x60) = (uint)uStack_68;
                            *(uint **)((long)p + 0x28) = puStack_80;
                            *(uint *)((long)p + 0x6d4) = uVar28;
                            *(int *)((long)p + 0x690) = iVar27;
                            *(int *)((long)p + 0x694) = iVar49;
                            *(int *)((long)p + 0x698) = (int)uStack_90;
                            *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                            *(uint *)((long)p + 0x6a0) = uVar10;
                            *(int *)((long)p + 0x678) = (int)uVar26;
                            plVar13 = *(long **)((long)p + 0x108);
                            puVar11 = *(uint **)((long)p + 0x20);
                            goto LAB_0010c80b;
                          }
LAB_0010c75c:
                          uVar14 = 0;
                          if (puStack_80 < puVar12) {
                            uVar14 = (ulong)(byte)*puStack_80;
                            puStack_80 = (uint *)((long)puStack_80 + 1);
                          }
                          uStack_40 = uStack_40 | uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                        }
                      }
                    }
                    uVar10 = (uint)(ushort)(uStack_40 >> 0x30);
                    if (uVar10 < pdVar24->m_table_max_code) {
                      uVar51 = pdVar24->m_lookup
                               [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
                      uVar39 = pdVar24->m_lookup
                               [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                    }
                    else {
                      iVar20 = pdVar24->m_decode_start_code_size - 0x41;
                      do {
                        iVar43 = iVar20;
                        iVar20 = iVar43 + 1;
                      } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar10);
                      uVar39 = (int)(uStack_40 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                               pdVar24->m_val_ptrs[iVar43 + 0x40U];
                      uVar10 = 0;
                      if (uVar39 < pqVar35->m_total_syms) {
                        uVar10 = uVar39;
                      }
                      uVar39 = iVar43 + 0x41;
                      uVar51 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar10];
                    }
                    uStack_40 = uStack_40 << ((byte)uVar39 & 0x3f);
                    puVar2 = (pqVar35->m_sym_freq).m_p + uVar51;
                    *puVar2 = *puVar2 + 1;
                    uStack_68._0_4_ = (uint)uStack_68 - uVar39;
                    puVar1 = &pqVar35->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar35,-1,false);
                    }
                    if (1 < uVar51) {
                      uVar28 = (uVar51 - 2 & 7) + 2;
                      uVar39 = (uVar51 - 2 >> 3) + 1;
                      if (uVar28 == 9) {
                        pqVar35 = (quasi_adaptive_huffman_data_model *)
                                  ((long)p + (ulong)(6 < uVar50) * 0x90 + 0x438);
                        pdVar24 = *(decoder_tables **)((long)p + (ulong)(6 < uVar50) * 0x90 + 0x4a0)
                        ;
                        iVar20 = 9;
                        if ((int)(uint)uStack_68 < 0x18) {
                          puVar12 = *(uint **)((long)p + 0x30);
                          if (puVar11 + 1 < puVar12) {
                            uVar10 = *puVar11;
                            uStack_68._0_4_ = (uint)uStack_68 + 0x20;
                            uStack_40 = uStack_40 |
                                        (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 |
                                                (uVar10 & 0xff00) << 8 | uVar10 << 0x18) <<
                                        (-(char)(uint)uStack_68 & 0x3fU);
                            iVar20 = 9;
                            puVar11 = puVar11 + 1;
                          }
                          else {
                            iVar20 = 9;
                            for (; (int)(uint)uStack_68 < 0x18;
                                uStack_68._0_4_ = (uint)uStack_68 + 8) {
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar35;
                                *(uint *)((long)p + 0xb8) = uVar46;
                                *(uint *)((long)p + 0xbc) = uVar42;
                                *(ulong *)((long)p + 0x58) = uStack_40;
                                *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                *(uint **)((long)p + 0x28) = puVar11;
                                *(int *)((long)p + 0x6d4) = iVar20;
                                *(uint *)((long)p + 0x6d8) = uVar39;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar50;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                plVar13 = *(long **)((long)p + 0x108);
                                puVar32 = *(uint **)((long)p + 0x20);
                                goto LAB_0010c953;
                              }
LAB_0010c83c:
                              uVar14 = 0;
                              if (puVar11 < puVar12) {
                                uVar14 = (ulong)(byte)*puVar11;
                                puVar11 = (uint *)((long)puVar11 + 1);
                              }
                              uStack_40 = uStack_40 |
                                          uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                            }
                          }
                        }
                        uVar10 = (uint)(ushort)(uStack_40 >> 0x30);
                        if (uVar10 < pdVar24->m_table_max_code) {
                          uVar28 = pdVar24->m_lookup
                                   [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
                          uVar10 = pdVar24->m_lookup
                                   [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                        }
                        else {
                          iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                          do {
                            iVar48 = iVar43;
                            iVar43 = iVar48 + 1;
                          } while (pdVar24->m_max_codes[iVar48 + 0x40U] <= uVar10);
                          uVar28 = (int)(uStack_40 >> (-(char)(iVar48 + 1) & 0x3fU)) +
                                   pdVar24->m_val_ptrs[iVar48 + 0x40U];
                          uVar10 = 0;
                          if (uVar28 < pqVar35->m_total_syms) {
                            uVar10 = uVar28;
                          }
                          uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar10];
                          uVar10 = iVar48 + 0x41;
                        }
                        uStack_40 = uStack_40 << ((byte)uVar10 & 0x3f);
                        puVar2 = (pqVar35->m_sym_freq).m_p + uVar28;
                        *puVar2 = *puVar2 + 1;
                        uStack_68._0_4_ = (uint)uStack_68 - uVar10;
                        puVar1 = &pqVar35->m_symbols_until_update;
                        *puVar1 = *puVar1 - 1;
                        if (*puVar1 == 0) {
                          quasi_adaptive_huffman_data_model::update_tables(pqVar35,-1,false);
                        }
                        uVar28 = uVar28 + iVar20;
                        uVar10 = 0;
                        if (uVar28 == 0x102) {
                          do {
                            while (uVar28 = (uint)uStack_68, (int)uVar28 < 1) {
                              if (puVar11 == *(uint **)((long)p + 0x30)) {
                                if (*(char *)((long)p + 0x40) == '\0') {
                                  *(uint *)((long)p + 0xb8) = uVar46;
                                  *(uint *)((long)p + 0xbc) = uVar42;
                                  *(ulong *)((long)p + 0x58) = uStack_40;
                                  *(uint *)((long)p + 0x60) = uVar28;
                                  *(uint **)((long)p + 0x28) = puVar11;
                                  *(uint *)((long)p + 0x6d4) = uVar10;
                                  *(uint *)((long)p + 0x6d8) = uVar39;
                                  *(int *)((long)p + 0x690) = iVar27;
                                  *(int *)((long)p + 0x694) = iVar49;
                                  *(int *)((long)p + 0x698) = (int)uStack_90;
                                  *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                  *(uint *)((long)p + 0x6a0) = uVar50;
                                  *(int *)((long)p + 0x678) = (int)uVar26;
                                  puVar12 = *(uint **)((long)p + 0x20);
                                  plVar13 = *(long **)((long)p + 0x108);
                                  goto LAB_001096bd;
                                }
                                uVar14 = 0;
                                puVar12 = puVar11;
                              }
                              else {
LAB_0010cb68:
                                uVar14 = (ulong)(byte)*puVar11;
                                puVar12 = (uint *)((long)puVar11 + 1);
                              }
LAB_0010cb6f:
                              uStack_40 = uVar14 << (0x38U - (char)uVar28 & 0x3f) | uStack_40;
                              puVar11 = puVar12;
                              uStack_68._0_4_ = uVar28 + 8;
                            }
                            uVar14 = uStack_40 * 2;
                            if (-1 < (long)uStack_40) break;
                            uVar10 = uVar10 + 1;
                            uStack_40 = uVar14;
                            uStack_68._0_4_ = uVar28 - 1;
                          } while (uVar10 < 3);
                          iVar20 = uVar28 - 1;
                          while( true ) {
                            bVar19 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar10);
                            uStack_68._0_4_ = iVar20 - (uint)bVar19;
                            if ((int)(uint)bVar19 <= iVar20) break;
                            if (puVar11 == *(uint **)((long)p + 0x30)) {
                              uVar15 = 0;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar46;
                                *(uint *)((long)p + 0xbc) = uVar42;
                                *(ulong *)((long)p + 0x58) = uVar14;
                                *(int *)((long)p + 0x60) = iVar20;
                                *(uint **)((long)p + 0x28) = puVar11;
                                *(uint *)((long)p + 0x6d4) = uVar10;
                                *(uint *)((long)p + 0x6d8) = uVar39;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar50;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                puVar12 = *(uint **)((long)p + 0x20);
                                plVar13 = *(long **)((long)p + 0x108);
                                goto LAB_001094f1;
                              }
                            }
                            else {
LAB_00107c4d:
                              uVar15 = (ulong)(byte)*puVar11;
                              puVar11 = (uint *)((long)puVar11 + 1);
                            }
LAB_00107c57:
                            cVar7 = (char)iVar20;
                            iVar20 = iVar20 + 8;
                            uVar14 = uVar14 | uVar15 << (0x38U - cVar7 & 0x3f);
                          }
                          uStack_40 = uVar14 << (bVar19 & 0x3f);
                          uVar28 = (int)(uVar14 >> (-bVar19 & 0x3f)) +
                                   *(int *)(s_huge_match_base_len + (ulong)uVar10 * 4);
                        }
                      }
                      uVar10 = (uint)(byte)CLZDecompBase::m_lzx_position_extra_bits[uVar39];
                      puStack_80 = puVar11;
                      uVar51 = (uint)uStack_68;
                      if (uVar10 < 3) {
                        for (; uStack_68._0_4_ = uVar51 - uVar10, (int)uVar51 < (int)uVar10;
                            uVar51 = uVar51 + 8) {
                          if (puStack_80 == *(uint **)((long)p + 0x30)) {
                            uVar14 = 0;
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar46;
                              *(uint *)((long)p + 0xbc) = uVar42;
                              *(ulong *)((long)p + 0x58) = uStack_40;
                              *(uint *)((long)p + 0x60) = uVar51;
                              *(uint **)((long)p + 0x28) = puStack_80;
                              *(uint *)((long)p + 0x6d4) = uVar28;
                              *(uint *)((long)p + 0x6d8) = uVar39;
                              *(uint *)((long)p + 0x6e0) = uVar10;
                              *(int *)((long)p + 0x690) = iVar27;
                              *(int *)((long)p + 0x694) = iVar49;
                              *(int *)((long)p + 0x698) = (int)uStack_90;
                              *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                              *(uint *)((long)p + 0x6a0) = uVar50;
                              *(int *)((long)p + 0x678) = (int)uVar26;
                              plVar13 = *(long **)((long)p + 0x108);
                              puVar11 = *(uint **)((long)p + 0x20);
                              goto LAB_001096de;
                            }
                          }
                          else {
LAB_001087a3:
                            uVar14 = (ulong)(byte)*puStack_80;
                            puStack_80 = (uint *)((long)puStack_80 + 1);
                          }
LAB_001087a9:
                          uStack_40 = uStack_40 | uVar14 << (0x38U - (char)uVar51 & 0x3f);
                        }
                        iVar20 = (int)(uStack_40 >> (-(byte)uVar10 & 0x3f));
                        if (uVar10 == 0) {
                          iVar20 = 0;
                        }
                        uStack_40 = uStack_40 << ((byte)uVar10 & 0x3f);
                      }
                      else {
                        iVar20 = 0;
                        if (4 < (byte)CLZDecompBase::m_lzx_position_extra_bits[uVar39]) {
                          while( true ) {
                            iVar43 = uVar10 - 4;
                            uVar51 = (uint)uStack_68 - iVar43;
                            if (iVar43 <= (int)(uint)uStack_68) break;
                            if (puVar11 == *(uint **)((long)p + 0x30)) {
                              uVar14 = 0;
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar46;
                                *(uint *)((long)p + 0xbc) = uVar42;
                                *(ulong *)((long)p + 0x58) = uStack_40;
                                *(uint *)((long)p + 0x60) = (uint)uStack_68;
                                *(uint **)((long)p + 0x28) = puVar11;
                                *(uint *)((long)p + 0x6d4) = uVar28;
                                *(uint *)((long)p + 0x6d8) = uVar39;
                                *(uint *)((long)p + 0x6e0) = uVar10;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar50;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                puVar12 = *(uint **)((long)p + 0x20);
                                plVar13 = *(long **)((long)p + 0x108);
                                goto LAB_001095bb;
                              }
                            }
                            else {
LAB_00108030:
                              uVar14 = (ulong)(byte)*puVar11;
                              puVar11 = (uint *)((long)puVar11 + 1);
                            }
LAB_0010803e:
                            cVar7 = (char)(uint)uStack_68;
                            uStack_68._0_4_ = (uint)uStack_68 + 8;
                            uStack_40 = uStack_40 | uVar14 << (0x38U - cVar7 & 0x3f);
                          }
                          iVar20 = (int)(uStack_40 >> (0x44U - (char)uVar10 & 0x3f)) << 4;
                          if (iVar43 == 0) {
                            iVar20 = 0;
                          }
                          uStack_40 = uStack_40 << ((byte)iVar43 & 0x3f);
                        }
                        pqVar35 = (quasi_adaptive_huffman_data_model *)((long)p + 0x558);
                        pdVar24 = *(decoder_tables **)((long)p + 0x5c0);
                        if ((int)uVar51 < 0x18) {
                          puStack_80 = *(uint **)((long)p + 0x30);
                          if (puVar11 + 1 < puStack_80) {
                            uVar10 = *puVar11;
                            uVar51 = uVar51 + 0x20;
                            uStack_40 = uStack_40 |
                                        (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 |
                                                (uVar10 & 0xff00) << 8 | uVar10 << 0x18) <<
                                        (-(char)uVar51 & 0x3fU);
                            puVar11 = puVar11 + 1;
                          }
                          else {
                            for (; (int)uVar51 < 0x18; uVar51 = uVar51 + 8) {
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar35;
                                *(uint *)((long)p + 0xb8) = uVar46;
                                *(uint *)((long)p + 0xbc) = uVar42;
                                *(ulong *)((long)p + 0x58) = uStack_40;
                                *(uint *)((long)p + 0x60) = uVar51;
                                *(uint **)((long)p + 0x28) = puVar11;
                                *(uint *)((long)p + 0x6d4) = uVar28;
                                *(uint *)((long)p + 0x6d8) = uVar39;
                                *(int *)((long)p + 0x6dc) = iVar20;
                                *(int *)((long)p + 0x690) = iVar27;
                                *(int *)((long)p + 0x694) = iVar49;
                                *(int *)((long)p + 0x698) = (int)uStack_90;
                                *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                                *(uint *)((long)p + 0x6a0) = uVar50;
                                *(int *)((long)p + 0x678) = (int)uVar26;
                                plVar13 = *(long **)((long)p + 0x108);
                                puVar12 = *(uint **)((long)p + 0x20);
                                goto LAB_0010cf5d;
                              }
LAB_0010ce7b:
                              uVar14 = 0;
                              if (puVar11 < puStack_80) {
                                uVar14 = (ulong)(byte)*puVar11;
                                puVar11 = (uint *)((long)puVar11 + 1);
                              }
                              uStack_40 = uStack_40 | uVar14 << (0x38U - (char)uVar51 & 0x3f);
                            }
                          }
                        }
                        puStack_80 = puVar11;
                        uVar10 = (uint)(ushort)(uStack_40 >> 0x30);
                        if (uVar10 < pdVar24->m_table_max_code) {
                          uVar10 = pdVar24->m_lookup
                                   [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
                          uStack_68._0_4_ =
                               pdVar24->m_lookup
                               [uStack_40 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
                        }
                        else {
                          iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                          do {
                            iVar48 = iVar43;
                            iVar43 = iVar48 + 1;
                          } while (pdVar24->m_max_codes[iVar48 + 0x40U] <= uVar10);
                          uVar40 = (int)(uStack_40 >> (-(char)(iVar48 + 1) & 0x3fU)) +
                                   pdVar24->m_val_ptrs[iVar48 + 0x40U];
                          uVar10 = 0;
                          if (uVar40 < pqVar35->m_total_syms) {
                            uVar10 = uVar40;
                          }
                          uVar10 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar10];
                          uStack_68._0_4_ = iVar48 + 0x41;
                        }
                        uStack_40 = uStack_40 << ((byte)(uint)uStack_68 & 0x3f);
                        puVar2 = (pqVar35->m_sym_freq).m_p + uVar10;
                        *puVar2 = *puVar2 + 1;
                        uStack_68._0_4_ = uVar51 - (uint)uStack_68;
                        puVar1 = &pqVar35->m_symbols_until_update;
                        *puVar1 = *puVar1 - 1;
                        if (*puVar1 == 0) {
                          quasi_adaptive_huffman_data_model::update_tables(pqVar35,-1,false);
                        }
                        iVar20 = uVar10 + iVar20;
                      }
                      uVar10 = (uint)(6 < uVar50) * 3 + 7;
                      uStack_90 = CONCAT44((int)uStack_90,iVar49);
                      iVar20 = iVar20 + *(int *)(CLZDecompBase::m_lzx_position_base +
                                                (ulong)uVar39 * 4);
                      iVar49 = iVar27;
                      goto LAB_0010b7fd;
                    }
                    uVar10 = 0;
                    if (uVar51 == 0) goto LAB_0010c6cd;
                    uStack_90 = 0x100000001;
                    iVar49 = 1;
                    iVar20 = 1;
                    puStack_80 = puVar11;
                  } while( true );
                case 2:
                  for (; (int)(uint)uStack_68 < 0x18; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                    if (puVar11 == *(uint **)((long)p + 0x30)) {
                      uVar14 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar46;
                        *(uint *)((long)p + 0xbc) = uVar42;
                        *(ulong *)((long)p + 0x58) = uStack_40;
                        *(uint *)((long)p + 0x60) = (uint)uStack_68;
                        *(uint **)((long)p + 0x28) = puVar11;
                        *(undefined4 *)((long)p + 0x6f0) = uVar9;
                        *(int *)((long)p + 0x690) = iVar27;
                        *(int *)((long)p + 0x694) = iVar49;
                        *(int *)((long)p + 0x698) = (int)uStack_90;
                        *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                        *(uint *)((long)p + 0x6a0) = uVar50;
                        *(int *)((long)p + 0x678) = (int)uVar26;
                        puVar12 = *(uint **)((long)p + 0x20);
                        plVar13 = *(long **)((long)p + 0x108);
                        goto LAB_001094c8;
                      }
                    }
                    else {
LAB_00107abc:
                      uVar14 = (ulong)(byte)*puVar11;
                      puVar11 = (uint *)((long)puVar11 + 1);
                    }
LAB_00107ac2:
                    uStack_40 = uStack_40 | uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                  }
                  uVar14 = uStack_40 >> 0x28;
                  uStack_40 = uStack_40 << 0x18;
                  for (uStack_68._0_4_ = (uint)uStack_68 - 0x18; uVar39 = (uint)uVar14,
                      (int)(uint)uStack_68 < 8; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                    if (puVar11 == *(uint **)((long)p + 0x30)) {
                      uVar15 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar46;
                        *(uint *)((long)p + 0xbc) = uVar42;
                        *(ulong *)((long)p + 0x58) = uStack_40;
                        *(uint *)((long)p + 0x60) = (uint)uStack_68;
                        *(uint **)((long)p + 0x28) = puVar11;
                        *(uint *)((long)p + 0x6f0) = uVar39;
                        *(int *)((long)p + 0x690) = iVar27;
                        *(int *)((long)p + 0x694) = iVar49;
                        *(int *)((long)p + 0x698) = (int)uStack_90;
                        *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                        *(uint *)((long)p + 0x6a0) = uVar50;
                        *(int *)((long)p + 0x678) = (int)uVar26;
                        puVar12 = *(uint **)((long)p + 0x20);
                        plVar13 = *(long **)((long)p + 0x108);
                        goto LAB_00109741;
                      }
                    }
                    else {
LAB_00108a3a:
                      uVar15 = (ulong)(byte)*puVar11;
                      puVar11 = (uint *)((long)puVar11 + 1);
                    }
LAB_00108a43:
                    uStack_40 = uStack_40 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                  }
                  uVar15 = uStack_40 << 8;
                  uVar10 = (uint)uStack_68 - 8;
                  if ((((uint)(uVar14 >> 0x10) ^ (uint)(uVar14 >> 8) ^ uVar39) & 0xff) ==
                      (uint)(byte)(uStack_40 >> 0x38)) {
                    uVar39 = uVar39 + 1;
                    if (((uint)uStack_68 & 7) != 0) {
                      for (; (int)uVar10 < 0; uVar10 = uVar10 + 8) {
                        if (puVar11 == *(uint **)((long)p + 0x30)) {
                          uVar14 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar46;
                            *(uint *)((long)p + 0xbc) = uVar42;
                            *(ulong *)((long)p + 0x58) = uVar15;
                            *(uint *)((long)p + 0x60) = uVar10;
                            *(uint **)((long)p + 0x28) = puVar11;
                            *(uint *)((long)p + 0x6f0) = uVar39;
                            *(int *)((long)p + 0x690) = iVar27;
                            *(int *)((long)p + 0x694) = iVar49;
                            *(int *)((long)p + 0x698) = (int)uStack_90;
                            *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                            *(uint *)((long)p + 0x6a0) = uVar50;
                            *(int *)((long)p + 0x678) = (int)uVar26;
                            puVar12 = *(uint **)((long)p + 0x20);
                            plVar13 = *(long **)((long)p + 0x108);
                            goto LAB_0010931b;
                          }
                        }
                        else {
LAB_00107286:
                          uVar14 = (ulong)(byte)*puVar11;
                          puVar11 = (uint *)((long)puVar11 + 1);
                        }
LAB_0010728c:
                        uVar15 = uVar15 | uVar14 << (0x38U - (char)uVar10 & 0x3f);
                      }
                      bVar19 = (byte)uVar10;
                      uVar10 = uVar10 & 0x7ffffff8;
                      uVar15 = uVar15 << (bVar19 & 7);
                    }
                    do {
                      if ((int)uVar10 < 8) goto LAB_0010b5b6;
                      uVar14 = uVar15 << 8;
                      uVar10 = uVar10 - 8;
                      uVar44 = uVar26 & 0xffffffff;
                      if (uVar31 <= uVar44) {
                        *(uint *)((long)p + 0xb8) = uVar46;
                        *(uint *)((long)p + 0xbc) = uVar42;
                        *(ulong *)((long)p + 0x58) = uVar14;
                        *(uint *)((long)p + 0x60) = uVar10;
                        *(uint **)((long)p + 0x28) = puVar11;
                        **(long **)((long)p + 0x108) = (long)puVar11 - *(long *)((long)p + 0x20);
                        **(undefined8 **)((long)p + 0x118) = 0;
                        goto LAB_0010b613;
                      }
                      uVar26 = (ulong)((int)uVar26 + 1);
                      __dest[uVar44] = (char)(uVar15 >> 0x38);
LAB_0010b5a9:
                      uVar39 = uVar39 - 1;
                      uVar15 = uVar14;
                    } while (uVar39 != 0);
                    uVar39 = 0;
LAB_0010b5b6:
                    *(uint *)((long)p + 0xb8) = uVar46;
                    *(uint *)((long)p + 0xbc) = uVar42;
                    *(ulong *)((long)p + 0x58) = uVar15;
                    *(uint *)((long)p + 0x60) = uVar10;
                    *(uint **)((long)p + 0x28) = puVar11;
LAB_0010b543:
                    for (; uVar39 != 0; uVar39 = uVar39 - (int)uVar29) {
                      uVar44 = (long)puVar11 - *(long *)((long)p + 0x20);
                      puVar17 = *(ulong **)((long)p + 0x108);
                      uVar14 = *puVar17 - uVar44;
                      uVar15 = uVar26;
LAB_0010b010:
                      if (uVar14 == 0) {
                        *puVar17 = uVar44;
                        **(undefined8 **)((long)p + 0x118) = 0;
                        if (*(char *)((long)p + 0x120) != '\x01') {
                          *(uint *)((long)p + 0x6f0) = uVar39;
                          *(int *)((long)p + 0x690) = iVar27;
                          *(int *)((long)p + 0x694) = iVar49;
                          *(int *)((long)p + 0x698) = (int)uStack_90;
                          *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                          *(uint *)((long)p + 0x6a0) = uVar50;
                          *(int *)((long)p + 0x678) = (int)uVar15;
                          *(undefined4 *)((long)p + 8) = 0x26f;
                          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                        }
                        goto LAB_0010b0ae;
                      }
                      uVar29 = (ulong)uVar39;
                      if (uVar14 < uVar39) {
                        uVar29 = uVar14;
                      }
                      uVar26 = (ulong)(uint)((int)uVar15 + (int)uVar29);
                      if (uVar31 < uVar26) {
                        *puVar17 = uVar44;
                        **(undefined8 **)((long)p + 0x118) = 0;
                        goto LAB_0010b0cb;
                      }
                      memcpy(__dest + (uVar15 & 0xffffffff),
                             (void *)(*(long *)((long)p + 0x100) + uVar44),uVar29);
                      lVar21 = *(long *)((long)p + 0x100);
                      lVar4 = **(long **)((long)p + 0x108);
                      puVar11 = (uint *)(uVar44 + lVar21 + uVar29);
                      *(long *)((long)p + 0x20) = lVar21;
                      *(uint **)((long)p + 0x28) = puVar11;
                      *(long *)((long)p + 0x38) = lVar4;
                      *(long *)((long)p + 0x30) = lVar21 + lVar4;
                      *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                    }
LAB_0010b563:
                    uVar46 = *(uint *)((long)p + 0xb8);
                    uVar42 = *(uint *)((long)p + 0xbc);
                    uStack_40 = *(ulong *)((long)p + 0x58);
                    uStack_68._0_4_ = *(uint *)((long)p + 0x60);
                    break;
                  }
                  *(uint *)((long)p + 0xb8) = uVar46;
                  *(uint *)((long)p + 0xbc) = uVar42;
                  *(ulong *)((long)p + 0x58) = uVar15;
                  *(uint *)((long)p + 0x60) = uVar10;
                  *(uint **)((long)p + 0x28) = puVar11;
                  **(long **)((long)p + 0x108) = (long)puVar11 - *(long *)((long)p + 0x20);
                  **(undefined8 **)((long)p + 0x118) = 0;
                  goto LAB_00108ae5;
                case 3:
                  *(undefined4 *)((long)p + 0x160) = 3;
                  break;
                default:
                  for (; (int)(uint)uStack_68 < 2; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                    if (puVar11 == *(uint **)((long)p + 0x30)) {
                      uVar14 = 0;
                      puVar12 = puVar11;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar46;
                        *(uint *)((long)p + 0xbc) = uVar42;
                        *(ulong *)((long)p + 0x58) = uStack_40;
                        *(uint *)((long)p + 0x60) = (uint)uStack_68;
                        *(uint **)((long)p + 0x28) = puVar11;
                        *(int *)((long)p + 0x690) = iVar27;
                        *(int *)((long)p + 0x694) = iVar49;
                        *(int *)((long)p + 0x698) = (int)uStack_90;
                        *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                        *(uint *)((long)p + 0x6a0) = uVar50;
                        *(int *)((long)p + 0x678) = (int)uVar26;
                        puVar12 = *(uint **)((long)p + 0x20);
                        plVar13 = *(long **)((long)p + 0x108);
                        goto LAB_0010941f;
                      }
                    }
                    else {
LAB_0010778b:
                      uVar14 = (ulong)(byte)*puVar11;
                      puVar12 = (uint *)((long)puVar11 + 1);
                    }
LAB_00107794:
                    uStack_40 = uStack_40 | uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                    puVar11 = puVar12;
                  }
                  uVar10 = (uint)(uStack_40 >> 0x3e);
                  *(uint *)((long)p + 0x71c) = uVar10;
                  uVar14 = uStack_40 << 2;
                  uStack_68._0_4_ = (uint)uStack_68 - 2;
                  if (uStack_40 >> 0x3e == 2) {
                    lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                  }
                  else if (uVar10 == 1) {
                    lzham_decompressor::reset_huffman_table_update_rates((lzham_decompressor *)p);
                  }
                  if (((uint)uStack_68 & 7) != 0) {
                    for (; (int)(uint)uStack_68 < 0; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                      if (puVar11 == *(uint **)((long)p + 0x30)) {
                        uVar15 = 0;
                        puVar12 = puVar11;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar46;
                          *(uint *)((long)p + 0xbc) = uVar42;
                          *(ulong *)((long)p + 0x58) = uVar14;
                          *(uint *)((long)p + 0x60) = (uint)uStack_68;
                          *(uint **)((long)p + 0x28) = puVar11;
                          *(int *)((long)p + 0x690) = iVar27;
                          *(int *)((long)p + 0x694) = iVar49;
                          *(int *)((long)p + 0x698) = (int)uStack_90;
                          *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                          *(uint *)((long)p + 0x6a0) = uVar50;
                          *(int *)((long)p + 0x678) = (int)uVar26;
                          puVar12 = *(uint **)((long)p + 0x20);
                          plVar13 = *(long **)((long)p + 0x108);
                          goto LAB_0010933c;
                        }
                      }
                      else {
LAB_0010733f:
                        uVar15 = (ulong)(byte)*puVar11;
                        puVar12 = (uint *)((long)puVar11 + 1);
                      }
LAB_00107348:
                      uVar14 = uVar14 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                      puVar11 = puVar12;
                    }
                    uVar14 = uVar14 << ((byte)(uint)uStack_68 & 7);
                    uStack_68._0_4_ = (uint)uStack_68 & 0x7ffffff8;
                  }
                  for (; (int)(uint)uStack_68 < 0x10; uStack_68._0_4_ = (uint)uStack_68 + 8) {
                    if (puVar11 == *(uint **)((long)p + 0x30)) {
                      uVar15 = 0;
                      puVar12 = puVar11;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar46;
                        *(uint *)((long)p + 0xbc) = uVar42;
                        *(ulong *)((long)p + 0x58) = uVar14;
                        *(uint *)((long)p + 0x60) = (uint)uStack_68;
                        *(uint **)((long)p + 0x28) = puVar11;
                        *(int *)((long)p + 0x690) = iVar27;
                        *(int *)((long)p + 0x694) = iVar49;
                        *(int *)((long)p + 0x698) = (int)uStack_90;
                        *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                        *(uint *)((long)p + 0x6a0) = uVar50;
                        *(int *)((long)p + 0x678) = (int)uVar26;
                        puVar12 = *(uint **)((long)p + 0x20);
                        plVar13 = *(long **)((long)p + 0x108);
                        goto LAB_00109876;
                      }
                    }
                    else {
LAB_00109106:
                      uVar15 = (ulong)(byte)*puVar11;
                      puVar12 = (uint *)((long)puVar11 + 1);
                    }
LAB_0010910f:
                    uVar14 = uVar14 | uVar15 << (0x38U - (char)(uint)uStack_68 & 0x3f);
                    puVar11 = puVar12;
                  }
                  uVar15 = uVar14 << 0x10;
                  iVar20 = (uint)uStack_68 - 0x10;
                  if (uVar14 >> 0x30 != 0) {
                    *(uint *)((long)p + 0xb8) = uVar46;
                    *(uint *)((long)p + 0xbc) = uVar42;
                    *(ulong *)((long)p + 0x58) = uVar15;
                    *(int *)((long)p + 0x60) = iVar20;
                    *(uint **)((long)p + 0x28) = puVar11;
                    **(long **)((long)p + 0x108) = (long)puVar11 - *(long *)((long)p + 0x20);
                    **(undefined8 **)((long)p + 0x118) = 0;
                    goto LAB_0010aa3a;
                  }
                  while( true ) {
                    iVar43 = (int)uVar26;
                    if (0xf < iVar20) break;
                    if (puVar11 == *(uint **)((long)p + 0x30)) {
                      uVar14 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar46;
                        *(uint *)((long)p + 0xbc) = uVar42;
                        *(ulong *)((long)p + 0x58) = uVar15;
                        *(int *)((long)p + 0x60) = iVar20;
                        *(uint **)((long)p + 0x28) = puVar11;
                        *(int *)((long)p + 0x690) = iVar27;
                        *(int *)((long)p + 0x694) = iVar49;
                        *(int *)((long)p + 0x698) = (int)uStack_90;
                        *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                        *(uint *)((long)p + 0x6a0) = uVar50;
                        *(int *)((long)p + 0x678) = iVar43;
                        puVar12 = *(uint **)((long)p + 0x20);
                        plVar13 = *(long **)((long)p + 0x108);
                        goto LAB_001093dd;
                      }
                    }
                    else {
LAB_00107563:
                      uVar14 = (ulong)(byte)*puVar11;
                      puVar11 = (uint *)((long)puVar11 + 1);
                    }
LAB_00107569:
                    cVar7 = (char)iVar20;
                    iVar20 = iVar20 + 8;
                    uVar15 = uVar15 | uVar14 << (0x38U - cVar7 & 0x3f);
                  }
                  uStack_40 = uVar15 << 0x10;
                  uStack_68._0_4_ = iVar20 - 0x10;
                  if ((short)(uVar15 >> 0x30) != -1) {
                    *(uint *)((long)p + 0xb8) = uVar46;
                    *(uint *)((long)p + 0xbc) = uVar42;
                    *(ulong *)((long)p + 0x58) = uStack_40;
                    *(uint *)((long)p + 0x60) = (uint)uStack_68;
                    *(uint **)((long)p + 0x28) = puVar11;
                    **(long **)((long)p + 0x108) = (long)puVar11 - *(long *)((long)p + 0x20);
                    **(undefined8 **)((long)p + 0x118) = 0;
                    goto LAB_0010a96f;
                  }
                  if ((*(uint *)((long)p + 0x71c) & 0xfffffffe) == 2) {
                    *(uint *)((long)p + 0xb8) = uVar46;
                    *(uint *)((long)p + 0xbc) = uVar42;
                    *(ulong *)((long)p + 0x58) = uStack_40;
                    *(uint *)((long)p + 0x60) = (uint)uStack_68;
                    *(uint **)((long)p + 0x28) = puVar11;
                    **(long **)((long)p + 0x108) = (long)puVar11 - *(long *)((long)p + 0x20);
                    **(ulong **)((long)p + 0x118) =
                         (ulong)(uint)(iVar43 - *(int *)((long)p + 0x67c));
                    *(int *)((long)p + 0x67c) = iVar43;
                    *(int *)((long)p + 0x690) = iVar27;
                    *(int *)((long)p + 0x694) = iVar49;
                    *(int *)((long)p + 0x698) = (int)uStack_90;
                    *(int *)((long)p + 0x69c) = uStack_90._4_4_;
                    *(uint *)((long)p + 0x6a0) = uVar50;
                    *(int *)((long)p + 0x678) = iVar43;
                    *(undefined4 *)((long)p + 8) = 0x213;
                    return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                  }
                }
                goto LAB_0010a7fa;
              }
            }
          }
          return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
        }
        goto switchD_00106d2a_caseD_458;
      }
    }
    **(undefined8 **)((long)p + 0x108) = 0;
    **(undefined8 **)((long)p + 0x118) = 0;
    *(undefined4 *)((long)p + 8) = 0x482;
  case 0x458:
  case 0x459:
  case 0x45a:
  case 0x45b:
  case 0x45c:
  case 0x45e:
switchD_00106d2a_caseD_458:
    return *(lzham_decompress_status_t *)((long)p + 0x160);
  }
  return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
switchD_001108f6_caseD_2:
  if (0x17 < (int)uVar10) goto code_r0x0010df5d;
  if (pqStack_70 == (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
    uVar15 = 0;
    if (*(char *)((long)p + 0x40) == '\0') {
      *(uint *)((long)p + 0xb8) = uVar50;
      *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
      *(ulong *)((long)p + 0x58) = uVar31;
      *(uint *)((long)p + 0x60) = uVar10;
      *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
      *(undefined4 *)((long)p + 0x6f0) = uVar9;
      *(int *)((long)p + 0x690) = uStack_60._4_4_;
      *(int *)((long)p + 0x694) = iVar41;
      *(int *)((long)p + 0x698) = iStack_88;
      *(int *)((long)p + 0x69c) = iVar48;
      *(int *)((long)p + 0x6a0) = (int)uVar26;
      *(int *)((long)p + 0x678) = (int)uVar14;
      plVar13 = *(long **)((long)p + 0x108);
      puVar11 = *(uint **)((long)p + 0x20);
      goto LAB_0010f91f;
    }
  }
  else {
LAB_0010df36:
    uVar15 = (ulong)(byte)*(uint *)pqStack_70;
    pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)pqStack_70 + 1);
  }
LAB_0010df3c:
  cVar7 = (char)uVar10;
  uVar10 = uVar10 + 8;
  uVar31 = uVar31 | uVar15 << (0x38U - cVar7 & 0x3f);
  goto switchD_001108f6_caseD_2;
code_r0x0010df5d:
  uVar15 = uVar31 >> 0x28;
  uVar31 = uVar31 << 0x18;
  for (uVar10 = uVar10 - 0x18; uVar28 = (uint)uVar15, (int)uVar10 < 8; uVar10 = uVar10 + 8) {
    if (pqStack_70 == (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
      uVar44 = 0;
      if (*(char *)((long)p + 0x40) == '\0') {
        *(uint *)((long)p + 0xb8) = uVar50;
        *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
        *(ulong *)((long)p + 0x58) = uVar31;
        *(uint *)((long)p + 0x60) = uVar10;
        *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
        *(uint *)((long)p + 0x6f0) = uVar28;
        *(int *)((long)p + 0x690) = uStack_60._4_4_;
        *(int *)((long)p + 0x694) = iVar41;
        *(int *)((long)p + 0x698) = iStack_88;
        *(int *)((long)p + 0x69c) = iVar48;
        *(int *)((long)p + 0x6a0) = (int)uVar26;
        *(int *)((long)p + 0x678) = (int)uVar14;
        puVar11 = *(uint **)((long)p + 0x20);
        plVar13 = *(long **)((long)p + 0x108);
        goto LAB_0010fb03;
      }
    }
    else {
LAB_0010eeac:
      uVar44 = (ulong)(byte)*(uint *)pqStack_70;
      pqStack_70 = (quasi_adaptive_huffman_data_model *)((long)pqStack_70 + 1);
    }
LAB_0010eeb2:
    uVar31 = uVar31 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
  }
  uVar44 = uVar31 << 8;
  uVar39 = uVar10 - 8;
  if ((((uint)(uVar15 >> 0x10) ^ (uint)(uVar15 >> 8) ^ uVar28) & 0xff) !=
      (uint)(byte)(uVar31 >> 0x38)) {
    *(uint *)((long)p + 0xb8) = uVar50;
    *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
    *(ulong *)((long)p + 0x58) = uVar44;
    *(uint *)((long)p + 0x60) = uVar39;
    *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqStack_70;
    **(long **)((long)p + 0x108) = (long)pqStack_70 - *(long *)((long)p + 0x20);
    **(undefined8 **)((long)p + 0x118) = 0;
    goto LAB_0010ef66;
  }
  uVar15 = (ulong)(uVar28 + 1);
  if ((uVar10 & 7) != 0) goto LAB_0010ef11;
  goto LAB_00111810;
LAB_00112fa5:
  uVar14 = (ulong)uStack_84;
  if ((uVar10 & 7) != 0) {
    for (; (int)uVar10 < 0; uVar10 = uVar10 + 8) {
      if (pqVar35 == (quasi_adaptive_huffman_data_model *)*(uint **)((long)p + 0x30)) {
        uVar15 = 0;
        if (*(char *)((long)p + 0x40) == '\0') {
          *(uint *)((long)p + 0xb8) = uVar50;
          *(uint *)((long)p + 0xbc) = uStack_78._4_4_;
          *(ulong *)((long)p + 0x58) = uVar31;
          *(uint *)((long)p + 0x60) = uVar10;
          *(quasi_adaptive_huffman_data_model **)((long)p + 0x28) = pqVar35;
          *(int *)((long)p + 0x690) = uStack_60._4_4_;
          *(int *)((long)p + 0x694) = iVar41;
          *(int *)((long)p + 0x698) = iStack_88;
          *(int *)((long)p + 0x69c) = iVar48;
          *(int *)((long)p + 0x6a0) = (int)uVar26;
          *(int *)((long)p + 0x678) = (int)uVar14;
          puVar11 = *(uint **)((long)p + 0x20);
          plVar13 = *(long **)((long)p + 0x108);
          goto LAB_0010f99e;
        }
      }
      else {
LAB_0010e3c6:
        uVar15 = (ulong)(byte)*(uint *)pqVar35;
        pqVar35 = (quasi_adaptive_huffman_data_model *)((long)pqVar35 + 1);
      }
LAB_0010e3cc:
      uVar31 = uVar31 | uVar15 << (0x38U - (char)uVar10 & 0x3f);
    }
    uVar31 = uVar31 << ((byte)uVar10 & 7);
    uVar10 = uVar10 & 0x7ffffff8;
  }
  goto LAB_0011135f;
LAB_0010c6cd:
  if (((uint)uStack_68 & 7) != 0) {
    for (; (int)(uint)uStack_68 < 0; uStack_68._0_4_ = (uint)uStack_68 + 8) {
      if (puVar11 == *(uint **)((long)p + 0x30)) {
        uVar14 = 0;
        puVar12 = puVar11;
        if (*(char *)((long)p + 0x40) == '\0') {
          *(uint *)((long)p + 0xb8) = uVar46;
          *(uint *)((long)p + 0xbc) = uVar42;
          *(ulong *)((long)p + 0x58) = uStack_40;
          *(uint *)((long)p + 0x60) = (uint)uStack_68;
          *(uint **)((long)p + 0x28) = puVar11;
          *(int *)((long)p + 0x690) = iVar27;
          *(int *)((long)p + 0x694) = iVar49;
          *(int *)((long)p + 0x698) = (int)uStack_90;
          *(int *)((long)p + 0x69c) = uStack_90._4_4_;
          *(uint *)((long)p + 0x6a0) = uVar50;
          *(int *)((long)p + 0x678) = (int)uVar26;
          puVar12 = *(uint **)((long)p + 0x20);
          plVar13 = *(long **)((long)p + 0x108);
          goto LAB_0010959a;
        }
      }
      else {
LAB_00107f40:
        uVar14 = (ulong)(byte)*puVar11;
        puVar12 = (uint *)((long)puVar11 + 1);
      }
LAB_00107f49:
      uStack_40 = uStack_40 | uVar14 << (0x38U - (char)(uint)uStack_68 & 0x3f);
      puVar11 = puVar12;
    }
    uStack_40 = uStack_40 << ((byte)(uint)uStack_68 & 7);
    uStack_68._0_4_ = (uint)uStack_68 & 0x7ffffff8;
  }
LAB_0010a7fa:
  *(int *)((long)p + 0x68c) = *(int *)((long)p + 0x68c) + 1;
  iVar20 = *(int *)((long)p + 0x160);
  if (iVar20 != 0) goto LAB_0010a81c;
  goto LAB_0010a6a0;
}

Assistant:

lzham_decompress_status_t LZHAM_CDECL lzham_lib_decompress(
      lzham_decompress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pOut_buf_size) && (!pOut_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      pState->m_pIn_buf = pIn_buf;
      pState->m_pIn_buf_size = pIn_buf_size;
      pState->m_pOut_buf = pOut_buf;
      pState->m_pOut_buf_size = pOut_buf_size;
      pState->m_no_more_input_bytes_flag = (no_more_input_bytes_flag != 0);

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         if (!pState->m_pOrig_out_buf)
         {
            pState->m_pOrig_out_buf = pOut_buf;
            pState->m_orig_out_buf_size = *pOut_buf_size;
         }
         else
         {
            // In unbuffered mode, the caller is not allowed to move the output buffer and the output pointer MUST always point to the beginning of the output buffer.
            // Also, the output buffer size must indicate the full size of the output buffer. The decompressor will track the current output offset, and during partial/sync
            // flushes it'll report how many bytes it has written since the call. 
            if ((pState->m_pOrig_out_buf != pOut_buf) || (pState->m_orig_out_buf_size != *pOut_buf_size))
            {
               return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
            }
         }
      }

      lzham_decompress_status_t status;

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
         status = pState->decompress<true>();
      else
         status = pState->decompress<false>();
      
      return status;
   }